

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx::CurveNiIntersectorK<8,4>::
     intersect_h<embree::avx::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,8>,embree::avx::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  undefined1 (*pauVar3) [28];
  undefined1 (*pauVar4) [32];
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Primitive PVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  undefined4 uVar21;
  Geometry *pGVar22;
  RTCFilterFunctionN p_Var23;
  uint uVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  bool bVar113;
  bool bVar114;
  bool bVar115;
  bool bVar116;
  bool bVar117;
  bool bVar118;
  bool bVar119;
  bool bVar120;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [28];
  undefined1 auVar137 [28];
  undefined1 auVar138 [28];
  undefined1 auVar139 [24];
  uint uVar140;
  uint uVar141;
  ulong uVar142;
  long lVar143;
  uint uVar144;
  ulong uVar145;
  long lVar146;
  long lVar147;
  float fVar148;
  undefined1 auVar151 [16];
  float fVar149;
  float fVar168;
  float fVar171;
  float fVar177;
  float fVar178;
  float fVar180;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  float fVar169;
  float fVar172;
  float fVar174;
  float fVar175;
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar152 [16];
  float fVar150;
  float fVar170;
  float fVar173;
  float fVar176;
  float fVar179;
  float fVar181;
  float fVar182;
  float fVar183;
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [64];
  float fVar184;
  float fVar204;
  float fVar205;
  undefined1 auVar185 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float fVar206;
  float fVar207;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar209;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar208;
  undefined1 auVar219 [16];
  float fVar224;
  float fVar226;
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  float fVar225;
  float fVar227;
  float fVar228;
  float fVar229;
  undefined1 auVar223 [32];
  float fVar230;
  float fVar247;
  undefined1 auVar231 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  float fVar245;
  float fVar246;
  float fVar248;
  float fVar249;
  float fVar251;
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar232 [16];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  float fVar250;
  float fVar252;
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [64];
  float fVar253;
  float fVar254;
  float fVar263;
  float fVar265;
  float fVar267;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar269;
  float fVar270;
  float fVar271;
  undefined1 auVar257 [32];
  float fVar264;
  float fVar266;
  float fVar268;
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  float fVar272;
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [64];
  float fVar273;
  float fVar283;
  float fVar284;
  undefined1 auVar274 [16];
  float fVar286;
  float fVar287;
  float fVar288;
  undefined1 auVar276 [32];
  undefined1 auVar275 [16];
  float fVar285;
  undefined1 auVar277 [32];
  float fVar290;
  undefined1 auVar278 [32];
  float fVar289;
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar291 [16];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  float fVar300;
  undefined1 auVar299 [32];
  float fVar301;
  undefined1 auVar302 [16];
  float fVar311;
  float fVar312;
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  float fVar322;
  undefined1 auVar316 [32];
  float fVar323;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  undefined1 auVar324 [32];
  float fVar333;
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [64];
  float fVar341;
  float fVar342;
  float fVar343;
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [64];
  float fVar344;
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar352;
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar355 [16];
  float fVar353;
  float fVar354;
  float fVar361;
  float fVar363;
  float in_register_0000151c;
  undefined1 auVar356 [32];
  float fVar362;
  float fVar364;
  float fVar365;
  float fVar366;
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  float fVar367;
  float fVar368;
  undefined1 auVar369 [16];
  float fVar373;
  float fVar375;
  undefined1 auVar370 [32];
  float fVar374;
  float fVar376;
  float fVar377;
  float fVar378;
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  float fVar379;
  float fVar380;
  float fVar386;
  float fVar388;
  float fVar389;
  float in_register_0000159c;
  undefined1 auVar382 [32];
  float fVar387;
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [64];
  float fVar390;
  float fVar395;
  float fVar396;
  float fVar397;
  float in_register_000015dc;
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  undefined1 auVar394 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  uint local_860;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined1 local_820 [8];
  undefined8 uStack_818;
  RTCFilterFunctionNArguments local_810;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  undefined1 auStack_7d0 [16];
  float local_7c0;
  float fStack_7bc;
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  float local_7a0;
  float fStack_79c;
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [8];
  undefined8 uStack_778;
  undefined1 auStack_770 [8];
  float fStack_768;
  undefined1 local_760 [8];
  undefined8 uStack_758;
  undefined1 auStack_750 [8];
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 (*local_708) [16];
  undefined1 local_700 [8];
  undefined8 uStack_6f8;
  undefined1 auStack_6f0 [16];
  undefined1 local_6d0 [8];
  undefined8 uStack_6c8;
  undefined1 local_6c0 [8];
  undefined8 uStack_6b8;
  undefined1 local_6b0 [8];
  undefined8 uStack_6a8;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [32];
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  undefined1 auStack_630 [8];
  float fStack_628;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [32];
  LinearSpace3fa *local_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  undefined1 auStack_4f0 [8];
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  RTCHitN local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  undefined4 local_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  uint local_380;
  uint uStack_37c;
  uint uStack_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint uStack_368;
  uint uStack_364;
  undefined1 local_360 [32];
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  uint local_300;
  uint local_2fc;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined1 local_2a0 [32];
  float local_280 [4];
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  undefined1 auVar381 [16];
  
  PVar17 = prim[1];
  uVar142 = (ulong)(byte)PVar17;
  lVar147 = uVar142 * 5;
  auVar234 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar234 = vinsertps_avx(auVar234,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar215 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar215 = vinsertps_avx(auVar215,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar230 = *(float *)(prim + uVar142 * 0x19 + 0x12);
  auVar234 = vsubps_avx(auVar234,*(undefined1 (*) [16])(prim + uVar142 * 0x19 + 6));
  auVar185._0_4_ = fVar230 * auVar234._0_4_;
  auVar185._4_4_ = fVar230 * auVar234._4_4_;
  auVar185._8_4_ = fVar230 * auVar234._8_4_;
  auVar185._12_4_ = fVar230 * auVar234._12_4_;
  auVar234 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 * 4 + 6)));
  auVar233 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 * 4 + 10)));
  auVar274._0_4_ = fVar230 * auVar215._0_4_;
  auVar274._4_4_ = fVar230 * auVar215._4_4_;
  auVar274._8_4_ = fVar230 * auVar215._8_4_;
  auVar274._12_4_ = fVar230 * auVar215._12_4_;
  auVar153._16_16_ = auVar233;
  auVar153._0_16_ = auVar234;
  auVar234 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar147 + 6)));
  auVar153 = vcvtdq2ps_avx(auVar153);
  auVar215 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar147 + 10)));
  auVar220._16_16_ = auVar215;
  auVar220._0_16_ = auVar234;
  auVar164 = vcvtdq2ps_avx(auVar220);
  auVar234 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 * 6 + 6)));
  auVar215 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 * 6 + 10)));
  auVar235._16_16_ = auVar215;
  auVar235._0_16_ = auVar234;
  auVar234 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 * 0xb + 6)));
  auVar215 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar142 * 0xb + 10)));
  auVar339 = vcvtdq2ps_avx(auVar235);
  auVar236._16_16_ = auVar215;
  auVar236._0_16_ = auVar234;
  auVar26 = vcvtdq2ps_avx(auVar236);
  uVar145 = (ulong)((uint)(byte)PVar17 * 0xc);
  auVar234 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar145 + 6)));
  auVar215 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar145 + 10)));
  auVar292._16_16_ = auVar215;
  auVar292._0_16_ = auVar234;
  auVar234 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar145 + uVar142 + 6)));
  auVar281 = vcvtdq2ps_avx(auVar292);
  auVar215 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar145 + uVar142 + 10)));
  auVar303._16_16_ = auVar215;
  auVar303._0_16_ = auVar234;
  lVar143 = uVar142 * 9;
  uVar145 = (ulong)(uint)((int)lVar143 * 2);
  auVar234 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar145 + 6)));
  auVar160 = vcvtdq2ps_avx(auVar303);
  auVar215 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar145 + 10)));
  auVar304._16_16_ = auVar215;
  auVar304._0_16_ = auVar234;
  auVar27 = vcvtdq2ps_avx(auVar304);
  auVar234 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar145 + uVar142 + 6)));
  auVar215 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar145 + uVar142 + 10)));
  auVar324._16_16_ = auVar215;
  auVar324._0_16_ = auVar234;
  uVar145 = (ulong)(uint)((int)lVar147 << 2);
  auVar234 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar145 + 6)));
  auVar215 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar145 + 10)));
  auVar28 = vcvtdq2ps_avx(auVar324);
  auVar334._16_16_ = auVar215;
  auVar334._0_16_ = auVar234;
  auVar29 = vcvtdq2ps_avx(auVar334);
  auVar234 = vshufps_avx(auVar274,auVar274,0);
  auVar215 = vshufps_avx(auVar274,auVar274,0x55);
  auVar233 = vshufps_avx(auVar274,auVar274,0xaa);
  fVar230 = auVar233._0_4_;
  fVar245 = auVar233._4_4_;
  fVar246 = auVar233._8_4_;
  fVar247 = auVar233._12_4_;
  fVar248 = auVar215._0_4_;
  fVar249 = auVar215._4_4_;
  fVar251 = auVar215._8_4_;
  fVar253 = auVar215._12_4_;
  fVar263 = auVar234._0_4_;
  fVar265 = auVar234._4_4_;
  fVar267 = auVar234._8_4_;
  fVar269 = auVar234._12_4_;
  auVar356._0_4_ = fVar263 * auVar153._0_4_ + fVar248 * auVar164._0_4_ + fVar230 * auVar339._0_4_;
  auVar356._4_4_ = fVar265 * auVar153._4_4_ + fVar249 * auVar164._4_4_ + fVar245 * auVar339._4_4_;
  auVar356._8_4_ = fVar267 * auVar153._8_4_ + fVar251 * auVar164._8_4_ + fVar246 * auVar339._8_4_;
  auVar356._12_4_ =
       fVar269 * auVar153._12_4_ + fVar253 * auVar164._12_4_ + fVar247 * auVar339._12_4_;
  auVar356._16_4_ =
       fVar263 * auVar153._16_4_ + fVar248 * auVar164._16_4_ + fVar230 * auVar339._16_4_;
  auVar356._20_4_ =
       fVar265 * auVar153._20_4_ + fVar249 * auVar164._20_4_ + fVar245 * auVar339._20_4_;
  auVar356._24_4_ =
       fVar267 * auVar153._24_4_ + fVar251 * auVar164._24_4_ + fVar246 * auVar339._24_4_;
  auVar356._28_4_ = fVar253 + in_register_000015dc + in_register_0000151c;
  auVar345._0_4_ = fVar263 * auVar26._0_4_ + fVar248 * auVar281._0_4_ + auVar160._0_4_ * fVar230;
  auVar345._4_4_ = fVar265 * auVar26._4_4_ + fVar249 * auVar281._4_4_ + auVar160._4_4_ * fVar245;
  auVar345._8_4_ = fVar267 * auVar26._8_4_ + fVar251 * auVar281._8_4_ + auVar160._8_4_ * fVar246;
  auVar345._12_4_ = fVar269 * auVar26._12_4_ + fVar253 * auVar281._12_4_ + auVar160._12_4_ * fVar247
  ;
  auVar345._16_4_ = fVar263 * auVar26._16_4_ + fVar248 * auVar281._16_4_ + auVar160._16_4_ * fVar230
  ;
  auVar345._20_4_ = fVar265 * auVar26._20_4_ + fVar249 * auVar281._20_4_ + auVar160._20_4_ * fVar245
  ;
  auVar345._24_4_ = fVar267 * auVar26._24_4_ + fVar251 * auVar281._24_4_ + auVar160._24_4_ * fVar246
  ;
  auVar345._28_4_ = fVar253 + in_register_000015dc + in_register_0000159c;
  auVar276._0_4_ = fVar263 * auVar27._0_4_ + fVar248 * auVar28._0_4_ + auVar29._0_4_ * fVar230;
  auVar276._4_4_ = fVar265 * auVar27._4_4_ + fVar249 * auVar28._4_4_ + auVar29._4_4_ * fVar245;
  auVar276._8_4_ = fVar267 * auVar27._8_4_ + fVar251 * auVar28._8_4_ + auVar29._8_4_ * fVar246;
  auVar276._12_4_ = fVar269 * auVar27._12_4_ + fVar253 * auVar28._12_4_ + auVar29._12_4_ * fVar247;
  auVar276._16_4_ = fVar263 * auVar27._16_4_ + fVar248 * auVar28._16_4_ + auVar29._16_4_ * fVar230;
  auVar276._20_4_ = fVar265 * auVar27._20_4_ + fVar249 * auVar28._20_4_ + auVar29._20_4_ * fVar245;
  auVar276._24_4_ = fVar267 * auVar27._24_4_ + fVar251 * auVar28._24_4_ + auVar29._24_4_ * fVar246;
  auVar276._28_4_ = fVar269 + fVar253 + fVar247;
  auVar234 = vshufps_avx(auVar185,auVar185,0);
  auVar215 = vshufps_avx(auVar185,auVar185,0x55);
  auVar233 = vshufps_avx(auVar185,auVar185,0xaa);
  fVar245 = auVar233._0_4_;
  fVar246 = auVar233._4_4_;
  fVar247 = auVar233._8_4_;
  fVar248 = auVar233._12_4_;
  fVar265 = auVar215._0_4_;
  fVar267 = auVar215._4_4_;
  fVar269 = auVar215._8_4_;
  fVar270 = auVar215._12_4_;
  fVar249 = auVar234._0_4_;
  fVar251 = auVar234._4_4_;
  fVar253 = auVar234._8_4_;
  fVar263 = auVar234._12_4_;
  fVar230 = auVar153._28_4_;
  auVar293._0_4_ = fVar249 * auVar153._0_4_ + fVar265 * auVar164._0_4_ + fVar245 * auVar339._0_4_;
  auVar293._4_4_ = fVar251 * auVar153._4_4_ + fVar267 * auVar164._4_4_ + fVar246 * auVar339._4_4_;
  auVar293._8_4_ = fVar253 * auVar153._8_4_ + fVar269 * auVar164._8_4_ + fVar247 * auVar339._8_4_;
  auVar293._12_4_ =
       fVar263 * auVar153._12_4_ + fVar270 * auVar164._12_4_ + fVar248 * auVar339._12_4_;
  auVar293._16_4_ =
       fVar249 * auVar153._16_4_ + fVar265 * auVar164._16_4_ + fVar245 * auVar339._16_4_;
  auVar293._20_4_ =
       fVar251 * auVar153._20_4_ + fVar267 * auVar164._20_4_ + fVar246 * auVar339._20_4_;
  auVar293._24_4_ =
       fVar253 * auVar153._24_4_ + fVar269 * auVar164._24_4_ + fVar247 * auVar339._24_4_;
  auVar293._28_4_ = fVar230 + auVar164._28_4_ + auVar339._28_4_;
  auVar191._0_4_ = fVar249 * auVar26._0_4_ + auVar160._0_4_ * fVar245 + fVar265 * auVar281._0_4_;
  auVar191._4_4_ = fVar251 * auVar26._4_4_ + auVar160._4_4_ * fVar246 + fVar267 * auVar281._4_4_;
  auVar191._8_4_ = fVar253 * auVar26._8_4_ + auVar160._8_4_ * fVar247 + fVar269 * auVar281._8_4_;
  auVar191._12_4_ = fVar263 * auVar26._12_4_ + auVar160._12_4_ * fVar248 + fVar270 * auVar281._12_4_
  ;
  auVar191._16_4_ = fVar249 * auVar26._16_4_ + auVar160._16_4_ * fVar245 + fVar265 * auVar281._16_4_
  ;
  auVar191._20_4_ = fVar251 * auVar26._20_4_ + auVar160._20_4_ * fVar246 + fVar267 * auVar281._20_4_
  ;
  auVar191._24_4_ = fVar253 * auVar26._24_4_ + auVar160._24_4_ * fVar247 + fVar269 * auVar281._24_4_
  ;
  auVar191._28_4_ = fVar230 + auVar160._28_4_ + auVar339._28_4_;
  auVar305._8_4_ = 0x7fffffff;
  auVar305._0_8_ = 0x7fffffff7fffffff;
  auVar305._12_4_ = 0x7fffffff;
  auVar305._16_4_ = 0x7fffffff;
  auVar305._20_4_ = 0x7fffffff;
  auVar305._24_4_ = 0x7fffffff;
  auVar305._28_4_ = 0x7fffffff;
  auVar221._8_4_ = 0x219392ef;
  auVar221._0_8_ = 0x219392ef219392ef;
  auVar221._12_4_ = 0x219392ef;
  auVar221._16_4_ = 0x219392ef;
  auVar221._20_4_ = 0x219392ef;
  auVar221._24_4_ = 0x219392ef;
  auVar221._28_4_ = 0x219392ef;
  auVar153 = vandps_avx(auVar356,auVar305);
  auVar153 = vcmpps_avx(auVar153,auVar221,1);
  auVar164 = vblendvps_avx(auVar356,auVar221,auVar153);
  auVar153 = vandps_avx(auVar345,auVar305);
  auVar153 = vcmpps_avx(auVar153,auVar221,1);
  auVar339 = vblendvps_avx(auVar345,auVar221,auVar153);
  auVar153 = vandps_avx(auVar276,auVar305);
  auVar153 = vcmpps_avx(auVar153,auVar221,1);
  auVar153 = vblendvps_avx(auVar276,auVar221,auVar153);
  auVar222._0_4_ = fVar265 * auVar28._0_4_ + auVar29._0_4_ * fVar245 + fVar249 * auVar27._0_4_;
  auVar222._4_4_ = fVar267 * auVar28._4_4_ + auVar29._4_4_ * fVar246 + fVar251 * auVar27._4_4_;
  auVar222._8_4_ = fVar269 * auVar28._8_4_ + auVar29._8_4_ * fVar247 + fVar253 * auVar27._8_4_;
  auVar222._12_4_ = fVar270 * auVar28._12_4_ + auVar29._12_4_ * fVar248 + fVar263 * auVar27._12_4_;
  auVar222._16_4_ = fVar265 * auVar28._16_4_ + auVar29._16_4_ * fVar245 + fVar249 * auVar27._16_4_;
  auVar222._20_4_ = fVar267 * auVar28._20_4_ + auVar29._20_4_ * fVar246 + fVar251 * auVar27._20_4_;
  auVar222._24_4_ = fVar269 * auVar28._24_4_ + auVar29._24_4_ * fVar247 + fVar253 * auVar27._24_4_;
  auVar222._28_4_ = auVar281._28_4_ + fVar248 + fVar230;
  auVar26 = vrcpps_avx(auVar164);
  fVar230 = auVar26._0_4_;
  fVar245 = auVar26._4_4_;
  auVar281._4_4_ = auVar164._4_4_ * fVar245;
  auVar281._0_4_ = auVar164._0_4_ * fVar230;
  fVar246 = auVar26._8_4_;
  auVar281._8_4_ = auVar164._8_4_ * fVar246;
  fVar247 = auVar26._12_4_;
  auVar281._12_4_ = auVar164._12_4_ * fVar247;
  fVar248 = auVar26._16_4_;
  auVar281._16_4_ = auVar164._16_4_ * fVar248;
  fVar249 = auVar26._20_4_;
  auVar281._20_4_ = auVar164._20_4_ * fVar249;
  fVar251 = auVar26._24_4_;
  auVar281._24_4_ = auVar164._24_4_ * fVar251;
  auVar281._28_4_ = auVar164._28_4_;
  auVar313._8_4_ = 0x3f800000;
  auVar313._0_8_ = &DAT_3f8000003f800000;
  auVar313._12_4_ = 0x3f800000;
  auVar313._16_4_ = 0x3f800000;
  auVar313._20_4_ = 0x3f800000;
  auVar313._24_4_ = 0x3f800000;
  auVar313._28_4_ = 0x3f800000;
  auVar281 = vsubps_avx(auVar313,auVar281);
  auVar164 = vrcpps_avx(auVar339);
  fVar230 = fVar230 + fVar230 * auVar281._0_4_;
  fVar245 = fVar245 + fVar245 * auVar281._4_4_;
  fVar246 = fVar246 + fVar246 * auVar281._8_4_;
  fVar247 = fVar247 + fVar247 * auVar281._12_4_;
  fVar248 = fVar248 + fVar248 * auVar281._16_4_;
  fVar249 = fVar249 + fVar249 * auVar281._20_4_;
  fVar251 = fVar251 + fVar251 * auVar281._24_4_;
  fVar273 = auVar164._0_4_;
  fVar283 = auVar164._4_4_;
  auVar160._4_4_ = fVar283 * auVar339._4_4_;
  auVar160._0_4_ = fVar273 * auVar339._0_4_;
  fVar284 = auVar164._8_4_;
  auVar160._8_4_ = fVar284 * auVar339._8_4_;
  fVar285 = auVar164._12_4_;
  auVar160._12_4_ = fVar285 * auVar339._12_4_;
  fVar286 = auVar164._16_4_;
  auVar160._16_4_ = fVar286 * auVar339._16_4_;
  fVar287 = auVar164._20_4_;
  auVar160._20_4_ = fVar287 * auVar339._20_4_;
  fVar288 = auVar164._24_4_;
  auVar160._24_4_ = fVar288 * auVar339._24_4_;
  auVar160._28_4_ = auVar26._28_4_;
  auVar164 = vsubps_avx(auVar313,auVar160);
  fVar273 = fVar273 + fVar273 * auVar164._0_4_;
  fVar283 = fVar283 + fVar283 * auVar164._4_4_;
  fVar284 = fVar284 + fVar284 * auVar164._8_4_;
  fVar285 = fVar285 + fVar285 * auVar164._12_4_;
  fVar286 = fVar286 + fVar286 * auVar164._16_4_;
  fVar287 = fVar287 + fVar287 * auVar164._20_4_;
  fVar288 = fVar288 + fVar288 * auVar164._24_4_;
  auVar164 = vrcpps_avx(auVar153);
  fVar253 = auVar164._0_4_;
  fVar263 = auVar164._4_4_;
  auVar27._4_4_ = fVar263 * auVar153._4_4_;
  auVar27._0_4_ = fVar253 * auVar153._0_4_;
  fVar265 = auVar164._8_4_;
  auVar27._8_4_ = fVar265 * auVar153._8_4_;
  fVar267 = auVar164._12_4_;
  auVar27._12_4_ = fVar267 * auVar153._12_4_;
  fVar269 = auVar164._16_4_;
  auVar27._16_4_ = fVar269 * auVar153._16_4_;
  fVar270 = auVar164._20_4_;
  auVar27._20_4_ = fVar270 * auVar153._20_4_;
  fVar271 = auVar164._24_4_;
  auVar27._24_4_ = fVar271 * auVar153._24_4_;
  auVar27._28_4_ = auVar339._28_4_;
  auVar153 = vsubps_avx(auVar313,auVar27);
  fVar253 = fVar253 + fVar253 * auVar153._0_4_;
  fVar263 = fVar263 + fVar263 * auVar153._4_4_;
  fVar265 = fVar265 + fVar265 * auVar153._8_4_;
  fVar267 = fVar267 + fVar267 * auVar153._12_4_;
  fVar269 = fVar269 + fVar269 * auVar153._16_4_;
  fVar270 = fVar270 + fVar270 * auVar153._20_4_;
  fVar271 = fVar271 + fVar271 * auVar153._24_4_;
  auVar234._8_8_ = 0;
  auVar234._0_8_ = *(ulong *)(prim + uVar142 * 7 + 6);
  auVar234 = vpmovsxwd_avx(auVar234);
  auVar215._8_8_ = 0;
  auVar215._0_8_ = *(ulong *)(prim + uVar142 * 7 + 0xe);
  auVar215 = vpmovsxwd_avx(auVar215);
  auVar154._16_16_ = auVar215;
  auVar154._0_16_ = auVar234;
  auVar153 = vcvtdq2ps_avx(auVar154);
  auVar153 = vsubps_avx(auVar153,auVar293);
  auVar151._0_4_ = fVar230 * auVar153._0_4_;
  auVar151._4_4_ = fVar245 * auVar153._4_4_;
  auVar151._8_4_ = fVar246 * auVar153._8_4_;
  auVar151._12_4_ = fVar247 * auVar153._12_4_;
  auVar339._16_4_ = fVar248 * auVar153._16_4_;
  auVar339._0_16_ = auVar151;
  auVar339._20_4_ = fVar249 * auVar153._20_4_;
  auVar339._24_4_ = fVar251 * auVar153._24_4_;
  auVar339._28_4_ = auVar153._28_4_;
  auVar233._8_8_ = 0;
  auVar233._0_8_ = *(ulong *)(prim + lVar143 + 6);
  auVar234 = vpmovsxwd_avx(auVar233);
  auVar218._8_8_ = 0;
  auVar218._0_8_ = *(ulong *)(prim + lVar143 + 0xe);
  auVar215 = vpmovsxwd_avx(auVar218);
  auVar306._16_16_ = auVar215;
  auVar306._0_16_ = auVar234;
  auVar153 = vcvtdq2ps_avx(auVar306);
  auVar153 = vsubps_avx(auVar153,auVar293);
  auVar231._0_4_ = fVar230 * auVar153._0_4_;
  auVar231._4_4_ = fVar245 * auVar153._4_4_;
  auVar231._8_4_ = fVar246 * auVar153._8_4_;
  auVar231._12_4_ = fVar247 * auVar153._12_4_;
  auVar28._16_4_ = fVar248 * auVar153._16_4_;
  auVar28._0_16_ = auVar231;
  auVar28._20_4_ = fVar249 * auVar153._20_4_;
  auVar28._24_4_ = fVar251 * auVar153._24_4_;
  auVar28._28_4_ = auVar26._28_4_ + auVar281._28_4_;
  lVar147 = (ulong)(byte)PVar17 * 0x10;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + lVar147 + 6);
  auVar234 = vpmovsxwd_avx(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + lVar147 + 0xe);
  auVar215 = vpmovsxwd_avx(auVar10);
  lVar147 = lVar147 + uVar142 * -2;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + lVar147 + 6);
  auVar233 = vpmovsxwd_avx(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + lVar147 + 0xe);
  auVar218 = vpmovsxwd_avx(auVar12);
  auVar294._16_16_ = auVar218;
  auVar294._0_16_ = auVar233;
  auVar153 = vcvtdq2ps_avx(auVar294);
  auVar153 = vsubps_avx(auVar153,auVar191);
  auVar291._0_4_ = fVar273 * auVar153._0_4_;
  auVar291._4_4_ = fVar283 * auVar153._4_4_;
  auVar291._8_4_ = fVar284 * auVar153._8_4_;
  auVar291._12_4_ = fVar285 * auVar153._12_4_;
  auVar26._16_4_ = fVar286 * auVar153._16_4_;
  auVar26._0_16_ = auVar291;
  auVar26._20_4_ = fVar287 * auVar153._20_4_;
  auVar26._24_4_ = fVar288 * auVar153._24_4_;
  auVar26._28_4_ = auVar153._28_4_;
  auVar307._16_16_ = auVar215;
  auVar307._0_16_ = auVar234;
  auVar153 = vcvtdq2ps_avx(auVar307);
  auVar153 = vsubps_avx(auVar153,auVar191);
  auVar186._0_4_ = fVar273 * auVar153._0_4_;
  auVar186._4_4_ = fVar283 * auVar153._4_4_;
  auVar186._8_4_ = fVar284 * auVar153._8_4_;
  auVar186._12_4_ = fVar285 * auVar153._12_4_;
  auVar29._16_4_ = fVar286 * auVar153._16_4_;
  auVar29._0_16_ = auVar186;
  auVar29._20_4_ = fVar287 * auVar153._20_4_;
  auVar29._24_4_ = fVar288 * auVar153._24_4_;
  auVar29._28_4_ = auVar153._28_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar145 + uVar142 + 6);
  auVar234 = vpmovsxwd_avx(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar145 + uVar142 + 0xe);
  auVar215 = vpmovsxwd_avx(auVar14);
  auVar277._16_16_ = auVar215;
  auVar277._0_16_ = auVar234;
  auVar153 = vcvtdq2ps_avx(auVar277);
  auVar153 = vsubps_avx(auVar153,auVar222);
  auVar275._0_4_ = fVar253 * auVar153._0_4_;
  auVar275._4_4_ = fVar263 * auVar153._4_4_;
  auVar275._8_4_ = fVar265 * auVar153._8_4_;
  auVar275._12_4_ = fVar267 * auVar153._12_4_;
  auVar393._16_4_ = fVar269 * auVar153._16_4_;
  auVar393._0_16_ = auVar275;
  auVar393._20_4_ = fVar270 * auVar153._20_4_;
  auVar393._24_4_ = fVar271 * auVar153._24_4_;
  auVar393._28_4_ = auVar153._28_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar142 * 0x17 + 6);
  auVar234 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar142 * 0x17 + 0xe);
  auVar215 = vpmovsxwd_avx(auVar16);
  auVar308._16_16_ = auVar215;
  auVar308._0_16_ = auVar234;
  auVar153 = vcvtdq2ps_avx(auVar308);
  auVar153 = vsubps_avx(auVar153,auVar222);
  auVar210._0_4_ = fVar253 * auVar153._0_4_;
  auVar210._4_4_ = fVar263 * auVar153._4_4_;
  auVar210._8_4_ = fVar265 * auVar153._8_4_;
  auVar210._12_4_ = fVar267 * auVar153._12_4_;
  auVar25._16_4_ = fVar269 * auVar153._16_4_;
  auVar25._0_16_ = auVar210;
  auVar25._20_4_ = fVar270 * auVar153._20_4_;
  auVar25._24_4_ = fVar271 * auVar153._24_4_;
  auVar25._28_4_ = auVar153._28_4_;
  auVar234 = vpminsd_avx(auVar339._16_16_,auVar28._16_16_);
  auVar215 = vpminsd_avx(auVar151,auVar231);
  auVar314._16_16_ = auVar234;
  auVar314._0_16_ = auVar215;
  auVar234 = vpminsd_avx(auVar26._16_16_,auVar29._16_16_);
  auVar215 = vpminsd_avx(auVar291,auVar186);
  auVar346._16_16_ = auVar234;
  auVar346._0_16_ = auVar215;
  auVar153 = vmaxps_avx(auVar314,auVar346);
  auVar234 = vpminsd_avx(auVar393._16_16_,auVar25._16_16_);
  auVar215 = vpminsd_avx(auVar275,auVar210);
  auVar370._16_16_ = auVar234;
  auVar370._0_16_ = auVar215;
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar382._4_4_ = uVar8;
  auVar382._0_4_ = uVar8;
  auVar382._8_4_ = uVar8;
  auVar382._12_4_ = uVar8;
  auVar382._16_4_ = uVar8;
  auVar382._20_4_ = uVar8;
  auVar382._24_4_ = uVar8;
  auVar382._28_4_ = uVar8;
  auVar164 = vmaxps_avx(auVar370,auVar382);
  auVar153 = vmaxps_avx(auVar153,auVar164);
  local_80._4_4_ = auVar153._4_4_ * 0.99999964;
  local_80._0_4_ = auVar153._0_4_ * 0.99999964;
  local_80._8_4_ = auVar153._8_4_ * 0.99999964;
  local_80._12_4_ = auVar153._12_4_ * 0.99999964;
  local_80._16_4_ = auVar153._16_4_ * 0.99999964;
  local_80._20_4_ = auVar153._20_4_ * 0.99999964;
  local_80._24_4_ = auVar153._24_4_ * 0.99999964;
  local_80._28_4_ = auVar153._28_4_;
  auVar234 = vpmaxsd_avx(auVar339._16_16_,auVar28._16_16_);
  auVar215 = vpmaxsd_avx(auVar151,auVar231);
  auVar155._16_16_ = auVar234;
  auVar155._0_16_ = auVar215;
  auVar234 = vpmaxsd_avx(auVar26._16_16_,auVar29._16_16_);
  auVar215 = vpmaxsd_avx(auVar291,auVar186);
  auVar192._16_16_ = auVar234;
  auVar192._0_16_ = auVar215;
  auVar153 = vminps_avx(auVar155,auVar192);
  auVar234 = vpmaxsd_avx(auVar393._16_16_,auVar25._16_16_);
  auVar215 = vpmaxsd_avx(auVar275,auVar210);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar237._4_4_ = uVar8;
  auVar237._0_4_ = uVar8;
  auVar237._8_4_ = uVar8;
  auVar237._12_4_ = uVar8;
  auVar237._16_4_ = uVar8;
  auVar237._20_4_ = uVar8;
  auVar237._24_4_ = uVar8;
  auVar237._28_4_ = uVar8;
  auVar193._16_16_ = auVar234;
  auVar193._0_16_ = auVar215;
  auVar164 = vminps_avx(auVar193,auVar237);
  auVar153 = vminps_avx(auVar153,auVar164);
  auVar164._4_4_ = auVar153._4_4_ * 1.0000004;
  auVar164._0_4_ = auVar153._0_4_ * 1.0000004;
  auVar164._8_4_ = auVar153._8_4_ * 1.0000004;
  auVar164._12_4_ = auVar153._12_4_ * 1.0000004;
  auVar164._16_4_ = auVar153._16_4_ * 1.0000004;
  auVar164._20_4_ = auVar153._20_4_ * 1.0000004;
  auVar164._24_4_ = auVar153._24_4_ * 1.0000004;
  auVar164._28_4_ = auVar153._28_4_;
  auVar153 = vcmpps_avx(local_80,auVar164,2);
  auVar234 = vpshufd_avx(ZEXT116((byte)PVar17),0);
  auVar194._16_16_ = auVar234;
  auVar194._0_16_ = auVar234;
  auVar164 = vcvtdq2ps_avx(auVar194);
  auVar164 = vcmpps_avx(_DAT_02020f40,auVar164,1);
  auVar153 = vandps_avx(auVar153,auVar164);
  uVar140 = vmovmskps_avx(auVar153);
  if (uVar140 != 0) {
    uVar140 = uVar140 & 0xff;
    local_5c0 = mm_lookupmask_ps._16_8_;
    uStack_5b8 = mm_lookupmask_ps._24_8_;
    uStack_5b0 = mm_lookupmask_ps._16_8_;
    uStack_5a8 = mm_lookupmask_ps._24_8_;
    local_5c8 = pre->ray_space + k;
    local_708 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    do {
      lVar147 = 0;
      if (uVar140 != 0) {
        for (; (uVar140 >> lVar147 & 1) == 0; lVar147 = lVar147 + 1) {
        }
      }
      uVar18 = *(uint *)(prim + 2);
      uVar19 = *(uint *)(prim + lVar147 * 4 + 6);
      pGVar22 = (context->scene->geometries).items[uVar18].ptr;
      uVar142 = (ulong)*(uint *)(*(long *)&pGVar22->field_0x58 +
                                (ulong)uVar19 *
                                pGVar22[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      lVar146 = (long)pGVar22[1].intersectionFilterN * uVar142;
      pfVar1 = (float *)(pGVar22[2].intersectionFilterN + uVar142 * (long)pGVar22[2].pointQueryFunc)
      ;
      pfVar2 = (float *)(pGVar22[2].intersectionFilterN +
                        (long)pGVar22[2].pointQueryFunc * (uVar142 + 1));
      auVar187._0_4_ = *pfVar2 * 0.33333334;
      auVar187._4_4_ = pfVar2[1] * 0.33333334;
      auVar187._8_4_ = pfVar2[2] * 0.33333334;
      auVar187._12_4_ = pfVar2[3] * 0.33333334;
      lVar143 = (long)pGVar22[1].intersectionFilterN * (uVar142 + 1);
      lVar147 = *(long *)&pGVar22[1].time_range.upper;
      _local_820 = *(undefined1 (*) [16])(lVar147 + lVar146);
      _local_6b0 = *(undefined1 (*) [16])(lVar147 + lVar143);
      fVar230 = *(float *)(lVar147 + 0xc + lVar146);
      auVar302._4_4_ = fVar230;
      auVar302._0_4_ = fVar230;
      auVar302._8_4_ = fVar230;
      auVar302._12_4_ = fVar230;
      fStack_170 = fVar230;
      _local_180 = auVar302;
      fStack_16c = fVar230;
      fStack_168 = fVar230;
      register0x000013dc = fVar230;
      uVar20 = (uint)pGVar22[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar245 = *(float *)(lVar147 + 0xc + lVar143);
      auVar369._4_4_ = fVar245;
      auVar369._0_4_ = fVar245;
      auVar369._8_4_ = fVar245;
      auVar369._12_4_ = fVar245;
      fStack_d0 = fVar245;
      _local_e0 = auVar369;
      fStack_cc = fVar245;
      fStack_c8 = fVar245;
      fStack_c4 = fVar245;
      lVar147 = (long)(int)uVar20 * 0x44;
      auVar234 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar234 = vinsertps_avx(auVar234,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      fVar379 = local_820._0_4_ + *pfVar1 * 0.33333334;
      fVar386 = local_820._4_4_ + pfVar1[1] * 0.33333334;
      auVar381._0_8_ = CONCAT44(fVar386,fVar379);
      auVar381._8_4_ = local_820._8_4_ + pfVar1[2] * 0.33333334;
      auVar381._12_4_ = local_820._12_4_ + pfVar1[3] * 0.33333334;
      _local_6d0 = vsubps_avx(_local_6b0,auVar187);
      auVar218 = vsubps_avx(_local_820,auVar234);
      auVar215 = vshufps_avx(auVar218,auVar218,0);
      auVar233 = vshufps_avx(auVar218,auVar218,0x55);
      auVar218 = vshufps_avx(auVar218,auVar218,0xaa);
      fVar246 = (local_5c8->vx).field_0.m128[0];
      fVar247 = (local_5c8->vx).field_0.m128[1];
      fVar248 = (local_5c8->vx).field_0.m128[2];
      fVar249 = (local_5c8->vx).field_0.m128[3];
      fVar251 = (local_5c8->vy).field_0.m128[0];
      fVar253 = (local_5c8->vy).field_0.m128[1];
      fVar263 = (local_5c8->vy).field_0.m128[2];
      fVar265 = (local_5c8->vy).field_0.m128[3];
      fVar267 = (local_5c8->vz).field_0.m128[0];
      fVar269 = (local_5c8->vz).field_0.m128[1];
      fVar270 = (local_5c8->vz).field_0.m128[2];
      fVar271 = (local_5c8->vz).field_0.m128[3];
      auVar188._0_8_ =
           CONCAT44(auVar215._4_4_ * fVar247 + auVar233._4_4_ * fVar253 + fVar269 * auVar218._4_4_,
                    auVar215._0_4_ * fVar246 + auVar233._0_4_ * fVar251 + fVar267 * auVar218._0_4_);
      auVar188._8_4_ =
           auVar215._8_4_ * fVar248 + auVar233._8_4_ * fVar263 + fVar270 * auVar218._8_4_;
      auVar188._12_4_ =
           auVar215._12_4_ * fVar249 + auVar233._12_4_ * fVar265 + fVar271 * auVar218._12_4_;
      auVar218 = vinsertps_avx(auVar188,auVar302,0x30);
      auVar9 = vsubps_avx(auVar381,auVar234);
      auVar215 = vshufps_avx(auVar9,auVar9,0);
      auVar233 = vshufps_avx(auVar9,auVar9,0x55);
      auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
      auVar355._0_4_ = auVar215._0_4_ * fVar246 + auVar233._0_4_ * fVar251 + fVar267 * auVar9._0_4_;
      auVar355._4_4_ = auVar215._4_4_ * fVar247 + auVar233._4_4_ * fVar253 + fVar269 * auVar9._4_4_;
      auVar355._8_4_ = auVar215._8_4_ * fVar248 + auVar233._8_4_ * fVar263 + fVar270 * auVar9._8_4_;
      auVar355._12_4_ =
           auVar215._12_4_ * fVar249 + auVar233._12_4_ * fVar265 + fVar271 * auVar9._12_4_;
      auVar10 = vsubps_avx(_local_6d0,auVar234);
      auVar233 = vshufps_avx(auVar10,auVar10,0x55);
      auVar9 = vshufps_avx(auVar10,auVar10,0xaa);
      auVar215 = vblendps_avx(auVar355,auVar381,8);
      auVar10 = vshufps_avx(auVar10,auVar10,0);
      auVar255._0_4_ = auVar233._0_4_ * fVar251 + auVar9._0_4_ * fVar267 + auVar10._0_4_ * fVar246;
      auVar255._4_4_ = auVar233._4_4_ * fVar253 + auVar9._4_4_ * fVar269 + auVar10._4_4_ * fVar247;
      auVar255._8_4_ = auVar233._8_4_ * fVar263 + auVar9._8_4_ * fVar270 + auVar10._8_4_ * fVar248;
      auVar255._12_4_ =
           auVar233._12_4_ * fVar265 + auVar9._12_4_ * fVar271 + auVar10._12_4_ * fVar249;
      auVar10 = vsubps_avx(_local_6b0,auVar234);
      auVar234 = vshufps_avx(auVar10,auVar10,0xaa);
      auVar9 = vshufps_avx(auVar10,auVar10,0x55);
      auVar233 = vblendps_avx(auVar255,_local_6d0,8);
      auVar10 = vshufps_avx(auVar10,auVar10,0);
      auVar211._0_4_ = auVar10._0_4_ * fVar246 + auVar9._0_4_ * fVar251 + fVar267 * auVar234._0_4_;
      auVar211._4_4_ = auVar10._4_4_ * fVar247 + auVar9._4_4_ * fVar253 + fVar269 * auVar234._4_4_;
      auVar211._8_4_ = auVar10._8_4_ * fVar248 + auVar9._8_4_ * fVar263 + fVar270 * auVar234._8_4_;
      auVar211._12_4_ =
           auVar10._12_4_ * fVar249 + auVar9._12_4_ * fVar265 + fVar271 * auVar234._12_4_;
      auVar9 = vinsertps_avx(auVar211,auVar369,0x30);
      auVar232._8_4_ = 0x7fffffff;
      auVar232._0_8_ = 0x7fffffff7fffffff;
      auVar232._12_4_ = 0x7fffffff;
      auVar234 = vandps_avx(auVar218,auVar232);
      auVar215 = vandps_avx(auVar215,auVar232);
      auVar218 = vmaxps_avx(auVar234,auVar215);
      auVar234 = vandps_avx(auVar233,auVar232);
      auVar215 = vandps_avx(auVar9,auVar232);
      auVar234 = vmaxps_avx(auVar234,auVar215);
      auVar234 = vmaxps_avx(auVar218,auVar234);
      auVar215 = vmovshdup_avx(auVar234);
      auVar215 = vmaxss_avx(auVar215,auVar234);
      auVar234 = vshufpd_avx(auVar234,auVar234,1);
      auVar234 = vmaxss_avx(auVar234,auVar215);
      fVar286 = *(float *)(bezier_basis0 + lVar147 + 0x908);
      fVar287 = *(float *)(bezier_basis0 + lVar147 + 0x90c);
      fVar288 = *(float *)(bezier_basis0 + lVar147 + 0x910);
      fVar317 = *(float *)(bezier_basis0 + lVar147 + 0x914);
      fVar318 = *(float *)(bezier_basis0 + lVar147 + 0x918);
      fVar250 = *(float *)(bezier_basis0 + lVar147 + 0x91c);
      fVar289 = *(float *)(bezier_basis0 + lVar147 + 0x920);
      auVar215 = vshufps_avx(auVar255,auVar255,0);
      local_680._16_16_ = auVar215;
      local_680._0_16_ = auVar215;
      fVar320 = *(float *)(bezier_basis0 + lVar147 + 0xd8c);
      fVar322 = *(float *)(bezier_basis0 + lVar147 + 0xd90);
      fVar252 = *(float *)(bezier_basis0 + lVar147 + 0xd94);
      fVar149 = *(float *)(bezier_basis0 + lVar147 + 0xd98);
      fVar169 = *(float *)(bezier_basis0 + lVar147 + 0xd9c);
      fVar172 = *(float *)(bezier_basis0 + lVar147 + 0xda0);
      fVar175 = *(float *)(bezier_basis0 + lVar147 + 0xda4);
      auVar233 = vshufps_avx(auVar211,auVar211,0);
      register0x00001550 = auVar233;
      _local_440 = auVar233;
      fVar367 = auVar233._0_4_;
      fVar373 = auVar233._4_4_;
      fVar375 = auVar233._8_4_;
      fVar377 = auVar233._12_4_;
      fVar184 = auVar215._0_4_;
      fVar204 = auVar215._4_4_;
      fVar205 = auVar215._8_4_;
      fVar206 = auVar215._12_4_;
      auVar215 = vshufps_avx(auVar255,auVar255,0x55);
      register0x00001290 = auVar215;
      _local_4c0 = auVar215;
      auVar233 = vshufps_avx(auVar211,auVar211,0x55);
      register0x000014d0 = auVar233;
      _local_460 = auVar233;
      fVar344 = auVar233._0_4_;
      fVar349 = auVar233._4_4_;
      fVar350 = auVar233._8_4_;
      fVar351 = auVar233._12_4_;
      fVar208 = auVar215._0_4_;
      fVar224 = auVar215._4_4_;
      fVar226 = auVar215._8_4_;
      fVar228 = auVar215._12_4_;
      auVar215 = vshufps_avx(_local_6d0,_local_6d0,0xff);
      register0x00001390 = auVar215;
      _local_a0 = auVar215;
      fVar271 = auVar215._0_4_;
      fVar273 = auVar215._4_4_;
      fVar283 = auVar215._8_4_;
      fVar284 = auVar215._12_4_;
      auVar215 = vshufps_avx(auVar355,auVar355,0);
      register0x00001310 = auVar215;
      _local_480 = auVar215;
      fVar207 = *(float *)(bezier_basis0 + lVar147 + 0x484);
      fVar178 = *(float *)(bezier_basis0 + lVar147 + 0x488);
      fVar180 = *(float *)(bezier_basis0 + lVar147 + 0x48c);
      fVar150 = *(float *)(bezier_basis0 + lVar147 + 0x490);
      fVar170 = *(float *)(bezier_basis0 + lVar147 + 0x494);
      fVar173 = *(float *)(bezier_basis0 + lVar147 + 0x498);
      fVar176 = *(float *)(bezier_basis0 + lVar147 + 0x49c);
      fVar246 = auVar215._0_4_;
      fVar247 = auVar215._4_4_;
      fVar251 = auVar215._8_4_;
      fVar265 = auVar215._12_4_;
      auVar215 = vshufps_avx(auVar355,auVar355,0x55);
      register0x000015d0 = auVar215;
      _local_6a0 = auVar215;
      fVar390 = auVar215._0_4_;
      fVar395 = auVar215._4_4_;
      fVar396 = auVar215._8_4_;
      fVar397 = auVar215._12_4_;
      auVar215 = vshufps_avx(auVar381,auVar381,0xff);
      register0x00001590 = auVar215;
      _local_120 = auVar215;
      fVar285 = auVar215._0_4_;
      fVar148 = auVar215._4_4_;
      fVar168 = auVar215._8_4_;
      fVar171 = auVar215._12_4_;
      auVar121._8_4_ = auVar188._8_4_;
      auVar121._0_8_ = auVar188._0_8_;
      auVar121._12_4_ = auVar188._12_4_;
      auVar215 = vshufps_avx(auVar121,auVar121,0);
      register0x00001290 = auVar215;
      _local_100 = auVar215;
      local_1c0 = *(float *)(bezier_basis0 + lVar147);
      fStack_1bc = *(float *)(bezier_basis0 + lVar147 + 4);
      fStack_1b8 = *(float *)(bezier_basis0 + lVar147 + 8);
      fStack_1b4 = *(float *)(bezier_basis0 + lVar147 + 0xc);
      fStack_1b0 = *(float *)(bezier_basis0 + lVar147 + 0x10);
      fStack_1ac = *(float *)(bezier_basis0 + lVar147 + 0x14);
      fStack_1a8 = *(float *)(bezier_basis0 + lVar147 + 0x18);
      fVar209 = auVar215._0_4_;
      fVar225 = auVar215._4_4_;
      fVar227 = auVar215._8_4_;
      fVar229 = auVar215._12_4_;
      auVar335._0_4_ =
           fVar209 * local_1c0 + fVar207 * fVar246 + fVar184 * fVar286 + fVar367 * fVar320;
      auVar335._4_4_ =
           fVar225 * fStack_1bc + fVar178 * fVar247 + fVar204 * fVar287 + fVar373 * fVar322;
      auVar335._8_4_ =
           fVar227 * fStack_1b8 + fVar180 * fVar251 + fVar205 * fVar288 + fVar375 * fVar252;
      auVar335._12_4_ =
           fVar229 * fStack_1b4 + fVar150 * fVar265 + fVar206 * fVar317 + fVar377 * fVar149;
      auVar335._16_4_ =
           fVar209 * fStack_1b0 + fVar170 * fVar246 + fVar184 * fVar318 + fVar367 * fVar169;
      auVar335._20_4_ =
           fVar225 * fStack_1ac + fVar173 * fVar247 + fVar204 * fVar250 + fVar373 * fVar172;
      auVar335._24_4_ =
           fVar227 * fStack_1a8 + fVar176 * fVar251 + fVar205 * fVar289 + fVar375 * fVar175;
      auVar335._28_4_ = fVar206 + 0.0 + 0.0 + 0.0;
      auVar215 = vshufps_avx(auVar121,auVar121,0x55);
      register0x00001510 = auVar215;
      _local_420 = auVar215;
      fVar353 = auVar215._0_4_;
      fVar361 = auVar215._4_4_;
      fVar363 = auVar215._8_4_;
      fVar365 = auVar215._12_4_;
      auVar315._0_4_ =
           fVar353 * local_1c0 + fVar390 * fVar207 + fVar208 * fVar286 + fVar344 * fVar320;
      auVar315._4_4_ =
           fVar361 * fStack_1bc + fVar395 * fVar178 + fVar224 * fVar287 + fVar349 * fVar322;
      auVar315._8_4_ =
           fVar363 * fStack_1b8 + fVar396 * fVar180 + fVar226 * fVar288 + fVar350 * fVar252;
      auVar315._12_4_ =
           fVar365 * fStack_1b4 + fVar397 * fVar150 + fVar228 * fVar317 + fVar351 * fVar149;
      auVar315._16_4_ =
           fVar353 * fStack_1b0 + fVar390 * fVar170 + fVar208 * fVar318 + fVar344 * fVar169;
      auVar315._20_4_ =
           fVar361 * fStack_1ac + fVar395 * fVar173 + fVar224 * fVar250 + fVar349 * fVar172;
      auVar315._24_4_ =
           fVar363 * fStack_1a8 + fVar396 * fVar176 + fVar226 * fVar289 + fVar350 * fVar175;
      auVar315._28_4_ = fVar228 + 0.0 + 0.0 + 0.0;
      fStack_1a4 = *(float *)(bezier_basis0 + lVar147 + 0x1c);
      local_880._0_4_ =
           fVar285 * fVar207 + fVar271 * fVar286 + fVar245 * fVar320 + local_1c0 * fVar230;
      local_880._4_4_ =
           fVar148 * fVar178 + fVar273 * fVar287 + fVar245 * fVar322 + fStack_1bc * fVar230;
      fStack_878 = fVar168 * fVar180 + fVar283 * fVar288 + fVar245 * fVar252 + fStack_1b8 * fVar230;
      fStack_874 = fVar171 * fVar150 + fVar284 * fVar317 + fVar245 * fVar149 + fStack_1b4 * fVar230;
      fStack_870 = fVar285 * fVar170 + fVar271 * fVar318 + fVar245 * fVar169 + fStack_1b0 * fVar230;
      fStack_86c = fVar148 * fVar173 + fVar273 * fVar250 + fVar245 * fVar172 + fStack_1ac * fVar230;
      fStack_868 = fVar168 * fVar176 + fVar283 * fVar289 + fVar245 * fVar175 + fStack_1a8 * fVar230;
      fStack_864 = *(float *)(bezier_basis0 + lVar147 + 0x924) + 0.0 + 0.0 +
                   *(float *)(bezier_basis0 + lVar147 + 0x1c);
      fVar177 = *(float *)(bezier_basis1 + lVar147 + 0x908);
      fVar179 = *(float *)(bezier_basis1 + lVar147 + 0x90c);
      fVar181 = *(float *)(bezier_basis1 + lVar147 + 0x910);
      fVar182 = *(float *)(bezier_basis1 + lVar147 + 0x914);
      fVar272 = *(float *)(bezier_basis1 + lVar147 + 0x918);
      fVar341 = *(float *)(bezier_basis1 + lVar147 + 0x91c);
      fVar342 = *(float *)(bezier_basis1 + lVar147 + 0x920);
      fVar248 = *(float *)*(undefined1 (*) [28])(bezier_basis1 + lVar147 + 0xd8c);
      fVar249 = *(float *)(bezier_basis1 + lVar147 + 0xd90);
      fVar253 = *(float *)(bezier_basis1 + lVar147 + 0xd94);
      fVar263 = *(float *)(bezier_basis1 + lVar147 + 0xd98);
      fVar267 = *(float *)(bezier_basis1 + lVar147 + 0xd9c);
      fVar269 = *(float *)(bezier_basis1 + lVar147 + 0xda0);
      fVar270 = *(float *)(bezier_basis1 + lVar147 + 0xda4);
      auVar136 = *(undefined1 (*) [28])(bezier_basis1 + lVar147 + 0xd8c);
      fVar343 = *(float *)(bezier_basis1 + lVar147 + 0x484);
      fVar319 = *(float *)(bezier_basis1 + lVar147 + 0x488);
      fVar321 = *(float *)(bezier_basis1 + lVar147 + 0x48c);
      fVar323 = *(float *)(bezier_basis1 + lVar147 + 0x490);
      fVar183 = *(float *)(bezier_basis1 + lVar147 + 0x494);
      fVar300 = *(float *)(bezier_basis1 + lVar147 + 0x498);
      fVar329 = *(float *)(bezier_basis1 + lVar147 + 0x49c);
      fVar330 = *(float *)(bezier_basis1 + lVar147);
      fVar331 = *(float *)(bezier_basis1 + lVar147 + 4);
      fVar332 = *(float *)(bezier_basis1 + lVar147 + 8);
      fVar352 = *(float *)(bezier_basis1 + lVar147 + 0xc);
      fVar301 = *(float *)(bezier_basis1 + lVar147 + 0x10);
      fVar311 = *(float *)(bezier_basis1 + lVar147 + 0x14);
      fVar312 = *(float *)(bezier_basis1 + lVar147 + 0x18);
      auVar257._0_4_ = fVar209 * fVar330 + fVar246 * fVar343 + fVar177 * fVar184 + fVar367 * fVar248
      ;
      auVar257._4_4_ = fVar225 * fVar331 + fVar247 * fVar319 + fVar179 * fVar204 + fVar373 * fVar249
      ;
      auVar257._8_4_ = fVar227 * fVar332 + fVar251 * fVar321 + fVar181 * fVar205 + fVar375 * fVar253
      ;
      auVar257._12_4_ =
           fVar229 * fVar352 + fVar265 * fVar323 + fVar182 * fVar206 + fVar377 * fVar263;
      auVar257._16_4_ =
           fVar209 * fVar301 + fVar246 * fVar183 + fVar272 * fVar184 + fVar367 * fVar267;
      auVar257._20_4_ =
           fVar225 * fVar311 + fVar247 * fVar300 + fVar341 * fVar204 + fVar373 * fVar269;
      auVar257._24_4_ =
           fVar227 * fVar312 + fVar251 * fVar329 + fVar342 * fVar205 + fVar375 * fVar270;
      auVar257._28_4_ = fVar171 + fVar377 + 0.0;
      auVar238._0_4_ = fVar353 * fVar330 + fVar390 * fVar343 + fVar177 * fVar208 + fVar344 * fVar248
      ;
      auVar238._4_4_ = fVar361 * fVar331 + fVar395 * fVar319 + fVar179 * fVar224 + fVar349 * fVar249
      ;
      auVar238._8_4_ = fVar363 * fVar332 + fVar396 * fVar321 + fVar181 * fVar226 + fVar350 * fVar253
      ;
      auVar238._12_4_ =
           fVar365 * fVar352 + fVar397 * fVar323 + fVar182 * fVar228 + fVar351 * fVar263;
      auVar238._16_4_ =
           fVar353 * fVar301 + fVar390 * fVar183 + fVar272 * fVar208 + fVar344 * fVar267;
      auVar238._20_4_ =
           fVar361 * fVar311 + fVar395 * fVar300 + fVar341 * fVar224 + fVar349 * fVar269;
      auVar238._24_4_ =
           fVar363 * fVar312 + fVar396 * fVar329 + fVar342 * fVar226 + fVar350 * fVar270;
      auVar238._28_4_ = fVar229 + fVar377 + 0.0;
      local_7e0._0_4_ =
           fVar285 * fVar343 + fVar271 * fVar177 + fVar248 * fVar245 + fVar330 * fVar230;
      local_7e0._4_4_ =
           fVar148 * fVar319 + fVar273 * fVar179 + fVar249 * fVar245 + fVar331 * fVar230;
      fStack_7d8 = fVar168 * fVar321 + fVar283 * fVar181 + fVar253 * fVar245 + fVar332 * fVar230;
      fStack_7d4 = fVar171 * fVar323 + fVar284 * fVar182 + fVar263 * fVar245 + fVar352 * fVar230;
      register0x000015d0 =
           fVar285 * fVar183 + fVar271 * fVar272 + fVar267 * fVar245 + fVar301 * fVar230;
      register0x000015d4 =
           fVar148 * fVar300 + fVar273 * fVar341 + fVar269 * fVar245 + fVar311 * fVar230;
      register0x000015d8 =
           fVar168 * fVar329 + fVar283 * fVar342 + fVar270 * fVar245 + fVar312 * fVar230;
      register0x000015dc = fVar377 + fVar284 + 0.0 + fVar229;
      auVar339 = vsubps_avx(auVar257,auVar335);
      _auStack_4f0 = auVar339._16_16_;
      local_1a0 = vsubps_avx(auVar238,auVar315);
      fVar230 = auVar339._0_4_;
      fVar248 = auVar339._4_4_;
      auVar30._4_4_ = auVar315._4_4_ * fVar248;
      auVar30._0_4_ = auVar315._0_4_ * fVar230;
      fVar253 = auVar339._8_4_;
      auVar30._8_4_ = auVar315._8_4_ * fVar253;
      fVar267 = auVar339._12_4_;
      auVar30._12_4_ = auVar315._12_4_ * fVar267;
      fVar270 = auVar339._16_4_;
      auVar30._16_4_ = auVar315._16_4_ * fVar270;
      fVar273 = auVar339._20_4_;
      auVar30._20_4_ = auVar315._20_4_ * fVar273;
      fVar284 = auVar339._24_4_;
      auVar30._24_4_ = auVar315._24_4_ * fVar284;
      auVar30._28_4_ = fVar229;
      fVar245 = local_1a0._0_4_;
      fVar249 = local_1a0._4_4_;
      auVar31._4_4_ = auVar335._4_4_ * fVar249;
      auVar31._0_4_ = auVar335._0_4_ * fVar245;
      fVar263 = local_1a0._8_4_;
      auVar31._8_4_ = auVar335._8_4_ * fVar263;
      fVar269 = local_1a0._12_4_;
      auVar31._12_4_ = auVar335._12_4_ * fVar269;
      fVar271 = local_1a0._16_4_;
      auVar31._16_4_ = auVar335._16_4_ * fVar271;
      fVar283 = local_1a0._20_4_;
      auVar31._20_4_ = auVar335._20_4_ * fVar283;
      fVar285 = local_1a0._24_4_;
      auVar31._24_4_ = auVar335._24_4_ * fVar285;
      auVar31._28_4_ = auVar238._28_4_;
      auVar164 = vsubps_avx(auVar30,auVar31);
      auVar153 = vmaxps_avx(_local_880,_local_7e0);
      auVar32._4_4_ = auVar153._4_4_ * auVar153._4_4_ * (fVar248 * fVar248 + fVar249 * fVar249);
      auVar32._0_4_ = auVar153._0_4_ * auVar153._0_4_ * (fVar230 * fVar230 + fVar245 * fVar245);
      auVar32._8_4_ = auVar153._8_4_ * auVar153._8_4_ * (fVar253 * fVar253 + fVar263 * fVar263);
      auVar32._12_4_ = auVar153._12_4_ * auVar153._12_4_ * (fVar267 * fVar267 + fVar269 * fVar269);
      auVar32._16_4_ = auVar153._16_4_ * auVar153._16_4_ * (fVar270 * fVar270 + fVar271 * fVar271);
      auVar32._20_4_ = auVar153._20_4_ * auVar153._20_4_ * (fVar273 * fVar273 + fVar283 * fVar283);
      auVar32._24_4_ = auVar153._24_4_ * auVar153._24_4_ * (fVar284 * fVar284 + fVar285 * fVar285);
      auVar32._28_4_ = auVar339._28_4_ + auVar238._28_4_;
      auVar33._4_4_ = auVar164._4_4_ * auVar164._4_4_;
      auVar33._0_4_ = auVar164._0_4_ * auVar164._0_4_;
      auVar33._8_4_ = auVar164._8_4_ * auVar164._8_4_;
      auVar33._12_4_ = auVar164._12_4_ * auVar164._12_4_;
      auVar33._16_4_ = auVar164._16_4_ * auVar164._16_4_;
      auVar33._20_4_ = auVar164._20_4_ * auVar164._20_4_;
      auVar33._24_4_ = auVar164._24_4_ * auVar164._24_4_;
      auVar33._28_4_ = auVar164._28_4_;
      auVar153 = vcmpps_avx(auVar33,auVar32,2);
      auVar215 = ZEXT416((uint)(float)(int)uVar20);
      _local_4a0 = auVar215;
      auVar215 = vshufps_avx(auVar215,auVar215,0);
      auVar239._16_16_ = auVar215;
      auVar239._0_16_ = auVar215;
      auVar164 = vcmpps_avx(_DAT_02020f40,auVar239,1);
      auVar244 = ZEXT3264(auVar164);
      auVar122._8_4_ = auVar188._8_4_;
      auVar122._0_8_ = auVar188._0_8_;
      auVar122._12_4_ = auVar188._12_4_;
      auVar215 = vpermilps_avx(auVar122,0xaa);
      register0x00001550 = auVar215;
      _local_140 = auVar215;
      auVar233 = vpermilps_avx(auVar355,0xaa);
      register0x00001590 = auVar233;
      _local_4e0 = auVar233;
      auVar218 = vpermilps_avx(auVar255,0xaa);
      register0x00001510 = auVar218;
      _local_c0 = auVar218;
      auVar9 = vpermilps_avx(auVar211,0xaa);
      register0x00001310 = auVar9;
      _local_620 = auVar9;
      auVar262 = ZEXT3264(_local_620);
      auVar26 = auVar164 & auVar153;
      uVar144 = *(uint *)(ray + k * 4 + 0x30);
      auVar234 = ZEXT416((uint)(auVar234._0_4_ * 4.7683716e-07));
      _local_740 = auVar234;
      if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar26 >> 0x7f,0) == '\0') &&
            (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar26 >> 0xbf,0) == '\0') &&
          (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar26[0x1f])
      {
        auVar385 = ZEXT3264(_local_6a0);
      }
      else {
        local_1e0 = vandps_avx(auVar153,auVar164);
        fVar368 = auVar215._0_4_;
        fVar374 = auVar215._4_4_;
        fVar376 = auVar215._8_4_;
        fVar378 = auVar215._12_4_;
        fVar380 = auVar233._0_4_;
        fVar387 = auVar233._4_4_;
        fVar388 = auVar233._8_4_;
        fVar389 = auVar233._12_4_;
        fVar354 = auVar218._0_4_;
        fVar362 = auVar218._4_4_;
        fVar364 = auVar218._8_4_;
        fVar366 = auVar218._12_4_;
        local_520._0_4_ = auVar136._0_4_;
        local_520._4_4_ = auVar136._4_4_;
        fStack_518 = auVar136._8_4_;
        fStack_514 = auVar136._12_4_;
        fStack_510 = auVar136._16_4_;
        fStack_50c = auVar136._20_4_;
        fStack_508 = auVar136._24_4_;
        fVar254 = auVar9._0_4_;
        fVar264 = auVar9._4_4_;
        fVar266 = auVar9._8_4_;
        fVar268 = auVar9._12_4_;
        local_520._0_4_ =
             fVar368 * fVar330 +
             fVar380 * fVar343 + fVar354 * fVar177 + fVar254 * (float)local_520._0_4_;
        local_520._4_4_ =
             fVar374 * fVar331 +
             fVar387 * fVar319 + fVar362 * fVar179 + fVar264 * (float)local_520._4_4_;
        fStack_518 = fVar376 * fVar332 +
                     fVar388 * fVar321 + fVar364 * fVar181 + fVar266 * fStack_518;
        fStack_514 = fVar378 * fVar352 +
                     fVar389 * fVar323 + fVar366 * fVar182 + fVar268 * fStack_514;
        fStack_510 = fVar368 * fVar301 +
                     fVar380 * fVar183 + fVar354 * fVar272 + fVar254 * fStack_510;
        fStack_50c = fVar374 * fVar311 +
                     fVar387 * fVar300 + fVar362 * fVar341 + fVar264 * fStack_50c;
        fStack_508 = fVar376 * fVar312 +
                     fVar388 * fVar329 + fVar364 * fVar342 + fVar266 * fStack_508;
        fStack_504 = local_1e0._28_4_ +
                     auVar164._28_4_ +
                     *(float *)(bezier_basis1 + lVar147 + 0x924) +
                     *(float *)(bezier_basis1 + lVar147 + 0x4a0);
        fVar148 = fVar368 * local_1c0 + fVar380 * fVar207 + fVar354 * fVar286 + fVar254 * fVar320;
        fVar168 = fVar374 * fStack_1bc + fVar387 * fVar178 + fVar362 * fVar287 + fVar264 * fVar322;
        fVar171 = fVar376 * fStack_1b8 + fVar388 * fVar180 + fVar364 * fVar288 + fVar266 * fVar252;
        fVar174 = fVar378 * fStack_1b4 + fVar389 * fVar150 + fVar366 * fVar317 + fVar268 * fVar149;
        fStack_790 = fVar368 * fStack_1b0 +
                     fVar380 * fVar170 + fVar354 * fVar318 + fVar254 * fVar169;
        fStack_78c = fVar374 * fStack_1ac +
                     fVar387 * fVar173 + fVar362 * fVar250 + fVar264 * fVar172;
        fStack_788 = fVar376 * fStack_1a8 +
                     fVar388 * fVar176 + fVar364 * fVar289 + fVar266 * fVar175;
        fStack_784 = fVar365 + fStack_504 + local_1e0._28_4_ + auVar164._28_4_;
        fVar230 = *(float *)(bezier_basis0 + lVar147 + 0x1210);
        fVar245 = *(float *)(bezier_basis0 + lVar147 + 0x1214);
        fVar248 = *(float *)(bezier_basis0 + lVar147 + 0x1218);
        fVar249 = *(float *)(bezier_basis0 + lVar147 + 0x121c);
        fVar253 = *(float *)(bezier_basis0 + lVar147 + 0x1220);
        fVar263 = *(float *)(bezier_basis0 + lVar147 + 0x1224);
        fVar267 = *(float *)(bezier_basis0 + lVar147 + 0x1228);
        fVar269 = *(float *)(bezier_basis0 + lVar147 + 0x1694);
        fVar270 = *(float *)(bezier_basis0 + lVar147 + 0x1698);
        fVar271 = *(float *)(bezier_basis0 + lVar147 + 0x169c);
        fVar273 = *(float *)(bezier_basis0 + lVar147 + 0x16a0);
        fVar283 = *(float *)(bezier_basis0 + lVar147 + 0x16a4);
        fVar284 = *(float *)(bezier_basis0 + lVar147 + 0x16a8);
        fVar285 = *(float *)(bezier_basis0 + lVar147 + 0x16ac);
        fVar286 = *(float *)(bezier_basis0 + lVar147 + 0x1b18);
        fVar287 = *(float *)(bezier_basis0 + lVar147 + 0x1b1c);
        fVar288 = *(float *)(bezier_basis0 + lVar147 + 0x1b20);
        fVar317 = *(float *)(bezier_basis0 + lVar147 + 0x1b24);
        fVar318 = *(float *)(bezier_basis0 + lVar147 + 0x1b28);
        fVar250 = *(float *)(bezier_basis0 + lVar147 + 0x1b2c);
        fVar289 = *(float *)(bezier_basis0 + lVar147 + 0x1b30);
        fVar320 = *(float *)(bezier_basis0 + lVar147 + 0x1f9c);
        fVar322 = *(float *)(bezier_basis0 + lVar147 + 0x1fa0);
        fVar252 = *(float *)(bezier_basis0 + lVar147 + 0x1fa4);
        fVar149 = *(float *)(bezier_basis0 + lVar147 + 0x1fa8);
        fVar169 = *(float *)(bezier_basis0 + lVar147 + 0x1fac);
        fVar172 = *(float *)(bezier_basis0 + lVar147 + 0x1fb0);
        fVar175 = *(float *)(bezier_basis0 + lVar147 + 0x1fb4);
        fVar290 = *(float *)(bezier_basis1 + lVar147 + 0x4a0) + 0.0;
        fVar207 = *(float *)(bezier_basis0 + lVar147 + 0x1b34) +
                  *(float *)(bezier_basis0 + lVar147 + 0x1fb8);
        fVar333 = *(float *)(bezier_basis0 + lVar147 + 0x16b0) + fVar207;
        auVar195._0_4_ =
             fVar353 * fVar230 + fVar208 * fVar286 + fVar344 * fVar320 + fVar390 * fVar269;
        auVar195._4_4_ =
             fVar361 * fVar245 + fVar224 * fVar287 + fVar349 * fVar322 + fVar395 * fVar270;
        auVar195._8_4_ =
             fVar363 * fVar248 + fVar226 * fVar288 + fVar350 * fVar252 + fVar396 * fVar271;
        auVar195._12_4_ =
             fVar365 * fVar249 + fVar228 * fVar317 + fVar351 * fVar149 + fVar397 * fVar273;
        auVar195._16_4_ =
             fVar353 * fVar253 + fVar208 * fVar318 + fVar344 * fVar169 + fVar390 * fVar283;
        auVar195._20_4_ =
             fVar361 * fVar263 + fVar224 * fVar250 + fVar349 * fVar172 + fVar395 * fVar284;
        auVar195._24_4_ =
             fVar363 * fVar267 + fVar226 * fVar289 + fVar350 * fVar175 + fVar396 * fVar285;
        auVar195._28_4_ = fVar207 + *(float *)(bezier_basis1 + lVar147 + 0x1c) + 0.0 + fVar290;
        local_660 = fVar380 * fVar269 + fVar354 * fVar286 + fVar254 * fVar320 + fVar368 * fVar230;
        fStack_65c = fVar387 * fVar270 + fVar362 * fVar287 + fVar264 * fVar322 + fVar374 * fVar245;
        fStack_658 = fVar388 * fVar271 + fVar364 * fVar288 + fVar266 * fVar252 + fVar376 * fVar248;
        fStack_654 = fVar389 * fVar273 + fVar366 * fVar317 + fVar268 * fVar149 + fVar378 * fVar249;
        fStack_650 = fVar380 * fVar283 + fVar354 * fVar318 + fVar254 * fVar169 + fVar368 * fVar253;
        fStack_64c = fVar387 * fVar284 + fVar362 * fVar250 + fVar264 * fVar172 + fVar374 * fVar263;
        fStack_648 = fVar388 * fVar285 + fVar364 * fVar289 + fVar266 * fVar175 + fVar376 * fVar267;
        fStack_644 = fVar333 + *(float *)(bezier_basis0 + lVar147 + 0x122c);
        fVar207 = *(float *)(bezier_basis1 + lVar147 + 0x1b18);
        fVar178 = *(float *)(bezier_basis1 + lVar147 + 0x1b1c);
        fVar180 = *(float *)(bezier_basis1 + lVar147 + 0x1b20);
        fVar150 = *(float *)(bezier_basis1 + lVar147 + 0x1b24);
        fVar170 = *(float *)(bezier_basis1 + lVar147 + 0x1b28);
        fVar173 = *(float *)(bezier_basis1 + lVar147 + 0x1b2c);
        fVar176 = *(float *)(bezier_basis1 + lVar147 + 0x1b30);
        fVar177 = *(float *)(bezier_basis1 + lVar147 + 0x1f9c);
        fVar179 = *(float *)(bezier_basis1 + lVar147 + 0x1fa0);
        fVar181 = *(float *)(bezier_basis1 + lVar147 + 0x1fa4);
        fVar182 = *(float *)(bezier_basis1 + lVar147 + 0x1fa8);
        fVar272 = *(float *)(bezier_basis1 + lVar147 + 0x1fac);
        fVar341 = *(float *)(bezier_basis1 + lVar147 + 0x1fb0);
        fVar342 = *(float *)(bezier_basis1 + lVar147 + 0x1fb4);
        fVar343 = *(float *)(bezier_basis1 + lVar147 + 0x1694);
        fVar319 = *(float *)(bezier_basis1 + lVar147 + 0x1698);
        fVar321 = *(float *)(bezier_basis1 + lVar147 + 0x169c);
        fVar323 = *(float *)(bezier_basis1 + lVar147 + 0x16a0);
        fVar183 = *(float *)(bezier_basis1 + lVar147 + 0x16a4);
        fVar300 = *(float *)(bezier_basis1 + lVar147 + 0x16a8);
        fVar329 = *(float *)(bezier_basis1 + lVar147 + 0x16ac);
        fVar330 = *(float *)(bezier_basis1 + lVar147 + 0x1210);
        fVar331 = *(float *)(bezier_basis1 + lVar147 + 0x1214);
        fVar332 = *(float *)(bezier_basis1 + lVar147 + 0x1218);
        fVar352 = *(float *)(bezier_basis1 + lVar147 + 0x121c);
        fVar301 = *(float *)(bezier_basis1 + lVar147 + 0x1220);
        fVar311 = *(float *)(bezier_basis1 + lVar147 + 0x1224);
        fVar312 = *(float *)(bezier_basis1 + lVar147 + 0x1228);
        auVar295._0_4_ =
             fVar209 * fVar330 + fVar246 * fVar343 + fVar184 * fVar207 + fVar367 * fVar177;
        auVar295._4_4_ =
             fVar225 * fVar331 + fVar247 * fVar319 + fVar204 * fVar178 + fVar373 * fVar179;
        auVar295._8_4_ =
             fVar227 * fVar332 + fVar251 * fVar321 + fVar205 * fVar180 + fVar375 * fVar181;
        auVar295._12_4_ =
             fVar229 * fVar352 + fVar265 * fVar323 + fVar206 * fVar150 + fVar377 * fVar182;
        auVar295._16_4_ =
             fVar209 * fVar301 + fVar246 * fVar183 + fVar184 * fVar170 + fVar367 * fVar272;
        auVar295._20_4_ =
             fVar225 * fVar311 + fVar247 * fVar300 + fVar204 * fVar173 + fVar373 * fVar341;
        auVar295._24_4_ =
             fVar227 * fVar312 + fVar251 * fVar329 + fVar205 * fVar176 + fVar375 * fVar342;
        auVar295._28_4_ = fVar377 + fVar377 + fVar333 + fVar377;
        auVar325._0_4_ =
             fVar353 * fVar330 + fVar390 * fVar343 + fVar208 * fVar207 + fVar344 * fVar177;
        auVar325._4_4_ =
             fVar361 * fVar331 + fVar395 * fVar319 + fVar224 * fVar178 + fVar349 * fVar179;
        auVar325._8_4_ =
             fVar363 * fVar332 + fVar396 * fVar321 + fVar226 * fVar180 + fVar350 * fVar181;
        auVar325._12_4_ =
             fVar365 * fVar352 + fVar397 * fVar323 + fVar228 * fVar150 + fVar351 * fVar182;
        auVar325._16_4_ =
             fVar353 * fVar301 + fVar390 * fVar183 + fVar208 * fVar170 + fVar344 * fVar272;
        auVar325._20_4_ =
             fVar361 * fVar311 + fVar395 * fVar300 + fVar224 * fVar173 + fVar349 * fVar341;
        auVar325._24_4_ =
             fVar363 * fVar312 + fVar396 * fVar329 + fVar226 * fVar176 + fVar350 * fVar342;
        auVar325._28_4_ = fVar377 + fVar377 + fVar377 + fVar333;
        auVar223._0_4_ =
             fVar368 * fVar330 + fVar380 * fVar343 + fVar354 * fVar207 + fVar254 * fVar177;
        auVar223._4_4_ =
             fVar374 * fVar331 + fVar387 * fVar319 + fVar362 * fVar178 + fVar264 * fVar179;
        auVar223._8_4_ =
             fVar376 * fVar332 + fVar388 * fVar321 + fVar364 * fVar180 + fVar266 * fVar181;
        auVar223._12_4_ =
             fVar378 * fVar352 + fVar389 * fVar323 + fVar366 * fVar150 + fVar268 * fVar182;
        auVar223._16_4_ =
             fVar368 * fVar301 + fVar380 * fVar183 + fVar354 * fVar170 + fVar254 * fVar272;
        auVar223._20_4_ =
             fVar374 * fVar311 + fVar387 * fVar300 + fVar362 * fVar173 + fVar264 * fVar341;
        auVar223._24_4_ =
             fVar376 * fVar312 + fVar388 * fVar329 + fVar364 * fVar176 + fVar266 * fVar342;
        auVar223._28_4_ =
             *(float *)(bezier_basis1 + lVar147 + 0x122c) +
             *(float *)(bezier_basis1 + lVar147 + 0x16b0) +
             *(float *)(bezier_basis1 + lVar147 + 0x1b34) +
             *(float *)(bezier_basis1 + lVar147 + 0x1fb8);
        auVar258._8_4_ = 0x7fffffff;
        auVar258._0_8_ = 0x7fffffff7fffffff;
        auVar258._12_4_ = 0x7fffffff;
        auVar258._16_4_ = 0x7fffffff;
        auVar258._20_4_ = 0x7fffffff;
        auVar258._24_4_ = 0x7fffffff;
        auVar258._28_4_ = 0x7fffffff;
        auVar128._4_4_ =
             fVar225 * fVar245 + fVar247 * fVar270 + fVar204 * fVar287 + fVar373 * fVar322;
        auVar128._0_4_ =
             fVar209 * fVar230 + fVar246 * fVar269 + fVar184 * fVar286 + fVar367 * fVar320;
        auVar128._8_4_ =
             fVar227 * fVar248 + fVar251 * fVar271 + fVar205 * fVar288 + fVar375 * fVar252;
        auVar128._12_4_ =
             fVar229 * fVar249 + fVar265 * fVar273 + fVar206 * fVar317 + fVar377 * fVar149;
        auVar128._16_4_ =
             fVar209 * fVar253 + fVar246 * fVar283 + fVar184 * fVar318 + fVar367 * fVar169;
        auVar128._20_4_ =
             fVar225 * fVar263 + fVar247 * fVar284 + fVar204 * fVar250 + fVar373 * fVar172;
        auVar128._24_4_ =
             fVar227 * fVar267 + fVar251 * fVar285 + fVar205 * fVar289 + fVar375 * fVar175;
        auVar128._28_4_ =
             *(float *)(bezier_basis0 + lVar147 + 0x16b0) +
             *(float *)(bezier_basis0 + lVar147 + 0x1fb8) + fVar290;
        auVar153 = vandps_avx(auVar128,auVar258);
        auVar164 = vandps_avx(auVar195,auVar258);
        auVar164 = vmaxps_avx(auVar153,auVar164);
        auVar133._4_4_ = fStack_65c;
        auVar133._0_4_ = local_660;
        auVar133._8_4_ = fStack_658;
        auVar133._12_4_ = fStack_654;
        auVar133._16_4_ = fStack_650;
        auVar133._20_4_ = fStack_64c;
        auVar133._24_4_ = fStack_648;
        auVar133._28_4_ = fStack_644;
        auVar153 = vandps_avx(auVar258,auVar133);
        auVar153 = vmaxps_avx(auVar164,auVar153);
        auVar234 = vpermilps_avx(auVar234,0);
        auVar278._16_16_ = auVar234;
        auVar278._0_16_ = auVar234;
        auVar153 = vcmpps_avx(auVar153,auVar278,1);
        auVar26 = vblendvps_avx(auVar128,auVar339,auVar153);
        auVar281 = vblendvps_avx(auVar195,local_1a0,auVar153);
        auVar153 = vandps_avx(auVar295,auVar258);
        auVar164 = vandps_avx(auVar325,auVar258);
        auVar160 = vmaxps_avx(auVar153,auVar164);
        auVar153 = vandps_avx(auVar223,auVar258);
        auVar153 = vmaxps_avx(auVar160,auVar153);
        auVar160 = vcmpps_avx(auVar153,auVar278,1);
        auVar153 = vblendvps_avx(auVar295,auVar339,auVar160);
        auVar339 = vblendvps_avx(auVar325,local_1a0,auVar160);
        fVar149 = auVar26._0_4_;
        fVar169 = auVar26._4_4_;
        fVar172 = auVar26._8_4_;
        fVar175 = auVar26._12_4_;
        fVar207 = auVar26._16_4_;
        fVar178 = auVar26._20_4_;
        fVar180 = auVar26._24_4_;
        fVar182 = -auVar26._28_4_;
        fVar150 = auVar153._0_4_;
        fVar170 = auVar153._4_4_;
        fVar173 = auVar153._8_4_;
        fVar176 = auVar153._12_4_;
        fVar177 = auVar153._16_4_;
        fVar179 = auVar153._20_4_;
        fVar181 = auVar153._24_4_;
        fVar230 = auVar281._0_4_;
        fVar248 = auVar281._4_4_;
        fVar263 = auVar281._8_4_;
        fVar270 = auVar281._12_4_;
        fVar284 = auVar281._16_4_;
        fVar288 = auVar281._20_4_;
        fVar289 = auVar281._24_4_;
        auVar156._0_4_ = fVar230 * fVar230 + fVar149 * fVar149;
        auVar156._4_4_ = fVar248 * fVar248 + fVar169 * fVar169;
        auVar156._8_4_ = fVar263 * fVar263 + fVar172 * fVar172;
        auVar156._12_4_ = fVar270 * fVar270 + fVar175 * fVar175;
        auVar156._16_4_ = fVar284 * fVar284 + fVar207 * fVar207;
        auVar156._20_4_ = fVar288 * fVar288 + fVar178 * fVar178;
        auVar156._24_4_ = fVar289 * fVar289 + fVar180 * fVar180;
        auVar156._28_4_ = auVar325._28_4_ + auVar26._28_4_;
        auVar26 = vrsqrtps_avx(auVar156);
        fVar245 = auVar26._0_4_;
        fVar246 = auVar26._4_4_;
        auVar34._4_4_ = fVar246 * 1.5;
        auVar34._0_4_ = fVar245 * 1.5;
        fVar247 = auVar26._8_4_;
        auVar34._8_4_ = fVar247 * 1.5;
        fVar249 = auVar26._12_4_;
        auVar34._12_4_ = fVar249 * 1.5;
        fVar251 = auVar26._16_4_;
        auVar34._16_4_ = fVar251 * 1.5;
        fVar253 = auVar26._20_4_;
        auVar34._20_4_ = fVar253 * 1.5;
        fVar265 = auVar26._24_4_;
        fStack_7a4 = auVar164._28_4_;
        auVar34._24_4_ = fVar265 * 1.5;
        auVar34._28_4_ = fStack_7a4;
        auVar35._4_4_ = fVar246 * fVar246 * fVar246 * auVar156._4_4_ * 0.5;
        auVar35._0_4_ = fVar245 * fVar245 * fVar245 * auVar156._0_4_ * 0.5;
        auVar35._8_4_ = fVar247 * fVar247 * fVar247 * auVar156._8_4_ * 0.5;
        auVar35._12_4_ = fVar249 * fVar249 * fVar249 * auVar156._12_4_ * 0.5;
        auVar35._16_4_ = fVar251 * fVar251 * fVar251 * auVar156._16_4_ * 0.5;
        auVar35._20_4_ = fVar253 * fVar253 * fVar253 * auVar156._20_4_ * 0.5;
        auVar35._24_4_ = fVar265 * fVar265 * fVar265 * auVar156._24_4_ * 0.5;
        auVar35._28_4_ = auVar156._28_4_;
        auVar164 = vsubps_avx(auVar34,auVar35);
        fVar245 = auVar164._0_4_;
        fVar249 = auVar164._4_4_;
        fVar265 = auVar164._8_4_;
        fVar271 = auVar164._12_4_;
        fVar285 = auVar164._16_4_;
        fVar317 = auVar164._20_4_;
        fVar320 = auVar164._24_4_;
        fVar246 = auVar339._0_4_;
        fVar251 = auVar339._4_4_;
        fVar267 = auVar339._8_4_;
        fVar273 = auVar339._12_4_;
        fVar286 = auVar339._16_4_;
        fVar318 = auVar339._20_4_;
        fVar322 = auVar339._24_4_;
        auVar157._0_4_ = fVar246 * fVar246 + fVar150 * fVar150;
        auVar157._4_4_ = fVar251 * fVar251 + fVar170 * fVar170;
        auVar157._8_4_ = fVar267 * fVar267 + fVar173 * fVar173;
        auVar157._12_4_ = fVar273 * fVar273 + fVar176 * fVar176;
        auVar157._16_4_ = fVar286 * fVar286 + fVar177 * fVar177;
        auVar157._20_4_ = fVar318 * fVar318 + fVar179 * fVar179;
        auVar157._24_4_ = fVar322 * fVar322 + fVar181 * fVar181;
        auVar157._28_4_ = auVar153._28_4_ + auVar164._28_4_;
        auVar153 = vrsqrtps_avx(auVar157);
        fVar247 = auVar153._0_4_;
        fVar253 = auVar153._4_4_;
        auVar36._4_4_ = fVar253 * 1.5;
        auVar36._0_4_ = fVar247 * 1.5;
        fVar269 = auVar153._8_4_;
        auVar36._8_4_ = fVar269 * 1.5;
        fVar283 = auVar153._12_4_;
        auVar36._12_4_ = fVar283 * 1.5;
        fVar287 = auVar153._16_4_;
        auVar36._16_4_ = fVar287 * 1.5;
        fVar250 = auVar153._20_4_;
        auVar36._20_4_ = fVar250 * 1.5;
        fVar252 = auVar153._24_4_;
        auVar36._24_4_ = fVar252 * 1.5;
        auVar36._28_4_ = fStack_7a4;
        auVar37._4_4_ = fVar253 * fVar253 * fVar253 * auVar157._4_4_ * 0.5;
        auVar37._0_4_ = fVar247 * fVar247 * fVar247 * auVar157._0_4_ * 0.5;
        auVar37._8_4_ = fVar269 * fVar269 * fVar269 * auVar157._8_4_ * 0.5;
        auVar37._12_4_ = fVar283 * fVar283 * fVar283 * auVar157._12_4_ * 0.5;
        auVar37._16_4_ = fVar287 * fVar287 * fVar287 * auVar157._16_4_ * 0.5;
        auVar37._20_4_ = fVar250 * fVar250 * fVar250 * auVar157._20_4_ * 0.5;
        auVar37._24_4_ = fVar252 * fVar252 * fVar252 * auVar157._24_4_ * 0.5;
        auVar37._28_4_ = auVar157._28_4_;
        auVar153 = vsubps_avx(auVar36,auVar37);
        fVar247 = auVar153._0_4_;
        fVar253 = auVar153._4_4_;
        fVar269 = auVar153._8_4_;
        fVar283 = auVar153._12_4_;
        fVar287 = auVar153._16_4_;
        fVar250 = auVar153._20_4_;
        fVar252 = auVar153._24_4_;
        fVar272 = (float)local_880._0_4_ * fVar230 * fVar245;
        fVar341 = (float)local_880._4_4_ * fVar248 * fVar249;
        auVar38._4_4_ = fVar341;
        auVar38._0_4_ = fVar272;
        fVar342 = fStack_878 * fVar263 * fVar265;
        auVar38._8_4_ = fVar342;
        fVar343 = fStack_874 * fVar270 * fVar271;
        auVar38._12_4_ = fVar343;
        fStack_7b0 = fStack_870 * fVar284 * fVar285;
        auVar38._16_4_ = fStack_7b0;
        fStack_7ac = fStack_86c * fVar288 * fVar317;
        auVar38._20_4_ = fStack_7ac;
        fStack_7a8 = fStack_868 * fVar289 * fVar320;
        auVar38._24_4_ = fStack_7a8;
        auVar38._28_4_ = fStack_7a4;
        fStack_7b0 = fStack_7b0 + auVar335._16_4_;
        fStack_7ac = fStack_7ac + auVar335._20_4_;
        fStack_7a8 = fStack_7a8 + auVar335._24_4_;
        fStack_7a4 = fStack_7a4 + auVar335._28_4_;
        fVar230 = (float)local_880._0_4_ * fVar245 * -fVar149;
        fVar248 = (float)local_880._4_4_ * fVar249 * -fVar169;
        auVar39._4_4_ = fVar248;
        auVar39._0_4_ = fVar230;
        fVar263 = fStack_878 * fVar265 * -fVar172;
        auVar39._8_4_ = fVar263;
        fVar270 = fStack_874 * fVar271 * -fVar175;
        auVar39._12_4_ = fVar270;
        fVar284 = fStack_870 * fVar285 * -fVar207;
        auVar39._16_4_ = fVar284;
        fVar288 = fStack_86c * fVar317 * -fVar178;
        auVar39._20_4_ = fVar288;
        fVar289 = fStack_868 * fVar320 * -fVar180;
        auVar39._24_4_ = fVar289;
        auVar39._28_4_ = fVar182;
        local_500._4_4_ = auVar315._4_4_ + fVar248;
        local_500._0_4_ = auVar315._0_4_ + fVar230;
        fStack_4f8 = auVar315._8_4_ + fVar263;
        fStack_4f4 = auVar315._12_4_ + fVar270;
        auStack_4f0._0_4_ = auVar315._16_4_ + fVar284;
        auStack_4f0._4_4_ = auVar315._20_4_ + fVar288;
        fStack_4e8 = auVar315._24_4_ + fVar289;
        fStack_4e4 = auVar315._28_4_ + fVar182;
        fVar230 = fVar245 * 0.0 * (float)local_880._0_4_;
        fVar245 = fVar249 * 0.0 * (float)local_880._4_4_;
        auVar40._4_4_ = fVar245;
        auVar40._0_4_ = fVar230;
        fVar248 = fVar265 * 0.0 * fStack_878;
        auVar40._8_4_ = fVar248;
        fVar249 = fVar271 * 0.0 * fStack_874;
        auVar40._12_4_ = fVar249;
        fVar263 = fVar285 * 0.0 * fStack_870;
        auVar40._16_4_ = fVar263;
        fVar265 = fVar317 * 0.0 * fStack_86c;
        auVar40._20_4_ = fVar265;
        fVar270 = fVar320 * 0.0 * fStack_868;
        auVar40._24_4_ = fVar270;
        auVar40._28_4_ = fVar378;
        auVar131._4_4_ = fVar168;
        auVar131._0_4_ = fVar148;
        auVar131._8_4_ = fVar171;
        auVar131._12_4_ = fVar174;
        auVar131._16_4_ = fStack_790;
        auVar131._20_4_ = fStack_78c;
        auVar131._24_4_ = fStack_788;
        auVar131._28_4_ = fStack_784;
        auVar296._0_4_ = fVar230 + fVar148;
        auVar296._4_4_ = fVar245 + fVar168;
        auVar296._8_4_ = fVar248 + fVar171;
        auVar296._12_4_ = fVar249 + fVar174;
        auVar296._16_4_ = fVar263 + fStack_790;
        auVar296._20_4_ = fVar265 + fStack_78c;
        auVar296._24_4_ = fVar270 + fStack_788;
        auVar296._28_4_ = fVar378 + fStack_784;
        fVar230 = (float)local_7e0._0_4_ * fVar246 * fVar247;
        fVar245 = (float)local_7e0._4_4_ * fVar251 * fVar253;
        auVar41._4_4_ = fVar245;
        auVar41._0_4_ = fVar230;
        fVar246 = fStack_7d8 * fVar267 * fVar269;
        auVar41._8_4_ = fVar246;
        fVar248 = fStack_7d4 * fVar273 * fVar283;
        auVar41._12_4_ = fVar248;
        fVar249 = register0x000015d0 * fVar286 * fVar287;
        auVar41._16_4_ = fVar249;
        fVar251 = register0x000015d4 * fVar318 * fVar250;
        auVar41._20_4_ = fVar251;
        fVar263 = register0x000015d8 * fVar322 * fVar252;
        auVar41._24_4_ = fVar263;
        auVar41._28_4_ = auVar339._28_4_;
        auVar27 = vsubps_avx(auVar335,auVar38);
        auVar336._0_4_ = auVar257._0_4_ + fVar230;
        auVar336._4_4_ = auVar257._4_4_ + fVar245;
        auVar336._8_4_ = auVar257._8_4_ + fVar246;
        auVar336._12_4_ = auVar257._12_4_ + fVar248;
        auVar336._16_4_ = auVar257._16_4_ + fVar249;
        auVar336._20_4_ = auVar257._20_4_ + fVar251;
        auVar336._24_4_ = auVar257._24_4_ + fVar263;
        auVar336._28_4_ = auVar257._28_4_ + auVar339._28_4_;
        fVar230 = (float)local_7e0._0_4_ * fVar247 * -fVar150;
        fVar245 = (float)local_7e0._4_4_ * fVar253 * -fVar170;
        auVar42._4_4_ = fVar245;
        auVar42._0_4_ = fVar230;
        fVar246 = fStack_7d8 * fVar269 * -fVar173;
        auVar42._8_4_ = fVar246;
        fVar248 = fStack_7d4 * fVar283 * -fVar176;
        auVar42._12_4_ = fVar248;
        fVar249 = register0x000015d0 * fVar287 * -fVar177;
        auVar42._16_4_ = fVar249;
        fVar251 = register0x000015d4 * fVar250 * -fVar179;
        auVar42._20_4_ = fVar251;
        fVar263 = register0x000015d8 * fVar252 * -fVar181;
        auVar42._24_4_ = fVar263;
        auVar42._28_4_ = fVar389;
        auVar28 = vsubps_avx(auVar315,auVar39);
        auVar347._0_4_ = fVar230 + auVar238._0_4_;
        auVar347._4_4_ = fVar245 + auVar238._4_4_;
        auVar347._8_4_ = fVar246 + auVar238._8_4_;
        auVar347._12_4_ = fVar248 + auVar238._12_4_;
        auVar347._16_4_ = fVar249 + auVar238._16_4_;
        auVar347._20_4_ = fVar251 + auVar238._20_4_;
        auVar347._24_4_ = fVar263 + auVar238._24_4_;
        auVar347._28_4_ = fVar389 + auVar238._28_4_;
        fVar230 = (float)local_7e0._0_4_ * fVar247 * 0.0;
        fVar245 = (float)local_7e0._4_4_ * fVar253 * 0.0;
        auVar43._4_4_ = fVar245;
        auVar43._0_4_ = fVar230;
        fVar246 = fStack_7d8 * fVar269 * 0.0;
        auVar43._8_4_ = fVar246;
        fVar247 = fStack_7d4 * fVar283 * 0.0;
        auVar43._12_4_ = fVar247;
        fVar248 = register0x000015d0 * fVar287 * 0.0;
        auVar43._16_4_ = fVar248;
        fVar249 = register0x000015d4 * fVar250 * 0.0;
        auVar43._20_4_ = fVar249;
        fVar251 = register0x000015d8 * fVar252 * 0.0;
        auVar43._24_4_ = fVar251;
        auVar43._28_4_ = fVar182;
        auVar29 = vsubps_avx(auVar131,auVar40);
        auVar391._0_4_ = (float)local_520._0_4_ + fVar230;
        auVar391._4_4_ = (float)local_520._4_4_ + fVar245;
        auVar391._8_4_ = fStack_518 + fVar246;
        auVar391._12_4_ = fStack_514 + fVar247;
        auVar391._16_4_ = fStack_510 + fVar248;
        auVar391._20_4_ = fStack_50c + fVar249;
        auVar391._24_4_ = fStack_508 + fVar251;
        auVar391._28_4_ = fStack_504 + fVar182;
        auVar153 = vsubps_avx(auVar257,auVar41);
        auVar164 = vsubps_avx(auVar238,auVar42);
        auVar339 = vsubps_avx(_local_520,auVar43);
        auVar26 = vsubps_avx(auVar347,auVar28);
        auVar281 = vsubps_avx(auVar391,auVar29);
        auVar44._4_4_ = auVar29._4_4_ * auVar26._4_4_;
        auVar44._0_4_ = auVar29._0_4_ * auVar26._0_4_;
        auVar44._8_4_ = auVar29._8_4_ * auVar26._8_4_;
        auVar44._12_4_ = auVar29._12_4_ * auVar26._12_4_;
        auVar44._16_4_ = auVar29._16_4_ * auVar26._16_4_;
        auVar44._20_4_ = auVar29._20_4_ * auVar26._20_4_;
        auVar44._24_4_ = auVar29._24_4_ * auVar26._24_4_;
        auVar44._28_4_ = fVar389;
        auVar45._4_4_ = auVar28._4_4_ * auVar281._4_4_;
        auVar45._0_4_ = auVar28._0_4_ * auVar281._0_4_;
        auVar45._8_4_ = auVar28._8_4_ * auVar281._8_4_;
        auVar45._12_4_ = auVar28._12_4_ * auVar281._12_4_;
        auVar45._16_4_ = auVar28._16_4_ * auVar281._16_4_;
        auVar45._20_4_ = auVar28._20_4_ * auVar281._20_4_;
        auVar45._24_4_ = auVar28._24_4_ * auVar281._24_4_;
        auVar45._28_4_ = auVar238._28_4_;
        auVar160 = vsubps_avx(auVar45,auVar44);
        auVar46._4_4_ = auVar27._4_4_ * auVar281._4_4_;
        auVar46._0_4_ = auVar27._0_4_ * auVar281._0_4_;
        auVar46._8_4_ = auVar27._8_4_ * auVar281._8_4_;
        auVar46._12_4_ = auVar27._12_4_ * auVar281._12_4_;
        auVar46._16_4_ = auVar27._16_4_ * auVar281._16_4_;
        auVar46._20_4_ = auVar27._20_4_ * auVar281._20_4_;
        auVar46._24_4_ = auVar27._24_4_ * auVar281._24_4_;
        auVar46._28_4_ = auVar281._28_4_;
        auVar393 = vsubps_avx(auVar336,auVar27);
        auVar47._4_4_ = auVar29._4_4_ * auVar393._4_4_;
        auVar47._0_4_ = auVar29._0_4_ * auVar393._0_4_;
        auVar47._8_4_ = auVar29._8_4_ * auVar393._8_4_;
        auVar47._12_4_ = auVar29._12_4_ * auVar393._12_4_;
        auVar47._16_4_ = auVar29._16_4_ * auVar393._16_4_;
        auVar47._20_4_ = auVar29._20_4_ * auVar393._20_4_;
        auVar47._24_4_ = auVar29._24_4_ * auVar393._24_4_;
        auVar47._28_4_ = auVar257._28_4_;
        auVar25 = vsubps_avx(auVar47,auVar46);
        auVar48._4_4_ = auVar393._4_4_ * auVar28._4_4_;
        auVar48._0_4_ = auVar393._0_4_ * auVar28._0_4_;
        auVar48._8_4_ = auVar393._8_4_ * auVar28._8_4_;
        auVar48._12_4_ = auVar393._12_4_ * auVar28._12_4_;
        auVar48._16_4_ = auVar393._16_4_ * auVar28._16_4_;
        auVar48._20_4_ = auVar393._20_4_ * auVar28._20_4_;
        auVar48._24_4_ = auVar393._24_4_ * auVar28._24_4_;
        auVar48._28_4_ = auVar281._28_4_;
        auVar49._4_4_ = auVar27._4_4_ * auVar26._4_4_;
        auVar49._0_4_ = auVar27._0_4_ * auVar26._0_4_;
        auVar49._8_4_ = auVar27._8_4_ * auVar26._8_4_;
        auVar49._12_4_ = auVar27._12_4_ * auVar26._12_4_;
        auVar49._16_4_ = auVar27._16_4_ * auVar26._16_4_;
        auVar49._20_4_ = auVar27._20_4_ * auVar26._20_4_;
        auVar49._24_4_ = auVar27._24_4_ * auVar26._24_4_;
        auVar49._28_4_ = auVar26._28_4_;
        auVar26 = vsubps_avx(auVar49,auVar48);
        auVar158._0_4_ = auVar160._0_4_ * 0.0 + auVar26._0_4_ + auVar25._0_4_ * 0.0;
        auVar158._4_4_ = auVar160._4_4_ * 0.0 + auVar26._4_4_ + auVar25._4_4_ * 0.0;
        auVar158._8_4_ = auVar160._8_4_ * 0.0 + auVar26._8_4_ + auVar25._8_4_ * 0.0;
        auVar158._12_4_ = auVar160._12_4_ * 0.0 + auVar26._12_4_ + auVar25._12_4_ * 0.0;
        auVar158._16_4_ = auVar160._16_4_ * 0.0 + auVar26._16_4_ + auVar25._16_4_ * 0.0;
        auVar158._20_4_ = auVar160._20_4_ * 0.0 + auVar26._20_4_ + auVar25._20_4_ * 0.0;
        auVar158._24_4_ = auVar160._24_4_ * 0.0 + auVar26._24_4_ + auVar25._24_4_ * 0.0;
        auVar158._28_4_ = auVar26._28_4_ + auVar26._28_4_ + auVar25._28_4_;
        auVar393 = vcmpps_avx(auVar158,ZEXT432(0) << 0x20,2);
        auVar129._4_4_ = fVar341 + auVar335._4_4_;
        auVar129._0_4_ = fVar272 + auVar335._0_4_;
        auVar129._8_4_ = fVar342 + auVar335._8_4_;
        auVar129._12_4_ = fVar343 + auVar335._12_4_;
        auVar129._16_4_ = fStack_7b0;
        auVar129._20_4_ = fStack_7ac;
        auVar129._24_4_ = fStack_7a8;
        auVar129._28_4_ = fStack_7a4;
        auVar153 = vblendvps_avx(auVar153,auVar129,auVar393);
        auVar164 = vblendvps_avx(auVar164,_local_500,auVar393);
        auVar339 = vblendvps_avx(auVar339,auVar296,auVar393);
        auVar26 = vblendvps_avx(auVar27,auVar336,auVar393);
        auVar281 = vblendvps_avx(auVar28,auVar347,auVar393);
        auVar160 = vblendvps_avx(auVar29,auVar391,auVar393);
        auVar27 = vblendvps_avx(auVar336,auVar27,auVar393);
        auVar28 = vblendvps_avx(auVar347,auVar28,auVar393);
        auVar234 = vpackssdw_avx(local_1e0._0_16_,local_1e0._16_16_);
        _auStack_750 = auVar335._16_16_;
        auVar29 = vblendvps_avx(auVar391,auVar29,auVar393);
        auVar27 = vsubps_avx(auVar27,auVar153);
        auVar25 = vsubps_avx(auVar28,auVar164);
        auVar29 = vsubps_avx(auVar29,auVar339);
        auVar154 = vsubps_avx(auVar164,auVar281);
        fVar230 = auVar25._0_4_;
        fVar150 = auVar339._0_4_;
        fVar249 = auVar25._4_4_;
        fVar170 = auVar339._4_4_;
        auVar50._4_4_ = fVar170 * fVar249;
        auVar50._0_4_ = fVar150 * fVar230;
        fVar267 = auVar25._8_4_;
        fVar173 = auVar339._8_4_;
        auVar50._8_4_ = fVar173 * fVar267;
        fVar283 = auVar25._12_4_;
        fVar176 = auVar339._12_4_;
        auVar50._12_4_ = fVar176 * fVar283;
        fVar288 = auVar25._16_4_;
        fVar177 = auVar339._16_4_;
        auVar50._16_4_ = fVar177 * fVar288;
        fVar320 = auVar25._20_4_;
        fVar179 = auVar339._20_4_;
        auVar50._20_4_ = fVar179 * fVar320;
        fVar172 = auVar25._24_4_;
        fVar181 = auVar339._24_4_;
        auVar50._24_4_ = fVar181 * fVar172;
        auVar50._28_4_ = auVar28._28_4_;
        fVar245 = auVar164._0_4_;
        fVar323 = auVar29._0_4_;
        fVar251 = auVar164._4_4_;
        fVar183 = auVar29._4_4_;
        auVar51._4_4_ = fVar183 * fVar251;
        auVar51._0_4_ = fVar323 * fVar245;
        fVar269 = auVar164._8_4_;
        fVar300 = auVar29._8_4_;
        auVar51._8_4_ = fVar300 * fVar269;
        fVar284 = auVar164._12_4_;
        fVar329 = auVar29._12_4_;
        auVar51._12_4_ = fVar329 * fVar284;
        fVar317 = auVar164._16_4_;
        fVar330 = auVar29._16_4_;
        auVar51._16_4_ = fVar330 * fVar317;
        fVar322 = auVar164._20_4_;
        fVar331 = auVar29._20_4_;
        auVar51._20_4_ = fVar331 * fVar322;
        fVar175 = auVar164._24_4_;
        fVar332 = auVar29._24_4_;
        auVar51._24_4_ = fVar332 * fVar175;
        auVar51._28_4_ = auVar347._28_4_;
        auVar28 = vsubps_avx(auVar51,auVar50);
        fVar246 = auVar153._0_4_;
        fVar253 = auVar153._4_4_;
        auVar52._4_4_ = fVar183 * fVar253;
        auVar52._0_4_ = fVar323 * fVar246;
        fVar270 = auVar153._8_4_;
        auVar52._8_4_ = fVar300 * fVar270;
        fVar285 = auVar153._12_4_;
        auVar52._12_4_ = fVar329 * fVar285;
        fVar318 = auVar153._16_4_;
        auVar52._16_4_ = fVar330 * fVar318;
        fVar252 = auVar153._20_4_;
        auVar52._20_4_ = fVar331 * fVar252;
        fVar207 = auVar153._24_4_;
        auVar52._24_4_ = fVar332 * fVar207;
        auVar52._28_4_ = auVar347._28_4_;
        fVar247 = auVar27._0_4_;
        auVar383._0_4_ = fVar150 * fVar247;
        fVar263 = auVar27._4_4_;
        auVar383._4_4_ = fVar170 * fVar263;
        fVar271 = auVar27._8_4_;
        auVar383._8_4_ = fVar173 * fVar271;
        fVar286 = auVar27._12_4_;
        auVar383._12_4_ = fVar176 * fVar286;
        fVar250 = auVar27._16_4_;
        auVar383._16_4_ = fVar177 * fVar250;
        fVar149 = auVar27._20_4_;
        auVar383._20_4_ = fVar179 * fVar149;
        fVar178 = auVar27._24_4_;
        auVar383._24_4_ = fVar181 * fVar178;
        auVar383._28_4_ = 0;
        auVar155 = vsubps_avx(auVar383,auVar52);
        auVar53._4_4_ = fVar251 * fVar263;
        auVar53._0_4_ = fVar245 * fVar247;
        auVar53._8_4_ = fVar269 * fVar271;
        auVar53._12_4_ = fVar284 * fVar286;
        auVar53._16_4_ = fVar317 * fVar250;
        auVar53._20_4_ = fVar322 * fVar149;
        auVar53._24_4_ = fVar175 * fVar178;
        auVar53._28_4_ = auVar347._28_4_;
        auVar54._4_4_ = fVar253 * fVar249;
        auVar54._0_4_ = fVar246 * fVar230;
        auVar54._8_4_ = fVar270 * fVar267;
        auVar54._12_4_ = fVar285 * fVar283;
        auVar54._16_4_ = fVar318 * fVar288;
        auVar54._20_4_ = fVar252 * fVar320;
        auVar54._24_4_ = fVar207 * fVar172;
        auVar54._28_4_ = auVar391._28_4_;
        auVar191 = vsubps_avx(auVar54,auVar53);
        auVar192 = vsubps_avx(auVar339,auVar160);
        fVar248 = auVar191._28_4_ + auVar155._28_4_;
        auVar196._0_4_ = auVar191._0_4_ + auVar155._0_4_ * 0.0 + auVar28._0_4_ * 0.0;
        auVar196._4_4_ = auVar191._4_4_ + auVar155._4_4_ * 0.0 + auVar28._4_4_ * 0.0;
        auVar196._8_4_ = auVar191._8_4_ + auVar155._8_4_ * 0.0 + auVar28._8_4_ * 0.0;
        auVar196._12_4_ = auVar191._12_4_ + auVar155._12_4_ * 0.0 + auVar28._12_4_ * 0.0;
        auVar196._16_4_ = auVar191._16_4_ + auVar155._16_4_ * 0.0 + auVar28._16_4_ * 0.0;
        auVar196._20_4_ = auVar191._20_4_ + auVar155._20_4_ * 0.0 + auVar28._20_4_ * 0.0;
        auVar196._24_4_ = auVar191._24_4_ + auVar155._24_4_ * 0.0 + auVar28._24_4_ * 0.0;
        auVar196._28_4_ = fVar248 + auVar28._28_4_;
        fVar182 = auVar154._0_4_;
        fVar272 = auVar154._4_4_;
        auVar55._4_4_ = fVar272 * auVar160._4_4_;
        auVar55._0_4_ = fVar182 * auVar160._0_4_;
        fVar341 = auVar154._8_4_;
        auVar55._8_4_ = fVar341 * auVar160._8_4_;
        fVar342 = auVar154._12_4_;
        auVar55._12_4_ = fVar342 * auVar160._12_4_;
        fVar343 = auVar154._16_4_;
        auVar55._16_4_ = fVar343 * auVar160._16_4_;
        fVar319 = auVar154._20_4_;
        auVar55._20_4_ = fVar319 * auVar160._20_4_;
        fVar321 = auVar154._24_4_;
        auVar55._24_4_ = fVar321 * auVar160._24_4_;
        auVar55._28_4_ = fVar248;
        fVar248 = auVar192._0_4_;
        fVar265 = auVar192._4_4_;
        auVar56._4_4_ = auVar281._4_4_ * fVar265;
        auVar56._0_4_ = auVar281._0_4_ * fVar248;
        fVar273 = auVar192._8_4_;
        auVar56._8_4_ = auVar281._8_4_ * fVar273;
        fVar287 = auVar192._12_4_;
        auVar56._12_4_ = auVar281._12_4_ * fVar287;
        fVar289 = auVar192._16_4_;
        auVar56._16_4_ = auVar281._16_4_ * fVar289;
        fVar169 = auVar192._20_4_;
        auVar56._20_4_ = auVar281._20_4_ * fVar169;
        fVar180 = auVar192._24_4_;
        auVar56._24_4_ = auVar281._24_4_ * fVar180;
        auVar56._28_4_ = auVar191._28_4_;
        auVar155 = vsubps_avx(auVar56,auVar55);
        auVar191 = vsubps_avx(auVar153,auVar26);
        fVar352 = auVar191._0_4_;
        fVar301 = auVar191._4_4_;
        auVar57._4_4_ = fVar301 * auVar160._4_4_;
        auVar57._0_4_ = fVar352 * auVar160._0_4_;
        fVar311 = auVar191._8_4_;
        auVar57._8_4_ = fVar311 * auVar160._8_4_;
        fVar312 = auVar191._12_4_;
        auVar57._12_4_ = fVar312 * auVar160._12_4_;
        fVar184 = auVar191._16_4_;
        auVar57._16_4_ = fVar184 * auVar160._16_4_;
        fVar204 = auVar191._20_4_;
        auVar57._20_4_ = fVar204 * auVar160._20_4_;
        fVar205 = auVar191._24_4_;
        auVar57._24_4_ = fVar205 * auVar160._24_4_;
        auVar57._28_4_ = auVar160._28_4_;
        auVar58._4_4_ = auVar26._4_4_ * fVar265;
        auVar58._0_4_ = auVar26._0_4_ * fVar248;
        auVar58._8_4_ = auVar26._8_4_ * fVar273;
        auVar58._12_4_ = auVar26._12_4_ * fVar287;
        auVar58._16_4_ = auVar26._16_4_ * fVar289;
        auVar58._20_4_ = auVar26._20_4_ * fVar169;
        auVar58._24_4_ = auVar26._24_4_ * fVar180;
        auVar58._28_4_ = auVar28._28_4_;
        auVar28 = vsubps_avx(auVar57,auVar58);
        auVar59._4_4_ = auVar281._4_4_ * fVar301;
        auVar59._0_4_ = auVar281._0_4_ * fVar352;
        auVar59._8_4_ = auVar281._8_4_ * fVar311;
        auVar59._12_4_ = auVar281._12_4_ * fVar312;
        auVar59._16_4_ = auVar281._16_4_ * fVar184;
        auVar59._20_4_ = auVar281._20_4_ * fVar204;
        auVar59._24_4_ = auVar281._24_4_ * fVar205;
        auVar59._28_4_ = auVar160._28_4_;
        auVar60._4_4_ = auVar26._4_4_ * fVar272;
        auVar60._0_4_ = auVar26._0_4_ * fVar182;
        auVar60._8_4_ = auVar26._8_4_ * fVar341;
        auVar60._12_4_ = auVar26._12_4_ * fVar342;
        auVar60._16_4_ = auVar26._16_4_ * fVar343;
        auVar60._20_4_ = auVar26._20_4_ * fVar319;
        auVar60._24_4_ = auVar26._24_4_ * fVar321;
        auVar60._28_4_ = auVar26._28_4_;
        auVar26 = vsubps_avx(auVar60,auVar59);
        auVar167 = ZEXT864(0) << 0x20;
        auVar259._0_4_ = auVar155._0_4_ * 0.0 + auVar26._0_4_ + auVar28._0_4_ * 0.0;
        auVar259._4_4_ = auVar155._4_4_ * 0.0 + auVar26._4_4_ + auVar28._4_4_ * 0.0;
        auVar259._8_4_ = auVar155._8_4_ * 0.0 + auVar26._8_4_ + auVar28._8_4_ * 0.0;
        auVar259._12_4_ = auVar155._12_4_ * 0.0 + auVar26._12_4_ + auVar28._12_4_ * 0.0;
        auVar259._16_4_ = auVar155._16_4_ * 0.0 + auVar26._16_4_ + auVar28._16_4_ * 0.0;
        auVar259._20_4_ = auVar155._20_4_ * 0.0 + auVar26._20_4_ + auVar28._20_4_ * 0.0;
        auVar259._24_4_ = auVar155._24_4_ * 0.0 + auVar26._24_4_ + auVar28._24_4_ * 0.0;
        auVar259._28_4_ = auVar26._28_4_ + auVar26._28_4_ + auVar28._28_4_;
        auVar26 = vmaxps_avx(auVar196,auVar259);
        auVar26 = vcmpps_avx(auVar26,ZEXT832(0) << 0x20,2);
        auVar215 = vpackssdw_avx(auVar26._0_16_,auVar26._16_16_);
        auVar234 = vpand_avx(auVar215,auVar234);
        auVar215 = vpmovsxwd_avx(auVar234);
        auVar233 = vpunpckhwd_avx(auVar234,auVar234);
        auVar240._16_16_ = auVar233;
        auVar240._0_16_ = auVar215;
        if ((((((((auVar240 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar240 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar240 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar240 >> 0x7f,0) == '\0') &&
              (auVar240 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar233 >> 0x3f,0) == '\0') &&
            (auVar240 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar233[0xf]) {
          auVar234 = vpcmpeqd_avx(auVar154._0_16_,auVar154._0_16_);
          auVar340 = ZEXT1664(auVar234);
LAB_0112f391:
          auVar328 = ZEXT3264(local_5a0);
          auVar394 = ZEXT3264(local_580);
          auVar262 = ZEXT3264(CONCAT824(uStack_5a8,
                                        CONCAT816(uStack_5b0,CONCAT88(uStack_5b8,local_5c0))));
          auVar244 = ZEXT3264(auVar240);
        }
        else {
          auVar61._4_4_ = fVar265 * fVar249;
          auVar61._0_4_ = fVar248 * fVar230;
          auVar61._8_4_ = fVar273 * fVar267;
          auVar61._12_4_ = fVar287 * fVar283;
          auVar61._16_4_ = fVar289 * fVar288;
          auVar61._20_4_ = fVar169 * fVar320;
          auVar61._24_4_ = fVar180 * fVar172;
          auVar61._28_4_ = auVar233._12_4_;
          auVar357._0_4_ = fVar182 * fVar323;
          auVar357._4_4_ = fVar272 * fVar183;
          auVar357._8_4_ = fVar341 * fVar300;
          auVar357._12_4_ = fVar342 * fVar329;
          auVar357._16_4_ = fVar343 * fVar330;
          auVar357._20_4_ = fVar319 * fVar331;
          auVar357._24_4_ = fVar321 * fVar332;
          auVar357._28_4_ = 0;
          auVar26 = vsubps_avx(auVar357,auVar61);
          auVar62._4_4_ = fVar301 * fVar183;
          auVar62._0_4_ = fVar352 * fVar323;
          auVar62._8_4_ = fVar311 * fVar300;
          auVar62._12_4_ = fVar312 * fVar329;
          auVar62._16_4_ = fVar184 * fVar330;
          auVar62._20_4_ = fVar204 * fVar331;
          auVar62._24_4_ = fVar205 * fVar332;
          auVar62._28_4_ = auVar29._28_4_;
          auVar63._4_4_ = fVar265 * fVar263;
          auVar63._0_4_ = fVar248 * fVar247;
          auVar63._8_4_ = fVar273 * fVar271;
          auVar63._12_4_ = fVar287 * fVar286;
          auVar63._16_4_ = fVar289 * fVar250;
          auVar63._20_4_ = fVar169 * fVar149;
          auVar63._24_4_ = fVar180 * fVar178;
          auVar63._28_4_ = auVar192._28_4_;
          auVar160 = vsubps_avx(auVar63,auVar62);
          auVar64._4_4_ = fVar272 * fVar263;
          auVar64._0_4_ = fVar182 * fVar247;
          auVar64._8_4_ = fVar341 * fVar271;
          auVar64._12_4_ = fVar342 * fVar286;
          auVar64._16_4_ = fVar343 * fVar250;
          auVar64._20_4_ = fVar319 * fVar149;
          auVar64._24_4_ = fVar321 * fVar178;
          auVar64._28_4_ = auVar196._28_4_;
          auVar65._4_4_ = fVar301 * fVar249;
          auVar65._0_4_ = fVar352 * fVar230;
          auVar65._8_4_ = fVar311 * fVar267;
          auVar65._12_4_ = fVar312 * fVar283;
          auVar65._16_4_ = fVar184 * fVar288;
          auVar65._20_4_ = fVar204 * fVar320;
          auVar65._24_4_ = fVar205 * fVar172;
          auVar65._28_4_ = auVar25._28_4_;
          auVar28 = vsubps_avx(auVar65,auVar64);
          auVar309._0_4_ = auVar26._0_4_ * 0.0 + auVar28._0_4_ + auVar160._0_4_ * 0.0;
          auVar309._4_4_ = auVar26._4_4_ * 0.0 + auVar28._4_4_ + auVar160._4_4_ * 0.0;
          auVar309._8_4_ = auVar26._8_4_ * 0.0 + auVar28._8_4_ + auVar160._8_4_ * 0.0;
          auVar309._12_4_ = auVar26._12_4_ * 0.0 + auVar28._12_4_ + auVar160._12_4_ * 0.0;
          auVar309._16_4_ = auVar26._16_4_ * 0.0 + auVar28._16_4_ + auVar160._16_4_ * 0.0;
          auVar309._20_4_ = auVar26._20_4_ * 0.0 + auVar28._20_4_ + auVar160._20_4_ * 0.0;
          auVar309._24_4_ = auVar26._24_4_ * 0.0 + auVar28._24_4_ + auVar160._24_4_ * 0.0;
          auVar309._28_4_ = auVar25._28_4_ + auVar28._28_4_ + auVar196._28_4_;
          auVar281 = vrcpps_avx(auVar309);
          fVar230 = auVar281._0_4_;
          fVar247 = auVar281._4_4_;
          auVar66._4_4_ = auVar309._4_4_ * fVar247;
          auVar66._0_4_ = auVar309._0_4_ * fVar230;
          fVar248 = auVar281._8_4_;
          auVar66._8_4_ = auVar309._8_4_ * fVar248;
          fVar249 = auVar281._12_4_;
          auVar66._12_4_ = auVar309._12_4_ * fVar249;
          fVar263 = auVar281._16_4_;
          auVar66._16_4_ = auVar309._16_4_ * fVar263;
          fVar265 = auVar281._20_4_;
          auVar66._20_4_ = auVar309._20_4_ * fVar265;
          fVar267 = auVar281._24_4_;
          auVar66._24_4_ = auVar309._24_4_ * fVar267;
          auVar66._28_4_ = auVar192._28_4_;
          auVar358._8_4_ = 0x3f800000;
          auVar358._0_8_ = &DAT_3f8000003f800000;
          auVar358._12_4_ = 0x3f800000;
          auVar358._16_4_ = 0x3f800000;
          auVar358._20_4_ = 0x3f800000;
          auVar358._24_4_ = 0x3f800000;
          auVar358._28_4_ = 0x3f800000;
          auVar29 = vsubps_avx(auVar358,auVar66);
          fVar230 = auVar29._0_4_ * fVar230 + fVar230;
          fVar247 = auVar29._4_4_ * fVar247 + fVar247;
          fVar248 = auVar29._8_4_ * fVar248 + fVar248;
          fVar249 = auVar29._12_4_ * fVar249 + fVar249;
          fVar263 = auVar29._16_4_ * fVar263 + fVar263;
          fVar265 = auVar29._20_4_ * fVar265 + fVar265;
          fVar267 = auVar29._24_4_ * fVar267 + fVar267;
          auVar67._4_4_ =
               (auVar26._4_4_ * fVar253 + auVar160._4_4_ * fVar251 + auVar28._4_4_ * fVar170) *
               fVar247;
          auVar67._0_4_ =
               (auVar26._0_4_ * fVar246 + auVar160._0_4_ * fVar245 + auVar28._0_4_ * fVar150) *
               fVar230;
          auVar67._8_4_ =
               (auVar26._8_4_ * fVar270 + auVar160._8_4_ * fVar269 + auVar28._8_4_ * fVar173) *
               fVar248;
          auVar67._12_4_ =
               (auVar26._12_4_ * fVar285 + auVar160._12_4_ * fVar284 + auVar28._12_4_ * fVar176) *
               fVar249;
          auVar67._16_4_ =
               (auVar26._16_4_ * fVar318 + auVar160._16_4_ * fVar317 + auVar28._16_4_ * fVar177) *
               fVar263;
          auVar67._20_4_ =
               (auVar26._20_4_ * fVar252 + auVar160._20_4_ * fVar322 + auVar28._20_4_ * fVar179) *
               fVar265;
          auVar67._24_4_ =
               (auVar26._24_4_ * fVar207 + auVar160._24_4_ * fVar175 + auVar28._24_4_ * fVar181) *
               fVar267;
          auVar67._28_4_ = auVar153._28_4_ + auVar27._28_4_ + auVar339._28_4_;
          auVar215 = vpermilps_avx(ZEXT416(uVar144),0);
          auVar241._16_16_ = auVar215;
          auVar241._0_16_ = auVar215;
          auVar339 = vcmpps_avx(auVar241,auVar67,2);
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar279._4_4_ = uVar8;
          auVar279._0_4_ = uVar8;
          auVar279._8_4_ = uVar8;
          auVar279._12_4_ = uVar8;
          auVar279._16_4_ = uVar8;
          auVar279._20_4_ = uVar8;
          auVar279._24_4_ = uVar8;
          auVar279._28_4_ = uVar8;
          auVar26 = vcmpps_avx(auVar67,auVar279,2);
          auVar339 = vandps_avx(auVar26,auVar339);
          auVar215 = vpackssdw_avx(auVar339._0_16_,auVar339._16_16_);
          auVar234 = vpand_avx(auVar234,auVar215);
          auVar215 = vpmovsxwd_avx(auVar234);
          auVar233 = vpshufd_avx(auVar234,0xee);
          auVar233 = vpmovsxwd_avx(auVar233);
          auVar240._16_16_ = auVar233;
          auVar240._0_16_ = auVar215;
          auVar215 = vpcmpeqd_avx(auVar28._0_16_,auVar28._0_16_);
          auVar340 = ZEXT1664(auVar215);
          auVar394 = ZEXT3264(local_580);
          auVar328 = ZEXT3264(local_5a0);
          if ((((((((auVar240 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar240 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar240 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar240 >> 0x7f,0) == '\0') &&
                (auVar240 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar233 >> 0x3f,0) == '\0') &&
              (auVar240 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar233[0xf]) goto LAB_0112f391;
          auVar339 = vcmpps_avx(ZEXT832(0) << 0x20,auVar309,4);
          auVar215 = vpackssdw_avx(auVar339._0_16_,auVar339._16_16_);
          auVar234 = vpand_avx(auVar234,auVar215);
          auVar215 = vpmovsxwd_avx(auVar234);
          auVar234 = vpunpckhwd_avx(auVar234,auVar234);
          auVar244 = ZEXT1664(auVar234);
          auVar297._16_16_ = auVar234;
          auVar297._0_16_ = auVar215;
          auVar262 = ZEXT3264(CONCAT824(uStack_5a8,
                                        CONCAT816(uStack_5b0,CONCAT88(uStack_5b8,local_5c0))));
          if ((((((((auVar297 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar297 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar297 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar297 >> 0x7f,0) != '\0') ||
                (auVar297 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar234 >> 0x3f,0) != '\0') ||
              (auVar297 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar234[0xf] < '\0') {
            auVar242._0_4_ = auVar196._0_4_ * fVar230;
            auVar242._4_4_ = auVar196._4_4_ * fVar247;
            auVar242._8_4_ = auVar196._8_4_ * fVar248;
            auVar242._12_4_ = auVar196._12_4_ * fVar249;
            auVar242._16_4_ = auVar196._16_4_ * fVar263;
            auVar242._20_4_ = auVar196._20_4_ * fVar265;
            auVar242._24_4_ = auVar196._24_4_ * fVar267;
            auVar242._28_4_ = 0;
            auVar68._4_4_ = auVar259._4_4_ * fVar247;
            auVar68._0_4_ = auVar259._0_4_ * fVar230;
            auVar68._8_4_ = auVar259._8_4_ * fVar248;
            auVar68._12_4_ = auVar259._12_4_ * fVar249;
            auVar68._16_4_ = auVar259._16_4_ * fVar263;
            auVar68._20_4_ = auVar259._20_4_ * fVar265;
            auVar68._24_4_ = auVar259._24_4_ * fVar267;
            auVar68._28_4_ = auVar29._28_4_ + auVar281._28_4_;
            auVar280._8_4_ = 0x3f800000;
            auVar280._0_8_ = &DAT_3f8000003f800000;
            auVar280._12_4_ = 0x3f800000;
            auVar280._16_4_ = 0x3f800000;
            auVar280._20_4_ = 0x3f800000;
            auVar280._24_4_ = 0x3f800000;
            auVar280._28_4_ = 0x3f800000;
            auVar339 = vsubps_avx(auVar280,auVar242);
            auVar339 = vblendvps_avx(auVar339,auVar242,auVar393);
            auVar394 = ZEXT3264(auVar339);
            auVar339 = vsubps_avx(auVar280,auVar68);
            auVar244 = ZEXT3264(auVar339);
            _local_200 = vblendvps_avx(auVar339,auVar68,auVar393);
            auVar262 = ZEXT3264(auVar297);
            auVar328 = ZEXT3264(auVar67);
          }
        }
        auVar385 = ZEXT3264(_local_6a0);
        local_580 = auVar394._0_32_;
        local_5a0 = auVar328._0_32_;
        auVar281 = auVar262._0_32_;
        auVar339 = local_5a0;
        auVar26 = local_580;
        _local_6c0 = auVar381;
        if ((((((((auVar281 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar281 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar281 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar281 >> 0x7f,0) == '\0') &&
              (auVar262 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar281 >> 0xbf,0) == '\0') &&
            (auVar262 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar262[0x1f]) {
LAB_0112df77:
          local_580 = auVar26;
          local_5a0 = auVar339;
          auVar262 = ZEXT3264(_local_620);
          auVar381 = _local_6c0;
        }
        else {
          auVar160 = vsubps_avx(_local_7e0,_local_880);
          local_880._0_4_ = (float)local_880._0_4_ + auVar394._0_4_ * auVar160._0_4_;
          local_880._4_4_ = (float)local_880._4_4_ + auVar394._4_4_ * auVar160._4_4_;
          fStack_878 = fStack_878 + auVar394._8_4_ * auVar160._8_4_;
          fStack_874 = fStack_874 + auVar394._12_4_ * auVar160._12_4_;
          fStack_870 = fStack_870 + auVar394._16_4_ * auVar160._16_4_;
          fStack_86c = fStack_86c + auVar394._20_4_ * auVar160._20_4_;
          fStack_868 = fStack_868 + auVar394._24_4_ * auVar160._24_4_;
          fStack_864 = fStack_864 + auVar160._28_4_;
          fVar230 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
          auVar69._4_4_ = ((float)local_880._4_4_ + (float)local_880._4_4_) * fVar230;
          auVar69._0_4_ = ((float)local_880._0_4_ + (float)local_880._0_4_) * fVar230;
          auVar69._8_4_ = (fStack_878 + fStack_878) * fVar230;
          auVar69._12_4_ = (fStack_874 + fStack_874) * fVar230;
          auVar69._16_4_ = (fStack_870 + fStack_870) * fVar230;
          auVar69._20_4_ = (fStack_86c + fStack_86c) * fVar230;
          auVar69._24_4_ = (fStack_868 + fStack_868) * fVar230;
          auVar69._28_4_ = fStack_864 + fStack_864;
          auVar160 = vcmpps_avx(local_5a0,auVar69,6);
          auVar27 = auVar281 & auVar160;
          auVar262 = ZEXT3264(_local_620);
          if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar27 >> 0x7f,0) != '\0') ||
                (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar27 >> 0xbf,0) != '\0') ||
              (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar27[0x1f] < '\0') {
            local_2a0 = vandps_avx(auVar160,auVar281);
            local_200._0_4_ = (float)local_200._0_4_ + (float)local_200._0_4_ + -1.0;
            local_200._4_4_ = (float)local_200._4_4_ + (float)local_200._4_4_ + -1.0;
            uStack_1f8._0_4_ = (float)uStack_1f8 + (float)uStack_1f8 + -1.0;
            uStack_1f8._4_4_ = uStack_1f8._4_4_ + uStack_1f8._4_4_ + -1.0;
            uStack_1f0._0_4_ = (float)uStack_1f0 + (float)uStack_1f0 + -1.0;
            uStack_1f0._4_4_ = uStack_1f0._4_4_ + uStack_1f0._4_4_ + -1.0;
            uStack_1e8._0_4_ = (float)uStack_1e8 + (float)uStack_1e8 + -1.0;
            uStack_1e8._4_4_ = uStack_1e8._4_4_ + uStack_1e8._4_4_ + -1.0;
            local_360 = local_580;
            auVar139 = _local_200;
            auVar281 = _local_200;
            local_340 = (float)local_200._0_4_;
            fStack_33c = (float)local_200._4_4_;
            fStack_338 = (float)uStack_1f8;
            fStack_334 = uStack_1f8._4_4_;
            fStack_330 = (float)uStack_1f0;
            fStack_32c = uStack_1f0._4_4_;
            fStack_328 = (float)uStack_1e8;
            fStack_324 = uStack_1e8._4_4_;
            local_320 = local_5a0;
            local_300 = 0;
            local_2fc = uVar20;
            local_2f0 = local_820;
            uStack_2e8 = uStack_818;
            uStack_6b8 = auVar381._8_8_;
            local_2e0 = auVar381._0_8_;
            uStack_2d8 = uStack_6b8;
            local_2d0 = local_6d0;
            uStack_2c8 = uStack_6c8;
            local_2c0 = local_6b0;
            uStack_2b8 = uStack_6a8;
            if ((pGVar22->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              auVar212._0_4_ = 1.0 / (float)(int)uVar20;
              auVar212._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar234 = vshufps_avx(auVar212,auVar212,0);
              local_280[0] = auVar234._0_4_ * (auVar394._0_4_ + 0.0);
              local_280[1] = auVar234._4_4_ * (auVar394._4_4_ + 1.0);
              local_280[2] = auVar234._8_4_ * (auVar394._8_4_ + 2.0);
              local_280[3] = auVar234._12_4_ * (auVar394._12_4_ + 3.0);
              fStack_270 = auVar234._0_4_ * (auVar394._16_4_ + 4.0);
              fStack_26c = auVar234._4_4_ * (auVar394._20_4_ + 5.0);
              fStack_268 = auVar234._8_4_ * (auVar394._24_4_ + 6.0);
              fStack_264 = auVar394._28_4_ + 7.0;
              uStack_1f0 = auVar139._16_8_;
              uStack_1e8 = auVar281._24_8_;
              local_260 = local_200;
              uStack_258 = uStack_1f8;
              uStack_250 = uStack_1f0;
              uStack_248 = uStack_1e8;
              local_240 = local_5a0;
              auVar197._8_4_ = 0x7f800000;
              auVar197._0_8_ = 0x7f8000007f800000;
              auVar197._12_4_ = 0x7f800000;
              auVar197._16_4_ = 0x7f800000;
              auVar197._20_4_ = 0x7f800000;
              auVar197._24_4_ = 0x7f800000;
              auVar197._28_4_ = 0x7f800000;
              auVar160 = vblendvps_avx(auVar197,local_5a0,local_2a0);
              auVar27 = vshufps_avx(auVar160,auVar160,0xb1);
              auVar27 = vminps_avx(auVar160,auVar27);
              auVar28 = vshufpd_avx(auVar27,auVar27,5);
              auVar27 = vminps_avx(auVar27,auVar28);
              auVar28 = vperm2f128_avx(auVar27,auVar27,1);
              auVar27 = vminps_avx(auVar27,auVar28);
              auVar27 = vcmpps_avx(auVar160,auVar27,0);
              auVar28 = local_2a0 & auVar27;
              auVar160 = local_2a0;
              if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar28 >> 0x7f,0) != '\0') ||
                    (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar28 >> 0xbf,0) != '\0') ||
                  (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar28[0x1f] < '\0') {
                auVar160 = vandps_avx(auVar27,local_2a0);
              }
              uVar141 = vmovmskps_avx(auVar160);
              uVar24 = 0;
              if (uVar141 != 0) {
                for (; (uVar141 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                }
              }
              uVar142 = (ulong)uVar24;
              _local_200 = auVar281;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar22->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar230 = local_280[uVar142];
                uVar8 = *(undefined4 *)((long)&local_260 + uVar142 * 4);
                fVar246 = 1.0 - fVar230;
                fVar245 = fVar230 * fVar246 + fVar230 * fVar246;
                auVar234 = ZEXT416((uint)(fVar230 * fVar230 * 3.0));
                auVar234 = vshufps_avx(auVar234,auVar234,0);
                auVar215 = ZEXT416((uint)((fVar245 - fVar230 * fVar230) * 3.0));
                auVar215 = vshufps_avx(auVar215,auVar215,0);
                auVar233 = ZEXT416((uint)((fVar246 * fVar246 - fVar245) * 3.0));
                auVar233 = vshufps_avx(auVar233,auVar233,0);
                auVar218 = ZEXT416((uint)(fVar246 * fVar246 * -3.0));
                auVar218 = vshufps_avx(auVar218,auVar218,0);
                auVar213._0_4_ =
                     auVar218._0_4_ * local_820._0_4_ +
                     auVar233._0_4_ * fVar379 +
                     auVar234._0_4_ * (float)local_6b0._0_4_ +
                     auVar215._0_4_ * (float)local_6d0._0_4_;
                auVar213._4_4_ =
                     auVar218._4_4_ * local_820._4_4_ +
                     auVar233._4_4_ * fVar386 +
                     auVar234._4_4_ * (float)local_6b0._4_4_ +
                     auVar215._4_4_ * (float)local_6d0._4_4_;
                auVar213._8_4_ =
                     auVar218._8_4_ * local_820._8_4_ +
                     auVar233._8_4_ * auVar381._8_4_ +
                     auVar234._8_4_ * (float)uStack_6a8 + auVar215._8_4_ * (float)uStack_6c8;
                auVar213._12_4_ =
                     auVar218._12_4_ * local_820._12_4_ +
                     auVar233._12_4_ * auVar381._12_4_ +
                     auVar234._12_4_ * uStack_6a8._4_4_ + auVar215._12_4_ * uStack_6c8._4_4_;
                auVar244 = ZEXT464(*(uint *)(local_240 + uVar142 * 4));
                *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_240 + uVar142 * 4);
                *(float *)(ray + k * 4 + 0xc0) = auVar213._0_4_;
                uVar21 = vextractps_avx(auVar213,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar21;
                uVar21 = vextractps_avx(auVar213,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar21;
                *(float *)(ray + k * 4 + 0xf0) = fVar230;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar8;
                *(uint *)(ray + k * 4 + 0x110) = uVar19;
                *(uint *)(ray + k * 4 + 0x120) = uVar18;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                _local_760 = vshufps_avx(ZEXT416(uVar18),ZEXT416(uVar18),0);
                _local_700 = vshufps_avx(ZEXT416(uVar19),ZEXT416(uVar19),0);
                auStack_6f0 = auVar153._16_16_;
                _auStack_770 = auVar164._16_16_;
                uStack_778 = uStack_6b8;
                local_780 = (undefined1  [8])auVar381._0_8_;
                _auStack_630 = auVar238._16_16_;
                _local_640 = _local_6d0;
                local_7c0 = (float)*(undefined8 *)*local_708;
                fStack_7bc = (float)((ulong)*(undefined8 *)*local_708 >> 0x20);
                fStack_7b8 = (float)*(undefined8 *)(*local_708 + 8);
                fStack_7b4 = (float)((ulong)*(undefined8 *)(*local_708 + 8) >> 0x20);
                local_7a0 = (float)local_6b0._0_4_;
                fStack_79c = (float)local_6b0._4_4_;
                fStack_798 = (float)uStack_6a8;
                fStack_794 = uStack_6a8._4_4_;
                local_600 = local_2a0;
                do {
                  local_7e0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_3c0 = local_280[uVar142];
                  local_3b0 = *(undefined4 *)((long)&local_260 + uVar142 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_240 + uVar142 * 4);
                  fVar245 = 1.0 - local_3c0;
                  fVar230 = local_3c0 * fVar245 + local_3c0 * fVar245;
                  auVar234 = ZEXT416((uint)(local_3c0 * local_3c0 * 3.0));
                  auVar234 = vshufps_avx(auVar234,auVar234,0);
                  auVar215 = ZEXT416((uint)((fVar230 - local_3c0 * local_3c0) * 3.0));
                  auVar215 = vshufps_avx(auVar215,auVar215,0);
                  auVar233 = ZEXT416((uint)((fVar245 * fVar245 - fVar230) * 3.0));
                  auVar233 = vshufps_avx(auVar233,auVar233,0);
                  local_810.context = context->user;
                  auVar218 = ZEXT416((uint)(fVar245 * fVar245 * -3.0));
                  auVar218 = vshufps_avx(auVar218,auVar218,0);
                  auVar219._0_4_ =
                       auVar218._0_4_ * (float)local_820._0_4_ +
                       auVar233._0_4_ * (float)local_780._0_4_ +
                       auVar234._0_4_ * local_7a0 + auVar215._0_4_ * (float)local_640._0_4_;
                  auVar219._4_4_ =
                       auVar218._4_4_ * (float)local_820._4_4_ +
                       auVar233._4_4_ * (float)local_780._4_4_ +
                       auVar234._4_4_ * fStack_79c + auVar215._4_4_ * (float)local_640._4_4_;
                  auVar219._8_4_ =
                       auVar218._8_4_ * (float)uStack_818 +
                       auVar233._8_4_ * (float)uStack_778 +
                       auVar234._8_4_ * fStack_798 + auVar215._8_4_ * fStack_638;
                  auVar219._12_4_ =
                       auVar218._12_4_ * uStack_818._4_4_ +
                       auVar233._12_4_ * uStack_778._4_4_ +
                       auVar234._12_4_ * fStack_794 + auVar215._12_4_ * fStack_634;
                  auVar234 = vshufps_avx(auVar219,auVar219,0);
                  local_3f0[0] = (RTCHitN)auVar234[0];
                  local_3f0[1] = (RTCHitN)auVar234[1];
                  local_3f0[2] = (RTCHitN)auVar234[2];
                  local_3f0[3] = (RTCHitN)auVar234[3];
                  local_3f0[4] = (RTCHitN)auVar234[4];
                  local_3f0[5] = (RTCHitN)auVar234[5];
                  local_3f0[6] = (RTCHitN)auVar234[6];
                  local_3f0[7] = (RTCHitN)auVar234[7];
                  local_3f0[8] = (RTCHitN)auVar234[8];
                  local_3f0[9] = (RTCHitN)auVar234[9];
                  local_3f0[10] = (RTCHitN)auVar234[10];
                  local_3f0[0xb] = (RTCHitN)auVar234[0xb];
                  local_3f0[0xc] = (RTCHitN)auVar234[0xc];
                  local_3f0[0xd] = (RTCHitN)auVar234[0xd];
                  local_3f0[0xe] = (RTCHitN)auVar234[0xe];
                  local_3f0[0xf] = (RTCHitN)auVar234[0xf];
                  local_3e0 = vshufps_avx(auVar219,auVar219,0x55);
                  auVar244 = ZEXT1664(local_3e0);
                  local_3d0 = vshufps_avx(auVar219,auVar219,0xaa);
                  fStack_3bc = local_3c0;
                  fStack_3b8 = local_3c0;
                  fStack_3b4 = local_3c0;
                  uStack_3ac = local_3b0;
                  uStack_3a8 = local_3b0;
                  uStack_3a4 = local_3b0;
                  local_3a0 = local_700;
                  uStack_398 = uStack_6f8;
                  local_390 = local_760;
                  uStack_388 = uStack_758;
                  vcmpps_avx(auVar167._0_32_,auVar167._0_32_,0xf);
                  uStack_37c = (local_810.context)->instID[0];
                  local_380 = uStack_37c;
                  uStack_378 = uStack_37c;
                  uStack_374 = uStack_37c;
                  uStack_370 = (local_810.context)->instPrimID[0];
                  uStack_36c = uStack_370;
                  uStack_368 = uStack_370;
                  uStack_364 = uStack_370;
                  local_830 = CONCAT44(fStack_7bc,local_7c0);
                  uStack_828 = CONCAT44(fStack_7b4,fStack_7b8);
                  local_810.valid = (int *)&local_830;
                  local_810.geometryUserPtr = pGVar22->userPtr;
                  local_810.hit = local_3f0;
                  local_810.N = 4;
                  local_810.ray = (RTCRayN *)ray;
                  if (pGVar22->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar244 = ZEXT1664(local_3e0);
                    auVar234 = auVar340._0_16_;
                    (*pGVar22->intersectionFilterN)(&local_810);
                    auVar385 = ZEXT3264(_local_6a0);
                    auVar328 = ZEXT3264(local_5a0);
                    auVar394 = ZEXT3264(local_580);
                    auVar234 = vpcmpeqd_avx(auVar234,auVar234);
                    auVar340 = ZEXT1664(auVar234);
                    auVar167 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  auVar126._8_8_ = uStack_828;
                  auVar126._0_8_ = local_830;
                  auVar234 = auVar340._0_16_;
                  if (auVar126 == (undefined1  [16])0x0) {
                    auVar215 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                    auVar234 = auVar234 ^ auVar215;
                  }
                  else {
                    p_Var23 = context->args->filter;
                    if ((p_Var23 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar22->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar244 = ZEXT1664(auVar244._0_16_);
                      (*p_Var23)(&local_810);
                      auVar385 = ZEXT3264(_local_6a0);
                      auVar328 = ZEXT3264(local_5a0);
                      auVar394 = ZEXT3264(local_580);
                      auVar234 = vpcmpeqd_avx(auVar234,auVar234);
                      auVar340 = ZEXT1664(auVar234);
                      auVar167 = ZEXT1664(ZEXT816(0) << 0x40);
                    }
                    auVar127._8_8_ = uStack_828;
                    auVar127._0_8_ = local_830;
                    auVar215 = vpcmpeqd_avx(auVar127,_DAT_01feba10);
                    auVar234 = auVar340._0_16_ ^ auVar215;
                    if (auVar127 != (undefined1  [16])0x0) {
                      auVar215 = auVar340._0_16_ ^ auVar215;
                      auVar233 = vmaskmovps_avx(auVar215,*(undefined1 (*) [16])local_810.hit);
                      *(undefined1 (*) [16])(local_810.ray + 0xc0) = auVar233;
                      auVar233 = vmaskmovps_avx(auVar215,*(undefined1 (*) [16])
                                                          (local_810.hit + 0x10));
                      *(undefined1 (*) [16])(local_810.ray + 0xd0) = auVar233;
                      auVar233 = vmaskmovps_avx(auVar215,*(undefined1 (*) [16])
                                                          (local_810.hit + 0x20));
                      *(undefined1 (*) [16])(local_810.ray + 0xe0) = auVar233;
                      auVar233 = vmaskmovps_avx(auVar215,*(undefined1 (*) [16])
                                                          (local_810.hit + 0x30));
                      *(undefined1 (*) [16])(local_810.ray + 0xf0) = auVar233;
                      auVar233 = vmaskmovps_avx(auVar215,*(undefined1 (*) [16])
                                                          (local_810.hit + 0x40));
                      *(undefined1 (*) [16])(local_810.ray + 0x100) = auVar233;
                      auVar233 = vmaskmovps_avx(auVar215,*(undefined1 (*) [16])
                                                          (local_810.hit + 0x50));
                      *(undefined1 (*) [16])(local_810.ray + 0x110) = auVar233;
                      auVar233 = vmaskmovps_avx(auVar215,*(undefined1 (*) [16])
                                                          (local_810.hit + 0x60));
                      *(undefined1 (*) [16])(local_810.ray + 0x120) = auVar233;
                      auVar233 = vmaskmovps_avx(auVar215,*(undefined1 (*) [16])
                                                          (local_810.hit + 0x70));
                      *(undefined1 (*) [16])(local_810.ray + 0x130) = auVar233;
                      auVar215 = vmaskmovps_avx(auVar215,*(undefined1 (*) [16])
                                                          (local_810.hit + 0x80));
                      *(undefined1 (*) [16])(local_810.ray + 0x140) = auVar215;
                    }
                  }
                  auVar339 = auVar328._0_32_;
                  auVar190._8_8_ = 0x100000001;
                  auVar190._0_8_ = 0x100000001;
                  if ((auVar190 & auVar234) == (undefined1  [16])0x0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_7e0._0_4_;
                  }
                  *(undefined4 *)(local_600 + uVar142 * 4) = 0;
                  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
                  auVar166._4_4_ = uVar8;
                  auVar166._0_4_ = uVar8;
                  auVar166._8_4_ = uVar8;
                  auVar166._12_4_ = uVar8;
                  auVar166._16_4_ = uVar8;
                  auVar166._20_4_ = uVar8;
                  auVar166._24_4_ = uVar8;
                  auVar166._28_4_ = uVar8;
                  auVar164 = vcmpps_avx(auVar339,auVar166,2);
                  auVar153 = vandps_avx(auVar164,local_600);
                  local_600 = local_600 & auVar164;
                  bVar119 = (local_600 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar120 = (local_600 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar118 = (local_600 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar117 = SUB321(local_600 >> 0x7f,0) != '\0';
                  bVar116 = (local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar115 = SUB321(local_600 >> 0xbf,0) != '\0';
                  bVar114 = (local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar113 = local_600[0x1f] < '\0';
                  if (((((((bVar119 || bVar120) || bVar118) || bVar117) || bVar116) || bVar115) ||
                      bVar114) || bVar113) {
                    auVar203._8_4_ = 0x7f800000;
                    auVar203._0_8_ = 0x7f8000007f800000;
                    auVar203._12_4_ = 0x7f800000;
                    auVar203._16_4_ = 0x7f800000;
                    auVar203._20_4_ = 0x7f800000;
                    auVar203._24_4_ = 0x7f800000;
                    auVar203._28_4_ = 0x7f800000;
                    auVar164 = vblendvps_avx(auVar203,auVar339,auVar153);
                    auVar26 = vshufps_avx(auVar164,auVar164,0xb1);
                    auVar26 = vminps_avx(auVar164,auVar26);
                    auVar281 = vshufpd_avx(auVar26,auVar26,5);
                    auVar26 = vminps_avx(auVar26,auVar281);
                    auVar281 = vperm2f128_avx(auVar26,auVar26,1);
                    auVar244 = ZEXT3264(auVar281);
                    auVar26 = vminps_avx(auVar26,auVar281);
                    auVar26 = vcmpps_avx(auVar164,auVar26,0);
                    auVar281 = auVar153 & auVar26;
                    auVar164 = auVar153;
                    if ((((((((auVar281 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar281 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar281 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar281 >> 0x7f,0) != '\0') ||
                          (auVar281 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar281 >> 0xbf,0) != '\0') ||
                        (auVar281 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar281[0x1f] < '\0') {
                      auVar164 = vandps_avx(auVar26,auVar153);
                    }
                    uVar141 = vmovmskps_avx(auVar164);
                    uVar24 = 0;
                    if (uVar141 != 0) {
                      for (; (uVar141 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                      }
                    }
                    uVar142 = (ulong)uVar24;
                  }
                  auVar26 = auVar394._0_32_;
                  local_600 = auVar153;
                } while (((((((bVar119 || bVar120) || bVar118) || bVar117) || bVar116) || bVar115)
                         || bVar114) || bVar113);
              }
              goto LAB_0112df77;
            }
          }
        }
      }
      _local_6c0 = auVar381;
      if (8 < (int)uVar20) {
        _local_500 = vpshufd_avx(ZEXT416(uVar20),0);
        auVar234 = vshufps_avx(_local_740,_local_740,0);
        register0x00001210 = auVar234;
        _local_520 = auVar234;
        auVar234 = vpermilps_avx(ZEXT416(uVar144),0);
        local_1e0._16_16_ = auVar234;
        local_1e0._0_16_ = auVar234;
        auVar152._0_4_ = 1.0 / (float)local_4a0._0_4_;
        auVar152._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar234 = vshufps_avx(auVar152,auVar152,0);
        _fStack_490 = auVar234;
        _local_4a0 = auVar234;
        local_150 = vshufps_avx(ZEXT416(uVar18),ZEXT416(uVar18),0);
        local_160 = vshufps_avx(ZEXT416(uVar19),ZEXT416(uVar19),0);
        auVar167 = ZEXT1664(local_160);
        lVar143 = 8;
        auVar340 = ZEXT3264(local_680);
        _local_6a0 = auVar385._0_32_;
        _local_620 = auVar262._0_32_;
        do {
          pauVar3 = (undefined1 (*) [28])(bezier_basis0 + lVar143 * 4 + lVar147);
          fVar230 = *(float *)*pauVar3;
          fVar245 = *(float *)(*pauVar3 + 4);
          fVar246 = *(float *)(*pauVar3 + 8);
          fVar247 = *(float *)(*pauVar3 + 0xc);
          fVar248 = *(float *)(*pauVar3 + 0x10);
          fVar249 = *(float *)(*pauVar3 + 0x14);
          fVar251 = *(float *)(*pauVar3 + 0x18);
          auVar138 = *pauVar3;
          pauVar3 = (undefined1 (*) [28])(lVar147 + 0x2227768 + lVar143 * 4);
          fVar253 = *(float *)*pauVar3;
          fVar263 = *(float *)(*pauVar3 + 4);
          fVar265 = *(float *)(*pauVar3 + 8);
          fVar267 = *(float *)(*pauVar3 + 0xc);
          fVar269 = *(float *)(*pauVar3 + 0x10);
          fVar270 = *(float *)(*pauVar3 + 0x14);
          fVar271 = *(float *)(*pauVar3 + 0x18);
          auVar137 = *pauVar3;
          pauVar3 = (undefined1 (*) [28])(lVar147 + 0x2227bec + lVar143 * 4);
          fVar273 = *(float *)*pauVar3;
          fVar283 = *(float *)(*pauVar3 + 4);
          fVar284 = *(float *)(*pauVar3 + 8);
          fVar285 = *(float *)(*pauVar3 + 0xc);
          fVar286 = *(float *)(*pauVar3 + 0x10);
          fVar287 = *(float *)(*pauVar3 + 0x14);
          fVar288 = *(float *)(*pauVar3 + 0x18);
          auVar136 = *pauVar3;
          pfVar1 = (float *)(lVar147 + 0x2228070 + lVar143 * 4);
          fVar317 = *pfVar1;
          fVar318 = pfVar1[1];
          fVar250 = pfVar1[2];
          fVar289 = pfVar1[3];
          fVar320 = pfVar1[4];
          fVar322 = pfVar1[5];
          fVar252 = pfVar1[6];
          fVar149 = auVar244._28_4_;
          fVar272 = fVar149 + fVar149 + pfVar1[7];
          local_880._0_4_ =
               (float)local_100._0_4_ * fVar230 +
               (float)local_480._0_4_ * fVar253 +
               auVar340._0_4_ * fVar273 + (float)local_440._0_4_ * fVar317;
          local_880._4_4_ =
               (float)local_100._4_4_ * fVar245 +
               (float)local_480._4_4_ * fVar263 +
               auVar340._4_4_ * fVar283 + (float)local_440._4_4_ * fVar318;
          fStack_878 = fStack_f8 * fVar246 +
                       fStack_478 * fVar265 + auVar340._8_4_ * fVar284 + fStack_438 * fVar250;
          fStack_874 = fStack_f4 * fVar247 +
                       fStack_474 * fVar267 + auVar340._12_4_ * fVar285 + fStack_434 * fVar289;
          fStack_870 = fStack_f0 * fVar248 +
                       fStack_470 * fVar269 + auVar340._16_4_ * fVar286 + fStack_430 * fVar320;
          fStack_86c = fStack_ec * fVar249 +
                       fStack_46c * fVar270 + auVar340._20_4_ * fVar287 + fStack_42c * fVar322;
          fStack_868 = fStack_e8 * fVar251 +
                       fStack_468 * fVar271 + auVar340._24_4_ * fVar288 + fStack_428 * fVar252;
          fStack_864 = fVar149 + pfVar1[7] + fVar149 + fVar149 + auVar167._28_4_;
          auVar243._0_4_ =
               auVar385._0_4_ * fVar253 +
               fVar273 * (float)local_4c0._0_4_ + (float)local_460._0_4_ * fVar317 +
               (float)local_420._0_4_ * fVar230;
          auVar243._4_4_ =
               auVar385._4_4_ * fVar263 +
               fVar283 * (float)local_4c0._4_4_ + (float)local_460._4_4_ * fVar318 +
               (float)local_420._4_4_ * fVar245;
          auVar243._8_4_ =
               auVar385._8_4_ * fVar265 + fVar284 * fStack_4b8 + fStack_458 * fVar250 +
               fStack_418 * fVar246;
          auVar243._12_4_ =
               auVar385._12_4_ * fVar267 + fVar285 * fStack_4b4 + fStack_454 * fVar289 +
               fStack_414 * fVar247;
          auVar243._16_4_ =
               auVar385._16_4_ * fVar269 + fVar286 * fStack_4b0 + fStack_450 * fVar320 +
               fStack_410 * fVar248;
          auVar243._20_4_ =
               auVar385._20_4_ * fVar270 + fVar287 * fStack_4ac + fStack_44c * fVar322 +
               fStack_40c * fVar249;
          auVar243._24_4_ =
               auVar385._24_4_ * fVar271 + fVar288 * fStack_4a8 + fStack_448 * fVar252 +
               fStack_408 * fVar251;
          auVar243._28_4_ = fVar149 + fVar149 + auVar262._28_4_ + fStack_864;
          fVar150 = (float)local_180._0_4_ * fVar230 +
                    fVar253 * (float)local_120._0_4_ +
                    (float)local_a0._0_4_ * fVar273 + (float)local_e0._0_4_ * fVar317;
          fVar170 = (float)local_180._4_4_ * fVar245 +
                    fVar263 * (float)local_120._4_4_ +
                    (float)local_a0._4_4_ * fVar283 + (float)local_e0._4_4_ * fVar318;
          fVar173 = fStack_178 * fVar246 +
                    fVar265 * fStack_118 + fStack_98 * fVar284 + fStack_d8 * fVar250;
          fVar176 = fStack_174 * fVar247 +
                    fVar267 * fStack_114 + fStack_94 * fVar285 + fStack_d4 * fVar289;
          fVar177 = fStack_170 * fVar248 +
                    fVar269 * fStack_110 + fStack_90 * fVar286 + fStack_d0 * fVar320;
          fVar179 = fStack_16c * fVar249 +
                    fVar270 * fStack_10c + fStack_8c * fVar287 + fStack_cc * fVar322;
          fVar181 = fStack_168 * fVar251 +
                    fVar271 * fStack_108 + fStack_88 * fVar288 + fStack_c8 * fVar252;
          fVar182 = fStack_864 + fVar272;
          pauVar4 = (undefined1 (*) [32])(bezier_basis1 + lVar143 * 4 + lVar147);
          auVar139 = *(undefined1 (*) [24])*pauVar4;
          pfVar1 = (float *)(lVar147 + 0x2229b88 + lVar143 * 4);
          fVar253 = *pfVar1;
          fVar263 = pfVar1[1];
          fVar265 = pfVar1[2];
          fVar267 = pfVar1[3];
          fVar269 = pfVar1[4];
          fVar270 = pfVar1[5];
          fVar271 = pfVar1[6];
          pfVar1 = (float *)(lVar147 + 0x222a00c + lVar143 * 4);
          fVar273 = *pfVar1;
          fVar283 = pfVar1[1];
          fVar284 = pfVar1[2];
          fVar285 = pfVar1[3];
          fVar286 = pfVar1[4];
          fVar287 = pfVar1[5];
          fVar288 = pfVar1[6];
          pfVar1 = (float *)(lVar147 + 0x222a490 + lVar143 * 4);
          fVar149 = *pfVar1;
          fVar169 = pfVar1[1];
          fVar172 = pfVar1[2];
          fVar175 = pfVar1[3];
          fVar207 = pfVar1[4];
          fVar178 = pfVar1[5];
          fVar180 = pfVar1[6];
          auVar167 = ZEXT3264(local_680);
          fVar230 = local_680._0_4_;
          fVar245 = local_680._4_4_;
          fVar246 = local_680._8_4_;
          fVar247 = local_680._12_4_;
          fVar248 = local_680._16_4_;
          fVar249 = local_680._20_4_;
          fVar251 = local_680._24_4_;
          local_740._0_4_ = auVar139._0_4_;
          local_740._4_4_ = auVar139._4_4_;
          fStack_738 = auVar139._8_4_;
          fStack_734 = auVar139._12_4_;
          fStack_730 = auVar139._16_4_;
          fStack_72c = auVar139._20_4_;
          fStack_728 = (float)*(undefined8 *)(*pauVar4 + 0x18);
          fStack_724 = (float)((ulong)*(undefined8 *)(*pauVar4 + 0x18) >> 0x20);
          fVar272 = fStack_444 + fStack_444 + fVar272;
          auVar298._0_4_ =
               (float)local_100._0_4_ * (float)local_740._0_4_ +
               (float)local_480._0_4_ * fVar253 +
               fVar273 * fVar230 + (float)local_440._0_4_ * fVar149;
          auVar298._4_4_ =
               (float)local_100._4_4_ * (float)local_740._4_4_ +
               (float)local_480._4_4_ * fVar263 +
               fVar283 * fVar245 + (float)local_440._4_4_ * fVar169;
          auVar298._8_4_ =
               fStack_f8 * fStack_738 +
               fStack_478 * fVar265 + fVar284 * fVar246 + fStack_438 * fVar172;
          auVar298._12_4_ =
               fStack_f4 * fStack_734 +
               fStack_474 * fVar267 + fVar285 * fVar247 + fStack_434 * fVar175;
          auVar298._16_4_ =
               fStack_f0 * fStack_730 +
               fStack_470 * fVar269 + fVar286 * fVar248 + fStack_430 * fVar207;
          auVar298._20_4_ =
               fStack_ec * fStack_72c +
               fStack_46c * fVar270 + fVar287 * fVar249 + fStack_42c * fVar178;
          auVar298._24_4_ =
               fStack_e8 * fStack_728 +
               fStack_468 * fVar271 + fVar288 * fVar251 + fStack_428 * fVar180;
          auVar298._28_4_ = fStack_444 + fStack_c4 + fVar272;
          auVar384._0_4_ =
               (float)local_420._0_4_ * (float)local_740._0_4_ +
               auVar385._0_4_ * fVar253 +
               (float)local_460._0_4_ * fVar149 + fVar273 * (float)local_4c0._0_4_;
          auVar384._4_4_ =
               (float)local_420._4_4_ * (float)local_740._4_4_ +
               auVar385._4_4_ * fVar263 +
               (float)local_460._4_4_ * fVar169 + fVar283 * (float)local_4c0._4_4_;
          auVar384._8_4_ =
               fStack_418 * fStack_738 +
               auVar385._8_4_ * fVar265 + fStack_458 * fVar172 + fVar284 * fStack_4b8;
          auVar384._12_4_ =
               fStack_414 * fStack_734 +
               auVar385._12_4_ * fVar267 + fStack_454 * fVar175 + fVar285 * fStack_4b4;
          auVar384._16_4_ =
               fStack_410 * fStack_730 +
               auVar385._16_4_ * fVar269 + fStack_450 * fVar207 + fVar286 * fStack_4b0;
          auVar384._20_4_ =
               fStack_40c * fStack_72c +
               auVar385._20_4_ * fVar270 + fStack_44c * fVar178 + fVar287 * fStack_4ac;
          auVar384._24_4_ =
               fStack_408 * fStack_728 +
               auVar385._24_4_ * fVar271 + fStack_448 * fVar180 + fVar288 * fStack_4a8;
          auVar384._28_4_ = fVar272 + fStack_444 + fStack_424 + fStack_444;
          auVar310._0_4_ =
               fVar253 * (float)local_120._0_4_ +
               (float)local_a0._0_4_ * fVar273 + (float)local_e0._0_4_ * fVar149 +
               (float)local_180._0_4_ * (float)local_740._0_4_;
          auVar310._4_4_ =
               fVar263 * (float)local_120._4_4_ +
               (float)local_a0._4_4_ * fVar283 + (float)local_e0._4_4_ * fVar169 +
               (float)local_180._4_4_ * (float)local_740._4_4_;
          auVar310._8_4_ =
               fVar265 * fStack_118 + fStack_98 * fVar284 + fStack_d8 * fVar172 +
               fStack_178 * fStack_738;
          auVar310._12_4_ =
               fVar267 * fStack_114 + fStack_94 * fVar285 + fStack_d4 * fVar175 +
               fStack_174 * fStack_734;
          auVar310._16_4_ =
               fVar269 * fStack_110 + fStack_90 * fVar286 + fStack_d0 * fVar207 +
               fStack_170 * fStack_730;
          auVar310._20_4_ =
               fVar270 * fStack_10c + fStack_8c * fVar287 + fStack_cc * fVar178 +
               fStack_16c * fStack_72c;
          auVar310._24_4_ =
               fVar271 * fStack_108 + fStack_88 * fVar288 + fStack_c8 * fVar180 +
               fStack_168 * fStack_728;
          auVar310._28_4_ = fStack_444 + fStack_444 + fStack_c4 + fVar272;
          auVar164 = vsubps_avx(auVar298,_local_880);
          auVar339 = vsubps_avx(auVar384,auVar243);
          fVar183 = auVar164._0_4_;
          fVar300 = auVar164._4_4_;
          auVar70._4_4_ = fVar300 * auVar243._4_4_;
          auVar70._0_4_ = fVar183 * auVar243._0_4_;
          fVar329 = auVar164._8_4_;
          auVar70._8_4_ = fVar329 * auVar243._8_4_;
          fVar330 = auVar164._12_4_;
          auVar70._12_4_ = fVar330 * auVar243._12_4_;
          fVar331 = auVar164._16_4_;
          auVar70._16_4_ = fVar331 * auVar243._16_4_;
          fVar332 = auVar164._20_4_;
          auVar70._20_4_ = fVar332 * auVar243._20_4_;
          fVar352 = auVar164._24_4_;
          auVar70._24_4_ = fVar352 * auVar243._24_4_;
          auVar70._28_4_ = fVar272;
          fVar272 = auVar339._0_4_;
          fVar341 = auVar339._4_4_;
          auVar71._4_4_ = fVar341 * (float)local_880._4_4_;
          auVar71._0_4_ = fVar272 * (float)local_880._0_4_;
          fVar342 = auVar339._8_4_;
          auVar71._8_4_ = fVar342 * fStack_878;
          fVar343 = auVar339._12_4_;
          auVar71._12_4_ = fVar343 * fStack_874;
          fVar319 = auVar339._16_4_;
          auVar71._16_4_ = fVar319 * fStack_870;
          fVar321 = auVar339._20_4_;
          auVar71._20_4_ = fVar321 * fStack_86c;
          fVar323 = auVar339._24_4_;
          auVar71._24_4_ = fVar323 * fStack_868;
          auVar71._28_4_ = fStack_864;
          auVar26 = vsubps_avx(auVar70,auVar71);
          auVar123._4_4_ = fVar170;
          auVar123._0_4_ = fVar150;
          auVar123._8_4_ = fVar173;
          auVar123._12_4_ = fVar176;
          auVar123._16_4_ = fVar177;
          auVar123._20_4_ = fVar179;
          auVar123._24_4_ = fVar181;
          auVar123._28_4_ = fVar182;
          auVar244 = ZEXT3264(auVar123);
          auVar153 = vmaxps_avx(auVar123,auVar310);
          auVar72._4_4_ = auVar153._4_4_ * auVar153._4_4_ * (fVar300 * fVar300 + fVar341 * fVar341);
          auVar72._0_4_ = auVar153._0_4_ * auVar153._0_4_ * (fVar183 * fVar183 + fVar272 * fVar272);
          auVar72._8_4_ = auVar153._8_4_ * auVar153._8_4_ * (fVar329 * fVar329 + fVar342 * fVar342);
          auVar72._12_4_ =
               auVar153._12_4_ * auVar153._12_4_ * (fVar330 * fVar330 + fVar343 * fVar343);
          auVar72._16_4_ =
               auVar153._16_4_ * auVar153._16_4_ * (fVar331 * fVar331 + fVar319 * fVar319);
          auVar72._20_4_ =
               auVar153._20_4_ * auVar153._20_4_ * (fVar332 * fVar332 + fVar321 * fVar321);
          auVar72._24_4_ =
               auVar153._24_4_ * auVar153._24_4_ * (fVar352 * fVar352 + fVar323 * fVar323);
          auVar72._28_4_ = auVar298._28_4_ + fStack_864;
          auVar73._4_4_ = auVar26._4_4_ * auVar26._4_4_;
          auVar73._0_4_ = auVar26._0_4_ * auVar26._0_4_;
          auVar73._8_4_ = auVar26._8_4_ * auVar26._8_4_;
          auVar73._12_4_ = auVar26._12_4_ * auVar26._12_4_;
          auVar73._16_4_ = auVar26._16_4_ * auVar26._16_4_;
          auVar73._20_4_ = auVar26._20_4_ * auVar26._20_4_;
          auVar73._24_4_ = auVar26._24_4_ * auVar26._24_4_;
          auVar73._28_4_ = auVar26._28_4_;
          auVar153 = vcmpps_avx(auVar73,auVar72,2);
          local_300 = (uint)lVar143;
          auVar215 = vpshufd_avx(ZEXT416(local_300),0);
          auVar234 = vpor_avx(auVar215,_DAT_01ff0cf0);
          auVar215 = vpor_avx(auVar215,_DAT_02020ea0);
          auVar234 = vpcmpgtd_avx(_local_500,auVar234);
          auVar215 = vpcmpgtd_avx(_local_500,auVar215);
          local_1a0._16_16_ = auVar215;
          local_1a0._0_16_ = auVar234;
          auVar262 = ZEXT3264(local_1a0);
          auVar26 = local_1a0 & auVar153;
          if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar26 >> 0x7f,0) == '\0') &&
                (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar26 >> 0xbf,0) == '\0') &&
              (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar26[0x1f]) {
            auVar340 = ZEXT3264(local_680);
            _local_740 = *pauVar4;
          }
          else {
            local_7c0 = (float)local_740._0_4_ * (float)local_140._0_4_ +
                        (float)local_4e0._0_4_ * fVar253 +
                        (float)local_c0._0_4_ * fVar273 + (float)local_620._0_4_ * fVar149;
            fStack_7bc = (float)local_740._4_4_ * (float)local_140._4_4_ +
                         (float)local_4e0._4_4_ * fVar263 +
                         (float)local_c0._4_4_ * fVar283 + (float)local_620._4_4_ * fVar169;
            fStack_7b8 = fStack_738 * fStack_138 +
                         fStack_4d8 * fVar265 + fStack_b8 * fVar284 + fStack_618 * fVar172;
            fStack_7b4 = fStack_734 * fStack_134 +
                         fStack_4d4 * fVar267 + fStack_b4 * fVar285 + fStack_614 * fVar175;
            fStack_7b0 = fStack_730 * fStack_130 +
                         fStack_4d0 * fVar269 + fStack_b0 * fVar286 + fStack_610 * fVar207;
            fStack_7ac = fStack_72c * fStack_12c +
                         fStack_4cc * fVar270 + fStack_ac * fVar287 + fStack_60c * fVar178;
            fStack_7a8 = fStack_728 * fStack_128 +
                         fStack_4c8 * fVar271 + fStack_a8 * fVar288 + fStack_608 * fVar180;
            fStack_7a4 = fStack_724 + local_680._28_4_ + pfVar1[7] + 0.0;
            local_780._0_4_ = auVar137._0_4_;
            local_780._4_4_ = auVar137._4_4_;
            uStack_778._0_4_ = auVar137._8_4_;
            uStack_778._4_4_ = auVar137._12_4_;
            auStack_770._0_4_ = auVar137._16_4_;
            auStack_770._4_4_ = auVar137._20_4_;
            fStack_768 = auVar137._24_4_;
            local_640._0_4_ = auVar136._0_4_;
            local_640._4_4_ = auVar136._4_4_;
            fStack_638 = auVar136._8_4_;
            fStack_634 = auVar136._12_4_;
            auStack_630._0_4_ = auVar136._16_4_;
            auStack_630._4_4_ = auVar136._20_4_;
            fStack_628 = auVar136._24_4_;
            pfVar2 = (float *)(lVar147 + 0x2228dfc + lVar143 * 4);
            fVar253 = *pfVar2;
            fVar263 = pfVar2[1];
            fVar265 = pfVar2[2];
            fVar267 = pfVar2[3];
            fVar269 = pfVar2[4];
            fVar270 = pfVar2[5];
            fVar271 = pfVar2[6];
            pfVar5 = (float *)(lVar147 + 0x2229280 + lVar143 * 4);
            fVar273 = *pfVar5;
            fVar283 = pfVar5[1];
            fVar284 = pfVar5[2];
            fVar285 = pfVar5[3];
            fVar286 = pfVar5[4];
            fVar287 = pfVar5[5];
            fVar288 = pfVar5[6];
            pfVar6 = (float *)(lVar147 + 0x2228978 + lVar143 * 4);
            fVar149 = *pfVar6;
            fVar169 = pfVar6[1];
            fVar172 = pfVar6[2];
            fVar175 = pfVar6[3];
            fVar207 = pfVar6[4];
            fVar178 = pfVar6[5];
            fVar180 = pfVar6[6];
            fVar183 = pfVar2[7] + pfVar5[7];
            fStack_1a4 = pfVar5[7] + auVar384._28_4_ + 0.0;
            fVar300 = auVar384._28_4_ + fStack_404 + auVar384._28_4_ + 0.0;
            pfVar2 = (float *)(lVar147 + 0x22284f4 + lVar143 * 4);
            fVar272 = *pfVar2;
            fVar341 = pfVar2[1];
            fVar342 = pfVar2[2];
            fVar343 = pfVar2[3];
            fVar319 = pfVar2[4];
            fVar321 = pfVar2[5];
            fVar323 = pfVar2[6];
            local_660 = (float)local_100._0_4_ * fVar272 +
                        fVar149 * (float)local_480._0_4_ +
                        fVar230 * fVar253 + (float)local_440._0_4_ * fVar273;
            fStack_65c = (float)local_100._4_4_ * fVar341 +
                         fVar169 * (float)local_480._4_4_ +
                         fVar245 * fVar263 + (float)local_440._4_4_ * fVar283;
            fStack_658 = fStack_f8 * fVar342 +
                         fVar172 * fStack_478 + fVar246 * fVar265 + fStack_438 * fVar284;
            fStack_654 = fStack_f4 * fVar343 +
                         fVar175 * fStack_474 + fVar247 * fVar267 + fStack_434 * fVar285;
            fStack_650 = fStack_f0 * fVar319 +
                         fVar207 * fStack_470 + fVar248 * fVar269 + fStack_430 * fVar286;
            fStack_64c = fStack_ec * fVar321 +
                         fVar178 * fStack_46c + fVar249 * fVar270 + fStack_42c * fVar287;
            fStack_648 = fStack_e8 * fVar323 +
                         fVar180 * fStack_468 + fVar251 * fVar271 + fStack_428 * fVar288;
            fStack_644 = fVar183 + fStack_1a4;
            local_1c0 = fVar272 * (float)local_420._0_4_ +
                        (float)local_4c0._0_4_ * fVar253 + (float)local_460._0_4_ * fVar273 +
                        (float)local_6a0._0_4_ * fVar149;
            fStack_1bc = fVar341 * (float)local_420._4_4_ +
                         (float)local_4c0._4_4_ * fVar263 + (float)local_460._4_4_ * fVar283 +
                         (float)local_6a0._4_4_ * fVar169;
            fStack_1b8 = fVar342 * fStack_418 +
                         fStack_4b8 * fVar265 + fStack_458 * fVar284 + fStack_698 * fVar172;
            fStack_1b4 = fVar343 * fStack_414 +
                         fStack_4b4 * fVar267 + fStack_454 * fVar285 + fStack_694 * fVar175;
            fStack_1b0 = fVar319 * fStack_410 +
                         fStack_4b0 * fVar269 + fStack_450 * fVar286 + fStack_690 * fVar207;
            fStack_1ac = fVar321 * fStack_40c +
                         fStack_4ac * fVar270 + fStack_44c * fVar287 + fStack_68c * fVar178;
            fStack_1a8 = fVar323 * fStack_408 +
                         fStack_4a8 * fVar271 + fStack_448 * fVar288 + fStack_688 * fVar180;
            fStack_1a4 = fStack_1a4 + fVar300;
            auVar371._0_4_ =
                 fVar149 * (float)local_4e0._0_4_ +
                 (float)local_c0._0_4_ * fVar253 + (float)local_620._0_4_ * fVar273 +
                 fVar272 * (float)local_140._0_4_;
            auVar371._4_4_ =
                 fVar169 * (float)local_4e0._4_4_ +
                 (float)local_c0._4_4_ * fVar263 + (float)local_620._4_4_ * fVar283 +
                 fVar341 * (float)local_140._4_4_;
            auVar371._8_4_ =
                 fVar172 * fStack_4d8 + fStack_b8 * fVar265 + fStack_618 * fVar284 +
                 fVar342 * fStack_138;
            auVar371._12_4_ =
                 fVar175 * fStack_4d4 + fStack_b4 * fVar267 + fStack_614 * fVar285 +
                 fVar343 * fStack_134;
            auVar371._16_4_ =
                 fVar207 * fStack_4d0 + fStack_b0 * fVar269 + fStack_610 * fVar286 +
                 fVar319 * fStack_130;
            auVar371._20_4_ =
                 fVar178 * fStack_4cc + fStack_ac * fVar270 + fStack_60c * fVar287 +
                 fVar321 * fStack_12c;
            auVar371._24_4_ =
                 fVar180 * fStack_4c8 + fStack_a8 * fVar271 + fStack_608 * fVar288 +
                 fVar323 * fStack_128;
            auVar371._28_4_ = pfVar6[7] + fVar183 + fVar300;
            pfVar2 = (float *)(lVar147 + 0x222b21c + lVar143 * 4);
            fVar253 = *pfVar2;
            fVar263 = pfVar2[1];
            fVar265 = pfVar2[2];
            fVar267 = pfVar2[3];
            fVar269 = pfVar2[4];
            fVar270 = pfVar2[5];
            fVar271 = pfVar2[6];
            pfVar5 = (float *)(lVar147 + 0x222b6a0 + lVar143 * 4);
            fVar273 = *pfVar5;
            fVar283 = pfVar5[1];
            fVar284 = pfVar5[2];
            fVar285 = pfVar5[3];
            fVar286 = pfVar5[4];
            fVar287 = pfVar5[5];
            fVar288 = pfVar5[6];
            pfVar6 = (float *)(lVar147 + 0x222ad98 + lVar143 * 4);
            fVar149 = *pfVar6;
            fVar169 = pfVar6[1];
            fVar172 = pfVar6[2];
            fVar175 = pfVar6[3];
            fVar207 = pfVar6[4];
            fVar178 = pfVar6[5];
            fVar180 = pfVar6[6];
            pfVar7 = (float *)(lVar147 + 0x222a914 + lVar143 * 4);
            fVar272 = *pfVar7;
            fVar341 = pfVar7[1];
            fVar342 = pfVar7[2];
            fVar343 = pfVar7[3];
            fVar319 = pfVar7[4];
            fVar321 = pfVar7[5];
            fVar323 = pfVar7[6];
            auVar326._0_4_ =
                 fVar272 * (float)local_100._0_4_ +
                 fVar149 * (float)local_480._0_4_ +
                 fVar253 * fVar230 + (float)local_440._0_4_ * fVar273;
            auVar326._4_4_ =
                 fVar341 * (float)local_100._4_4_ +
                 fVar169 * (float)local_480._4_4_ +
                 fVar263 * fVar245 + (float)local_440._4_4_ * fVar283;
            auVar326._8_4_ =
                 fVar342 * fStack_f8 +
                 fVar172 * fStack_478 + fVar265 * fVar246 + fStack_438 * fVar284;
            auVar326._12_4_ =
                 fVar343 * fStack_f4 +
                 fVar175 * fStack_474 + fVar267 * fVar247 + fStack_434 * fVar285;
            auVar326._16_4_ =
                 fVar319 * fStack_f0 +
                 fVar207 * fStack_470 + fVar269 * fVar248 + fStack_430 * fVar286;
            auVar326._20_4_ =
                 fVar321 * fStack_ec +
                 fVar178 * fStack_46c + fVar270 * fVar249 + fStack_42c * fVar287;
            auVar326._24_4_ =
                 fVar323 * fStack_e8 +
                 fVar180 * fStack_468 + fVar271 * fVar251 + fStack_428 * fVar288;
            auVar326._28_4_ = fStack_e4 + fStack_e4 + fStack_424 + fStack_e4;
            auVar359._0_4_ =
                 fVar272 * (float)local_420._0_4_ +
                 (float)local_6a0._0_4_ * fVar149 +
                 (float)local_4c0._0_4_ * fVar253 + fVar273 * (float)local_460._0_4_;
            auVar359._4_4_ =
                 fVar341 * (float)local_420._4_4_ +
                 (float)local_6a0._4_4_ * fVar169 +
                 (float)local_4c0._4_4_ * fVar263 + fVar283 * (float)local_460._4_4_;
            auVar359._8_4_ =
                 fVar342 * fStack_418 +
                 fStack_698 * fVar172 + fStack_4b8 * fVar265 + fVar284 * fStack_458;
            auVar359._12_4_ =
                 fVar343 * fStack_414 +
                 fStack_694 * fVar175 + fStack_4b4 * fVar267 + fVar285 * fStack_454;
            auVar359._16_4_ =
                 fVar319 * fStack_410 +
                 fStack_690 * fVar207 + fStack_4b0 * fVar269 + fVar286 * fStack_450;
            auVar359._20_4_ =
                 fVar321 * fStack_40c +
                 fStack_68c * fVar178 + fStack_4ac * fVar270 + fVar287 * fStack_44c;
            auVar359._24_4_ =
                 fVar323 * fStack_408 +
                 fStack_688 * fVar180 + fStack_4a8 * fVar271 + fVar288 * fStack_448;
            auVar359._28_4_ = fStack_e4 + fStack_e4 + auVar153._28_4_ + fStack_e4;
            auVar282._8_4_ = 0x7fffffff;
            auVar282._0_8_ = 0x7fffffff7fffffff;
            auVar282._12_4_ = 0x7fffffff;
            auVar282._16_4_ = 0x7fffffff;
            auVar282._20_4_ = 0x7fffffff;
            auVar282._24_4_ = 0x7fffffff;
            auVar282._28_4_ = 0x7fffffff;
            auVar134._4_4_ = fStack_65c;
            auVar134._0_4_ = local_660;
            auVar134._8_4_ = fStack_658;
            auVar134._12_4_ = fStack_654;
            auVar134._16_4_ = fStack_650;
            auVar134._20_4_ = fStack_64c;
            auVar134._24_4_ = fStack_648;
            auVar134._28_4_ = fStack_644;
            auVar26 = vandps_avx(auVar134,auVar282);
            auVar135._4_4_ = fStack_1bc;
            auVar135._0_4_ = local_1c0;
            auVar135._8_4_ = fStack_1b8;
            auVar135._12_4_ = fStack_1b4;
            auVar135._16_4_ = fStack_1b0;
            auVar135._20_4_ = fStack_1ac;
            auVar135._24_4_ = fStack_1a8;
            auVar135._28_4_ = fStack_1a4;
            auVar281 = vandps_avx(auVar135,auVar282);
            auVar281 = vmaxps_avx(auVar26,auVar281);
            auVar26 = vandps_avx(auVar371,auVar282);
            auVar281 = vmaxps_avx(auVar281,auVar26);
            auVar281 = vcmpps_avx(auVar281,_local_520,1);
            auVar160 = vblendvps_avx(auVar134,auVar164,auVar281);
            auVar161._0_4_ =
                 fVar272 * (float)local_140._0_4_ +
                 fVar149 * (float)local_4e0._0_4_ +
                 fVar273 * (float)local_620._0_4_ + (float)local_c0._0_4_ * fVar253;
            auVar161._4_4_ =
                 fVar341 * (float)local_140._4_4_ +
                 fVar169 * (float)local_4e0._4_4_ +
                 fVar283 * (float)local_620._4_4_ + (float)local_c0._4_4_ * fVar263;
            auVar161._8_4_ =
                 fVar342 * fStack_138 +
                 fVar172 * fStack_4d8 + fVar284 * fStack_618 + fStack_b8 * fVar265;
            auVar161._12_4_ =
                 fVar343 * fStack_134 +
                 fVar175 * fStack_4d4 + fVar285 * fStack_614 + fStack_b4 * fVar267;
            auVar161._16_4_ =
                 fVar319 * fStack_130 +
                 fVar207 * fStack_4d0 + fVar286 * fStack_610 + fStack_b0 * fVar269;
            auVar161._20_4_ =
                 fVar321 * fStack_12c +
                 fVar178 * fStack_4cc + fVar287 * fStack_60c + fStack_ac * fVar270;
            auVar161._24_4_ =
                 fVar323 * fStack_128 +
                 fVar180 * fStack_4c8 + fVar288 * fStack_608 + fStack_a8 * fVar271;
            auVar161._28_4_ = auVar26._28_4_ + pfVar6[7] + pfVar5[7] + pfVar2[7];
            auVar27 = vblendvps_avx(auVar135,auVar339,auVar281);
            auVar26 = vandps_avx(auVar326,auVar282);
            auVar281 = vandps_avx(auVar359,auVar282);
            auVar28 = vmaxps_avx(auVar26,auVar281);
            auVar26 = vandps_avx(auVar161,auVar282);
            auVar26 = vmaxps_avx(auVar28,auVar26);
            local_760._0_4_ = auVar138._0_4_;
            local_760._4_4_ = auVar138._4_4_;
            uStack_758._0_4_ = auVar138._8_4_;
            uStack_758._4_4_ = auVar138._12_4_;
            auStack_750._0_4_ = auVar138._16_4_;
            auStack_750._4_4_ = auVar138._20_4_;
            fStack_748 = auVar138._24_4_;
            auVar281 = vcmpps_avx(auVar26,_local_520,1);
            auVar26 = vblendvps_avx(auVar326,auVar164,auVar281);
            auVar162._0_4_ =
                 (float)local_140._0_4_ * (float)local_760._0_4_ +
                 (float)local_4e0._0_4_ * (float)local_780._0_4_ +
                 (float)local_c0._0_4_ * (float)local_640._0_4_ + (float)local_620._0_4_ * fVar317;
            auVar162._4_4_ =
                 (float)local_140._4_4_ * (float)local_760._4_4_ +
                 (float)local_4e0._4_4_ * (float)local_780._4_4_ +
                 (float)local_c0._4_4_ * (float)local_640._4_4_ + (float)local_620._4_4_ * fVar318;
            auVar162._8_4_ =
                 fStack_138 * (float)uStack_758 +
                 fStack_4d8 * (float)uStack_778 + fStack_b8 * fStack_638 + fStack_618 * fVar250;
            auVar162._12_4_ =
                 fStack_134 * uStack_758._4_4_ +
                 fStack_4d4 * uStack_778._4_4_ + fStack_b4 * fStack_634 + fStack_614 * fVar289;
            auVar162._16_4_ =
                 fStack_130 * (float)auStack_750._0_4_ +
                 fStack_4d0 * (float)auStack_770._0_4_ +
                 fStack_b0 * (float)auStack_630._0_4_ + fStack_610 * fVar320;
            auVar162._20_4_ =
                 fStack_12c * (float)auStack_750._4_4_ +
                 fStack_4cc * (float)auStack_770._4_4_ +
                 fStack_ac * (float)auStack_630._4_4_ + fStack_60c * fVar322;
            auVar162._24_4_ =
                 fStack_128 * fStack_748 +
                 fStack_4c8 * fStack_768 + fStack_a8 * fStack_628 + fStack_608 * fVar252;
            auVar162._28_4_ = auVar28._28_4_ + fStack_7a4 + pfVar1[7] + 0.0;
            auVar281 = vblendvps_avx(auVar359,auVar339,auVar281);
            fVar272 = auVar160._0_4_;
            fVar341 = auVar160._4_4_;
            fVar342 = auVar160._8_4_;
            fVar343 = auVar160._12_4_;
            fVar319 = auVar160._16_4_;
            fVar321 = auVar160._20_4_;
            fVar323 = auVar160._24_4_;
            fVar183 = auVar160._28_4_;
            fVar273 = auVar26._0_4_;
            fVar284 = auVar26._4_4_;
            fVar286 = auVar26._8_4_;
            fVar288 = auVar26._12_4_;
            fVar318 = auVar26._16_4_;
            fVar289 = auVar26._20_4_;
            fVar322 = auVar26._24_4_;
            fVar230 = auVar27._0_4_;
            fVar246 = auVar27._4_4_;
            fVar248 = auVar27._8_4_;
            fVar251 = auVar27._12_4_;
            fVar263 = auVar27._16_4_;
            fVar267 = auVar27._20_4_;
            fVar270 = auVar27._24_4_;
            auVar337._0_4_ = fVar230 * fVar230 + fVar272 * fVar272;
            auVar337._4_4_ = fVar246 * fVar246 + fVar341 * fVar341;
            auVar337._8_4_ = fVar248 * fVar248 + fVar342 * fVar342;
            auVar337._12_4_ = fVar251 * fVar251 + fVar343 * fVar343;
            auVar337._16_4_ = fVar263 * fVar263 + fVar319 * fVar319;
            auVar337._20_4_ = fVar267 * fVar267 + fVar321 * fVar321;
            auVar337._24_4_ = fVar270 * fVar270 + fVar323 * fVar323;
            auVar337._28_4_ = auVar164._28_4_ + auVar339._28_4_;
            auVar164 = vrsqrtps_avx(auVar337);
            fVar245 = auVar164._0_4_;
            fVar247 = auVar164._4_4_;
            auVar74._4_4_ = fVar247 * 1.5;
            auVar74._0_4_ = fVar245 * 1.5;
            fVar249 = auVar164._8_4_;
            auVar74._8_4_ = fVar249 * 1.5;
            fVar253 = auVar164._12_4_;
            auVar74._12_4_ = fVar253 * 1.5;
            fVar265 = auVar164._16_4_;
            auVar74._16_4_ = fVar265 * 1.5;
            fVar269 = auVar164._20_4_;
            auVar74._20_4_ = fVar269 * 1.5;
            fVar271 = auVar164._24_4_;
            auVar74._24_4_ = fVar271 * 1.5;
            auVar74._28_4_ = auVar359._28_4_;
            auVar75._4_4_ = fVar247 * fVar247 * fVar247 * auVar337._4_4_ * 0.5;
            auVar75._0_4_ = fVar245 * fVar245 * fVar245 * auVar337._0_4_ * 0.5;
            auVar75._8_4_ = fVar249 * fVar249 * fVar249 * auVar337._8_4_ * 0.5;
            auVar75._12_4_ = fVar253 * fVar253 * fVar253 * auVar337._12_4_ * 0.5;
            auVar75._16_4_ = fVar265 * fVar265 * fVar265 * auVar337._16_4_ * 0.5;
            auVar75._20_4_ = fVar269 * fVar269 * fVar269 * auVar337._20_4_ * 0.5;
            auVar75._24_4_ = fVar271 * fVar271 * fVar271 * auVar337._24_4_ * 0.5;
            auVar75._28_4_ = auVar337._28_4_;
            auVar339 = vsubps_avx(auVar74,auVar75);
            fVar149 = auVar339._0_4_;
            fVar169 = auVar339._4_4_;
            fVar172 = auVar339._8_4_;
            fVar175 = auVar339._12_4_;
            fVar207 = auVar339._16_4_;
            fVar178 = auVar339._20_4_;
            fVar180 = auVar339._24_4_;
            fVar245 = auVar281._0_4_;
            fVar247 = auVar281._4_4_;
            fVar249 = auVar281._8_4_;
            fVar253 = auVar281._12_4_;
            fVar265 = auVar281._16_4_;
            fVar269 = auVar281._20_4_;
            fVar271 = auVar281._24_4_;
            auVar316._0_4_ = fVar245 * fVar245 + fVar273 * fVar273;
            auVar316._4_4_ = fVar247 * fVar247 + fVar284 * fVar284;
            auVar316._8_4_ = fVar249 * fVar249 + fVar286 * fVar286;
            auVar316._12_4_ = fVar253 * fVar253 + fVar288 * fVar288;
            auVar316._16_4_ = fVar265 * fVar265 + fVar318 * fVar318;
            auVar316._20_4_ = fVar269 * fVar269 + fVar289 * fVar289;
            auVar316._24_4_ = fVar271 * fVar271 + fVar322 * fVar322;
            auVar316._28_4_ = auVar164._28_4_ + auVar26._28_4_;
            auVar164 = vrsqrtps_avx(auVar316);
            fVar283 = auVar164._0_4_;
            fVar285 = auVar164._4_4_;
            auVar76._4_4_ = fVar285 * 1.5;
            auVar76._0_4_ = fVar283 * 1.5;
            fVar287 = auVar164._8_4_;
            auVar76._8_4_ = fVar287 * 1.5;
            fVar317 = auVar164._12_4_;
            auVar76._12_4_ = fVar317 * 1.5;
            fVar250 = auVar164._16_4_;
            auVar76._16_4_ = fVar250 * 1.5;
            fVar320 = auVar164._20_4_;
            auVar76._20_4_ = fVar320 * 1.5;
            fVar252 = auVar164._24_4_;
            auVar76._24_4_ = fVar252 * 1.5;
            auVar76._28_4_ = auVar359._28_4_;
            auVar77._4_4_ = fVar285 * fVar285 * fVar285 * auVar316._4_4_ * 0.5;
            auVar77._0_4_ = fVar283 * fVar283 * fVar283 * auVar316._0_4_ * 0.5;
            auVar77._8_4_ = fVar287 * fVar287 * fVar287 * auVar316._8_4_ * 0.5;
            auVar77._12_4_ = fVar317 * fVar317 * fVar317 * auVar316._12_4_ * 0.5;
            auVar77._16_4_ = fVar250 * fVar250 * fVar250 * auVar316._16_4_ * 0.5;
            auVar77._20_4_ = fVar320 * fVar320 * fVar320 * auVar316._20_4_ * 0.5;
            auVar77._24_4_ = fVar252 * fVar252 * fVar252 * auVar316._24_4_ * 0.5;
            auVar77._28_4_ = auVar316._28_4_;
            auVar339 = vsubps_avx(auVar76,auVar77);
            fVar283 = auVar339._0_4_;
            fVar285 = auVar339._4_4_;
            fVar287 = auVar339._8_4_;
            fVar317 = auVar339._12_4_;
            fVar250 = auVar339._16_4_;
            fVar320 = auVar339._20_4_;
            fVar252 = auVar339._24_4_;
            fVar230 = fVar150 * fVar149 * fVar230;
            fVar246 = fVar170 * fVar169 * fVar246;
            auVar78._4_4_ = fVar246;
            auVar78._0_4_ = fVar230;
            fVar248 = fVar173 * fVar172 * fVar248;
            auVar78._8_4_ = fVar248;
            fVar251 = fVar176 * fVar175 * fVar251;
            auVar78._12_4_ = fVar251;
            fVar263 = fVar177 * fVar207 * fVar263;
            auVar78._16_4_ = fVar263;
            fVar267 = fVar179 * fVar178 * fVar267;
            auVar78._20_4_ = fVar267;
            fVar270 = fVar181 * fVar180 * fVar270;
            auVar78._24_4_ = fVar270;
            auVar78._28_4_ = auVar164._28_4_;
            local_760._4_4_ = fVar246 + (float)local_880._4_4_;
            local_760._0_4_ = fVar230 + (float)local_880._0_4_;
            uStack_758._0_4_ = fVar248 + fStack_878;
            uStack_758._4_4_ = fVar251 + fStack_874;
            auStack_750._0_4_ = fVar263 + fStack_870;
            auStack_750._4_4_ = fVar267 + fStack_86c;
            fStack_748 = fVar270 + fStack_868;
            fStack_744 = auVar164._28_4_ + fStack_864;
            local_7a0 = fVar150 * fVar149 * -fVar272;
            fStack_79c = fVar170 * fVar169 * -fVar341;
            auVar79._4_4_ = fStack_79c;
            auVar79._0_4_ = local_7a0;
            fStack_798 = fVar173 * fVar172 * -fVar342;
            auVar79._8_4_ = fStack_798;
            fStack_794 = fVar176 * fVar175 * -fVar343;
            auVar79._12_4_ = fStack_794;
            fStack_790 = fVar177 * fVar207 * -fVar319;
            auVar79._16_4_ = fStack_790;
            fStack_78c = fVar179 * fVar178 * -fVar321;
            auVar79._20_4_ = fStack_78c;
            fStack_788 = fVar181 * fVar180 * -fVar323;
            auVar79._24_4_ = fStack_788;
            auVar79._28_4_ = -fVar183;
            local_7a0 = auVar243._0_4_ + local_7a0;
            fStack_79c = auVar243._4_4_ + fStack_79c;
            fStack_798 = auVar243._8_4_ + fStack_798;
            fStack_794 = auVar243._12_4_ + fStack_794;
            fStack_790 = auVar243._16_4_ + fStack_790;
            fStack_78c = auVar243._20_4_ + fStack_78c;
            fStack_788 = auVar243._24_4_ + fStack_788;
            fStack_784 = auVar243._28_4_ + -fVar183;
            fVar230 = fVar149 * 0.0 * fVar150;
            fVar246 = fVar169 * 0.0 * fVar170;
            auVar80._4_4_ = fVar246;
            auVar80._0_4_ = fVar230;
            fVar248 = fVar172 * 0.0 * fVar173;
            auVar80._8_4_ = fVar248;
            fVar251 = fVar175 * 0.0 * fVar176;
            auVar80._12_4_ = fVar251;
            fVar263 = fVar207 * 0.0 * fVar177;
            auVar80._16_4_ = fVar263;
            fVar267 = fVar178 * 0.0 * fVar179;
            auVar80._20_4_ = fVar267;
            fVar270 = fVar180 * 0.0 * fVar181;
            auVar80._24_4_ = fVar270;
            auVar80._28_4_ = fVar183;
            auVar164 = vsubps_avx(_local_880,auVar78);
            auVar392._0_4_ = fVar230 + auVar162._0_4_;
            auVar392._4_4_ = fVar246 + auVar162._4_4_;
            auVar392._8_4_ = fVar248 + auVar162._8_4_;
            auVar392._12_4_ = fVar251 + auVar162._12_4_;
            auVar392._16_4_ = fVar263 + auVar162._16_4_;
            auVar392._20_4_ = fVar267 + auVar162._20_4_;
            auVar392._24_4_ = fVar270 + auVar162._24_4_;
            auVar392._28_4_ = fVar183 + auVar162._28_4_;
            fVar230 = auVar310._0_4_ * fVar283 * fVar245;
            fVar245 = auVar310._4_4_ * fVar285 * fVar247;
            auVar81._4_4_ = fVar245;
            auVar81._0_4_ = fVar230;
            fVar246 = auVar310._8_4_ * fVar287 * fVar249;
            auVar81._8_4_ = fVar246;
            fVar247 = auVar310._12_4_ * fVar317 * fVar253;
            auVar81._12_4_ = fVar247;
            fVar248 = auVar310._16_4_ * fVar250 * fVar265;
            auVar81._16_4_ = fVar248;
            fVar249 = auVar310._20_4_ * fVar320 * fVar269;
            auVar81._20_4_ = fVar249;
            fVar251 = auVar310._24_4_ * fVar252 * fVar271;
            auVar81._24_4_ = fVar251;
            auVar81._28_4_ = fStack_864;
            auVar155 = vsubps_avx(auVar243,auVar79);
            auVar372._0_4_ = auVar298._0_4_ + fVar230;
            auVar372._4_4_ = auVar298._4_4_ + fVar245;
            auVar372._8_4_ = auVar298._8_4_ + fVar246;
            auVar372._12_4_ = auVar298._12_4_ + fVar247;
            auVar372._16_4_ = auVar298._16_4_ + fVar248;
            auVar372._20_4_ = auVar298._20_4_ + fVar249;
            auVar372._24_4_ = auVar298._24_4_ + fVar251;
            auVar372._28_4_ = auVar298._28_4_ + fStack_864;
            fVar230 = fVar283 * -fVar273 * auVar310._0_4_;
            fVar245 = fVar285 * -fVar284 * auVar310._4_4_;
            auVar82._4_4_ = fVar245;
            auVar82._0_4_ = fVar230;
            fVar246 = fVar287 * -fVar286 * auVar310._8_4_;
            auVar82._8_4_ = fVar246;
            fVar247 = fVar317 * -fVar288 * auVar310._12_4_;
            auVar82._12_4_ = fVar247;
            fVar248 = fVar250 * -fVar318 * auVar310._16_4_;
            auVar82._16_4_ = fVar248;
            fVar249 = fVar320 * -fVar289 * auVar310._20_4_;
            auVar82._20_4_ = fVar249;
            fVar251 = fVar252 * -fVar322 * auVar310._24_4_;
            auVar82._24_4_ = fVar251;
            auVar82._28_4_ = fVar182;
            auVar191 = vsubps_avx(auVar162,auVar80);
            auVar260._0_4_ = auVar384._0_4_ + fVar230;
            auVar260._4_4_ = auVar384._4_4_ + fVar245;
            auVar260._8_4_ = auVar384._8_4_ + fVar246;
            auVar260._12_4_ = auVar384._12_4_ + fVar247;
            auVar260._16_4_ = auVar384._16_4_ + fVar248;
            auVar260._20_4_ = auVar384._20_4_ + fVar249;
            auVar260._24_4_ = auVar384._24_4_ + fVar251;
            auVar260._28_4_ = auVar384._28_4_ + fVar182;
            fVar230 = fVar283 * 0.0 * auVar310._0_4_;
            fVar245 = fVar285 * 0.0 * auVar310._4_4_;
            auVar83._4_4_ = fVar245;
            auVar83._0_4_ = fVar230;
            fVar246 = fVar287 * 0.0 * auVar310._8_4_;
            auVar83._8_4_ = fVar246;
            fVar247 = fVar317 * 0.0 * auVar310._12_4_;
            auVar83._12_4_ = fVar247;
            fVar248 = fVar250 * 0.0 * auVar310._16_4_;
            auVar83._16_4_ = fVar248;
            fVar249 = fVar320 * 0.0 * auVar310._20_4_;
            auVar83._20_4_ = fVar249;
            fVar251 = fVar252 * 0.0 * auVar310._24_4_;
            auVar83._24_4_ = fVar251;
            auVar83._28_4_ = auVar162._28_4_;
            auVar26 = vsubps_avx(auVar298,auVar81);
            auVar130._4_4_ = fStack_7bc;
            auVar130._0_4_ = local_7c0;
            auVar130._8_4_ = fStack_7b8;
            auVar130._12_4_ = fStack_7b4;
            auVar130._16_4_ = fStack_7b0;
            auVar130._20_4_ = fStack_7ac;
            auVar130._24_4_ = fStack_7a8;
            auVar130._28_4_ = fStack_7a4;
            auVar327._0_4_ = local_7c0 + fVar230;
            auVar327._4_4_ = fStack_7bc + fVar245;
            auVar327._8_4_ = fStack_7b8 + fVar246;
            auVar327._12_4_ = fStack_7b4 + fVar247;
            auVar327._16_4_ = fStack_7b0 + fVar248;
            auVar327._20_4_ = fStack_7ac + fVar249;
            auVar327._24_4_ = fStack_7a8 + fVar251;
            auVar327._28_4_ = fStack_7a4 + auVar162._28_4_;
            auVar281 = vsubps_avx(auVar384,auVar82);
            auVar160 = vsubps_avx(auVar130,auVar83);
            auVar27 = vsubps_avx(auVar260,auVar155);
            auVar28 = vsubps_avx(auVar327,auVar191);
            auVar84._4_4_ = auVar191._4_4_ * auVar27._4_4_;
            auVar84._0_4_ = auVar191._0_4_ * auVar27._0_4_;
            auVar84._8_4_ = auVar191._8_4_ * auVar27._8_4_;
            auVar84._12_4_ = auVar191._12_4_ * auVar27._12_4_;
            auVar84._16_4_ = auVar191._16_4_ * auVar27._16_4_;
            auVar84._20_4_ = auVar191._20_4_ * auVar27._20_4_;
            auVar84._24_4_ = auVar191._24_4_ * auVar27._24_4_;
            auVar84._28_4_ = auVar359._28_4_;
            auVar85._4_4_ = auVar155._4_4_ * auVar28._4_4_;
            auVar85._0_4_ = auVar155._0_4_ * auVar28._0_4_;
            auVar85._8_4_ = auVar155._8_4_ * auVar28._8_4_;
            auVar85._12_4_ = auVar155._12_4_ * auVar28._12_4_;
            auVar85._16_4_ = auVar155._16_4_ * auVar28._16_4_;
            auVar85._20_4_ = auVar155._20_4_ * auVar28._20_4_;
            auVar85._24_4_ = auVar155._24_4_ * auVar28._24_4_;
            auVar85._28_4_ = fStack_7a4;
            auVar29 = vsubps_avx(auVar85,auVar84);
            auVar86._4_4_ = auVar164._4_4_ * auVar28._4_4_;
            auVar86._0_4_ = auVar164._0_4_ * auVar28._0_4_;
            auVar86._8_4_ = auVar164._8_4_ * auVar28._8_4_;
            auVar86._12_4_ = auVar164._12_4_ * auVar28._12_4_;
            auVar86._16_4_ = auVar164._16_4_ * auVar28._16_4_;
            auVar86._20_4_ = auVar164._20_4_ * auVar28._20_4_;
            auVar86._24_4_ = auVar164._24_4_ * auVar28._24_4_;
            auVar86._28_4_ = auVar28._28_4_;
            auVar28 = vsubps_avx(auVar372,auVar164);
            auVar87._4_4_ = auVar191._4_4_ * auVar28._4_4_;
            auVar87._0_4_ = auVar191._0_4_ * auVar28._0_4_;
            auVar87._8_4_ = auVar191._8_4_ * auVar28._8_4_;
            auVar87._12_4_ = auVar191._12_4_ * auVar28._12_4_;
            auVar87._16_4_ = auVar191._16_4_ * auVar28._16_4_;
            auVar87._20_4_ = auVar191._20_4_ * auVar28._20_4_;
            auVar87._24_4_ = auVar191._24_4_ * auVar28._24_4_;
            auVar87._28_4_ = auVar339._28_4_;
            auVar393 = vsubps_avx(auVar87,auVar86);
            auVar88._4_4_ = auVar155._4_4_ * auVar28._4_4_;
            auVar88._0_4_ = auVar155._0_4_ * auVar28._0_4_;
            auVar88._8_4_ = auVar155._8_4_ * auVar28._8_4_;
            auVar88._12_4_ = auVar155._12_4_ * auVar28._12_4_;
            auVar88._16_4_ = auVar155._16_4_ * auVar28._16_4_;
            auVar88._20_4_ = auVar155._20_4_ * auVar28._20_4_;
            auVar88._24_4_ = auVar155._24_4_ * auVar28._24_4_;
            auVar88._28_4_ = auVar339._28_4_;
            auVar89._4_4_ = auVar164._4_4_ * auVar27._4_4_;
            auVar89._0_4_ = auVar164._0_4_ * auVar27._0_4_;
            auVar89._8_4_ = auVar164._8_4_ * auVar27._8_4_;
            auVar89._12_4_ = auVar164._12_4_ * auVar27._12_4_;
            auVar89._16_4_ = auVar164._16_4_ * auVar27._16_4_;
            auVar89._20_4_ = auVar164._20_4_ * auVar27._20_4_;
            auVar89._24_4_ = auVar164._24_4_ * auVar27._24_4_;
            auVar89._28_4_ = auVar27._28_4_;
            auVar339 = vsubps_avx(auVar89,auVar88);
            auVar198._0_4_ = auVar29._0_4_ * 0.0 + auVar339._0_4_ + auVar393._0_4_ * 0.0;
            auVar198._4_4_ = auVar29._4_4_ * 0.0 + auVar339._4_4_ + auVar393._4_4_ * 0.0;
            auVar198._8_4_ = auVar29._8_4_ * 0.0 + auVar339._8_4_ + auVar393._8_4_ * 0.0;
            auVar198._12_4_ = auVar29._12_4_ * 0.0 + auVar339._12_4_ + auVar393._12_4_ * 0.0;
            auVar198._16_4_ = auVar29._16_4_ * 0.0 + auVar339._16_4_ + auVar393._16_4_ * 0.0;
            auVar198._20_4_ = auVar29._20_4_ * 0.0 + auVar339._20_4_ + auVar393._20_4_ * 0.0;
            auVar198._24_4_ = auVar29._24_4_ * 0.0 + auVar339._24_4_ + auVar393._24_4_ * 0.0;
            auVar198._28_4_ = auVar29._28_4_ + auVar339._28_4_ + auVar393._28_4_;
            auVar154 = vcmpps_avx(auVar198,ZEXT832(0) << 0x20,2);
            auVar339 = vblendvps_avx(auVar26,_local_760,auVar154);
            auVar244 = ZEXT3264(auVar339);
            auVar132._4_4_ = fStack_79c;
            auVar132._0_4_ = local_7a0;
            auVar132._8_4_ = fStack_798;
            auVar132._12_4_ = fStack_794;
            auVar132._16_4_ = fStack_790;
            auVar132._20_4_ = fStack_78c;
            auVar132._24_4_ = fStack_788;
            auVar132._28_4_ = fStack_784;
            auVar26 = vblendvps_avx(auVar281,auVar132,auVar154);
            auVar281 = vblendvps_avx(auVar160,auVar392,auVar154);
            auVar160 = vblendvps_avx(auVar164,auVar372,auVar154);
            auVar27 = vblendvps_avx(auVar155,auVar260,auVar154);
            auVar28 = vblendvps_avx(auVar191,auVar327,auVar154);
            auVar29 = vblendvps_avx(auVar372,auVar164,auVar154);
            auVar393 = vblendvps_avx(auVar260,auVar155,auVar154);
            auVar25 = vblendvps_avx(auVar327,auVar191,auVar154);
            auVar164 = vandps_avx(auVar153,local_1a0);
            auVar29 = vsubps_avx(auVar29,auVar339);
            auVar192 = vsubps_avx(auVar393,auVar26);
            auVar25 = vsubps_avx(auVar25,auVar281);
            auVar193 = vsubps_avx(auVar26,auVar27);
            fVar230 = auVar192._0_4_;
            fVar301 = auVar281._0_4_;
            fVar253 = auVar192._4_4_;
            fVar311 = auVar281._4_4_;
            auVar90._4_4_ = fVar311 * fVar253;
            auVar90._0_4_ = fVar301 * fVar230;
            fVar273 = auVar192._8_4_;
            fVar312 = auVar281._8_4_;
            auVar90._8_4_ = fVar312 * fVar273;
            fVar317 = auVar192._12_4_;
            fVar184 = auVar281._12_4_;
            auVar90._12_4_ = fVar184 * fVar317;
            fVar149 = auVar192._16_4_;
            fVar204 = auVar281._16_4_;
            auVar90._16_4_ = fVar204 * fVar149;
            fVar272 = auVar192._20_4_;
            fVar205 = auVar281._20_4_;
            auVar90._20_4_ = fVar205 * fVar272;
            fVar183 = auVar192._24_4_;
            fVar206 = auVar281._24_4_;
            auVar90._24_4_ = fVar206 * fVar183;
            auVar90._28_4_ = auVar393._28_4_;
            fVar245 = auVar26._0_4_;
            fVar208 = auVar25._0_4_;
            fVar263 = auVar26._4_4_;
            fVar209 = auVar25._4_4_;
            auVar91._4_4_ = fVar209 * fVar263;
            auVar91._0_4_ = fVar208 * fVar245;
            fVar283 = auVar26._8_4_;
            fVar224 = auVar25._8_4_;
            auVar91._8_4_ = fVar224 * fVar283;
            fVar318 = auVar26._12_4_;
            fVar225 = auVar25._12_4_;
            auVar91._12_4_ = fVar225 * fVar318;
            fVar169 = auVar26._16_4_;
            fVar226 = auVar25._16_4_;
            auVar91._16_4_ = fVar226 * fVar169;
            fVar341 = auVar26._20_4_;
            fVar227 = auVar25._20_4_;
            auVar91._20_4_ = fVar227 * fVar341;
            fVar300 = auVar26._24_4_;
            fVar228 = auVar25._24_4_;
            uVar8 = auVar155._28_4_;
            auVar91._24_4_ = fVar228 * fVar300;
            auVar91._28_4_ = uVar8;
            auVar393 = vsubps_avx(auVar91,auVar90);
            fVar246 = auVar339._0_4_;
            fVar265 = auVar339._4_4_;
            auVar92._4_4_ = fVar209 * fVar265;
            auVar92._0_4_ = fVar208 * fVar246;
            fVar284 = auVar339._8_4_;
            auVar92._8_4_ = fVar224 * fVar284;
            fVar250 = auVar339._12_4_;
            auVar92._12_4_ = fVar225 * fVar250;
            fVar172 = auVar339._16_4_;
            auVar92._16_4_ = fVar226 * fVar172;
            fVar342 = auVar339._20_4_;
            auVar92._20_4_ = fVar227 * fVar342;
            fVar329 = auVar339._24_4_;
            auVar92._24_4_ = fVar228 * fVar329;
            auVar92._28_4_ = uVar8;
            fVar247 = auVar29._0_4_;
            fVar267 = auVar29._4_4_;
            auVar93._4_4_ = fVar311 * fVar267;
            auVar93._0_4_ = fVar301 * fVar247;
            fVar285 = auVar29._8_4_;
            auVar93._8_4_ = fVar312 * fVar285;
            fVar289 = auVar29._12_4_;
            auVar93._12_4_ = fVar184 * fVar289;
            fVar175 = auVar29._16_4_;
            auVar93._16_4_ = fVar204 * fVar175;
            fVar343 = auVar29._20_4_;
            auVar93._20_4_ = fVar205 * fVar343;
            fVar330 = auVar29._24_4_;
            auVar93._24_4_ = fVar206 * fVar330;
            auVar93._28_4_ = auVar372._28_4_;
            auVar155 = vsubps_avx(auVar93,auVar92);
            auVar94._4_4_ = fVar263 * fVar267;
            auVar94._0_4_ = fVar245 * fVar247;
            auVar94._8_4_ = fVar283 * fVar285;
            auVar94._12_4_ = fVar318 * fVar289;
            auVar94._16_4_ = fVar169 * fVar175;
            auVar94._20_4_ = fVar341 * fVar343;
            auVar94._24_4_ = fVar300 * fVar330;
            auVar94._28_4_ = uVar8;
            auVar95._4_4_ = fVar265 * fVar253;
            auVar95._0_4_ = fVar246 * fVar230;
            auVar95._8_4_ = fVar284 * fVar273;
            auVar95._12_4_ = fVar250 * fVar317;
            auVar95._16_4_ = fVar172 * fVar149;
            auVar95._20_4_ = fVar342 * fVar272;
            auVar95._24_4_ = fVar329 * fVar183;
            auVar95._28_4_ = auVar191._28_4_;
            auVar191 = vsubps_avx(auVar95,auVar94);
            auVar194 = vsubps_avx(auVar281,auVar28);
            fVar249 = auVar191._28_4_ + auVar155._28_4_;
            auVar338._0_4_ = auVar191._0_4_ + auVar155._0_4_ * 0.0 + auVar393._0_4_ * 0.0;
            auVar338._4_4_ = auVar191._4_4_ + auVar155._4_4_ * 0.0 + auVar393._4_4_ * 0.0;
            auVar338._8_4_ = auVar191._8_4_ + auVar155._8_4_ * 0.0 + auVar393._8_4_ * 0.0;
            auVar338._12_4_ = auVar191._12_4_ + auVar155._12_4_ * 0.0 + auVar393._12_4_ * 0.0;
            auVar338._16_4_ = auVar191._16_4_ + auVar155._16_4_ * 0.0 + auVar393._16_4_ * 0.0;
            auVar338._20_4_ = auVar191._20_4_ + auVar155._20_4_ * 0.0 + auVar393._20_4_ * 0.0;
            auVar338._24_4_ = auVar191._24_4_ + auVar155._24_4_ * 0.0 + auVar393._24_4_ * 0.0;
            auVar338._28_4_ = fVar249 + auVar393._28_4_;
            fVar248 = auVar193._0_4_;
            fVar269 = auVar193._4_4_;
            auVar96._4_4_ = auVar28._4_4_ * fVar269;
            auVar96._0_4_ = auVar28._0_4_ * fVar248;
            fVar286 = auVar193._8_4_;
            auVar96._8_4_ = auVar28._8_4_ * fVar286;
            fVar320 = auVar193._12_4_;
            auVar96._12_4_ = auVar28._12_4_ * fVar320;
            fVar207 = auVar193._16_4_;
            auVar96._16_4_ = auVar28._16_4_ * fVar207;
            fVar319 = auVar193._20_4_;
            auVar96._20_4_ = auVar28._20_4_ * fVar319;
            fVar331 = auVar193._24_4_;
            auVar96._24_4_ = auVar28._24_4_ * fVar331;
            auVar96._28_4_ = fVar249;
            fVar249 = auVar194._0_4_;
            fVar270 = auVar194._4_4_;
            auVar97._4_4_ = auVar27._4_4_ * fVar270;
            auVar97._0_4_ = auVar27._0_4_ * fVar249;
            fVar287 = auVar194._8_4_;
            auVar97._8_4_ = auVar27._8_4_ * fVar287;
            fVar322 = auVar194._12_4_;
            auVar97._12_4_ = auVar27._12_4_ * fVar322;
            fVar178 = auVar194._16_4_;
            auVar97._16_4_ = auVar27._16_4_ * fVar178;
            fVar321 = auVar194._20_4_;
            auVar97._20_4_ = auVar27._20_4_ * fVar321;
            fVar332 = auVar194._24_4_;
            auVar97._24_4_ = auVar27._24_4_ * fVar332;
            auVar97._28_4_ = auVar191._28_4_;
            auVar155 = vsubps_avx(auVar97,auVar96);
            auVar191 = vsubps_avx(auVar339,auVar160);
            fVar251 = auVar191._0_4_;
            fVar271 = auVar191._4_4_;
            auVar98._4_4_ = auVar28._4_4_ * fVar271;
            auVar98._0_4_ = auVar28._0_4_ * fVar251;
            fVar288 = auVar191._8_4_;
            auVar98._8_4_ = auVar28._8_4_ * fVar288;
            fVar252 = auVar191._12_4_;
            auVar98._12_4_ = auVar28._12_4_ * fVar252;
            fVar180 = auVar191._16_4_;
            auVar98._16_4_ = auVar28._16_4_ * fVar180;
            fVar323 = auVar191._20_4_;
            auVar98._20_4_ = auVar28._20_4_ * fVar323;
            fVar352 = auVar191._24_4_;
            auVar98._24_4_ = auVar28._24_4_ * fVar352;
            auVar98._28_4_ = auVar28._28_4_;
            auVar99._4_4_ = fVar270 * auVar160._4_4_;
            auVar99._0_4_ = fVar249 * auVar160._0_4_;
            auVar99._8_4_ = fVar287 * auVar160._8_4_;
            auVar99._12_4_ = fVar322 * auVar160._12_4_;
            auVar99._16_4_ = fVar178 * auVar160._16_4_;
            auVar99._20_4_ = fVar321 * auVar160._20_4_;
            auVar99._24_4_ = fVar332 * auVar160._24_4_;
            auVar99._28_4_ = auVar393._28_4_;
            auVar28 = vsubps_avx(auVar98,auVar99);
            auVar394 = ZEXT1264(ZEXT412(0)) << 0x20;
            auVar100._4_4_ = auVar27._4_4_ * fVar271;
            auVar100._0_4_ = auVar27._0_4_ * fVar251;
            auVar100._8_4_ = auVar27._8_4_ * fVar288;
            auVar100._12_4_ = auVar27._12_4_ * fVar252;
            auVar100._16_4_ = auVar27._16_4_ * fVar180;
            auVar100._20_4_ = auVar27._20_4_ * fVar323;
            auVar100._24_4_ = auVar27._24_4_ * fVar352;
            auVar100._28_4_ = auVar27._28_4_;
            auVar101._4_4_ = fVar269 * auVar160._4_4_;
            auVar101._0_4_ = fVar248 * auVar160._0_4_;
            auVar101._8_4_ = fVar286 * auVar160._8_4_;
            auVar101._12_4_ = fVar320 * auVar160._12_4_;
            auVar101._16_4_ = fVar207 * auVar160._16_4_;
            auVar101._20_4_ = fVar319 * auVar160._20_4_;
            auVar101._24_4_ = fVar331 * auVar160._24_4_;
            auVar101._28_4_ = auVar160._28_4_;
            auVar160 = vsubps_avx(auVar101,auVar100);
            auVar393 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar163._0_4_ = auVar155._0_4_ * 0.0 + auVar160._0_4_ + auVar28._0_4_ * 0.0;
            auVar163._4_4_ = auVar155._4_4_ * 0.0 + auVar160._4_4_ + auVar28._4_4_ * 0.0;
            auVar163._8_4_ = auVar155._8_4_ * 0.0 + auVar160._8_4_ + auVar28._8_4_ * 0.0;
            auVar163._12_4_ = auVar155._12_4_ * 0.0 + auVar160._12_4_ + auVar28._12_4_ * 0.0;
            auVar163._16_4_ = auVar155._16_4_ * 0.0 + auVar160._16_4_ + auVar28._16_4_ * 0.0;
            auVar163._20_4_ = auVar155._20_4_ * 0.0 + auVar160._20_4_ + auVar28._20_4_ * 0.0;
            auVar163._24_4_ = auVar155._24_4_ * 0.0 + auVar160._24_4_ + auVar28._24_4_ * 0.0;
            auVar163._28_4_ = auVar28._28_4_ + auVar160._28_4_ + auVar28._28_4_;
            auVar167 = ZEXT3264(auVar163);
            auVar160 = vmaxps_avx(auVar338,auVar163);
            auVar160 = vcmpps_avx(auVar160,auVar393,2);
            auVar27 = auVar164 & auVar160;
            if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar27 >> 0x7f,0) == '\0') &&
                  (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar27 >> 0xbf,0) == '\0') &&
                (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar27[0x1f]) {
LAB_0112eeca:
              auVar200._8_8_ = uStack_5b8;
              auVar200._0_8_ = local_5c0;
              auVar200._16_8_ = uStack_5b0;
              auVar200._24_8_ = uStack_5a8;
              auVar262 = ZEXT3264(_local_560);
              auVar328 = ZEXT3264(local_540);
              auVar348._4_4_ = fVar170;
              auVar348._0_4_ = fVar150;
              auVar348._8_4_ = fVar173;
              auVar348._12_4_ = fVar176;
              auVar348._16_4_ = fVar177;
              auVar348._20_4_ = fVar179;
              auVar348._24_4_ = fVar181;
              auVar348._28_4_ = fVar182;
            }
            else {
              auVar27 = vandps_avx(auVar160,auVar164);
              auVar102._4_4_ = fVar270 * fVar253;
              auVar102._0_4_ = fVar249 * fVar230;
              auVar102._8_4_ = fVar287 * fVar273;
              auVar102._12_4_ = fVar322 * fVar317;
              auVar102._16_4_ = fVar178 * fVar149;
              auVar102._20_4_ = fVar321 * fVar272;
              auVar102._24_4_ = fVar332 * fVar183;
              auVar102._28_4_ = auVar164._28_4_;
              auVar103._4_4_ = fVar269 * fVar209;
              auVar103._0_4_ = fVar248 * fVar208;
              auVar103._8_4_ = fVar286 * fVar224;
              auVar103._12_4_ = fVar320 * fVar225;
              auVar103._16_4_ = fVar207 * fVar226;
              auVar103._20_4_ = fVar319 * fVar227;
              auVar103._24_4_ = fVar331 * fVar228;
              auVar103._28_4_ = auVar160._28_4_;
              auVar160 = vsubps_avx(auVar103,auVar102);
              auVar104._4_4_ = fVar271 * fVar209;
              auVar104._0_4_ = fVar251 * fVar208;
              auVar104._8_4_ = fVar288 * fVar224;
              auVar104._12_4_ = fVar252 * fVar225;
              auVar104._16_4_ = fVar180 * fVar226;
              auVar104._20_4_ = fVar323 * fVar227;
              auVar104._24_4_ = fVar352 * fVar228;
              auVar104._28_4_ = auVar25._28_4_;
              auVar105._4_4_ = fVar270 * fVar267;
              auVar105._0_4_ = fVar249 * fVar247;
              auVar105._8_4_ = fVar287 * fVar285;
              auVar105._12_4_ = fVar322 * fVar289;
              auVar105._16_4_ = fVar178 * fVar175;
              auVar105._20_4_ = fVar321 * fVar343;
              auVar105._24_4_ = fVar332 * fVar330;
              auVar105._28_4_ = auVar194._28_4_;
              auVar28 = vsubps_avx(auVar105,auVar104);
              auVar106._4_4_ = fVar269 * fVar267;
              auVar106._0_4_ = fVar248 * fVar247;
              auVar106._8_4_ = fVar286 * fVar285;
              auVar106._12_4_ = fVar320 * fVar289;
              auVar106._16_4_ = fVar207 * fVar175;
              auVar106._20_4_ = fVar319 * fVar343;
              auVar106._24_4_ = fVar331 * fVar330;
              auVar106._28_4_ = auVar29._28_4_;
              auVar107._4_4_ = fVar271 * fVar253;
              auVar107._0_4_ = fVar251 * fVar230;
              auVar107._8_4_ = fVar288 * fVar273;
              auVar107._12_4_ = fVar252 * fVar317;
              auVar107._16_4_ = fVar180 * fVar149;
              auVar107._20_4_ = fVar323 * fVar272;
              auVar107._24_4_ = fVar352 * fVar183;
              auVar107._28_4_ = auVar192._28_4_;
              auVar25 = vsubps_avx(auVar107,auVar106);
              auVar199._0_4_ = auVar160._0_4_ * 0.0 + auVar25._0_4_ + auVar28._0_4_ * 0.0;
              auVar199._4_4_ = auVar160._4_4_ * 0.0 + auVar25._4_4_ + auVar28._4_4_ * 0.0;
              auVar199._8_4_ = auVar160._8_4_ * 0.0 + auVar25._8_4_ + auVar28._8_4_ * 0.0;
              auVar199._12_4_ = auVar160._12_4_ * 0.0 + auVar25._12_4_ + auVar28._12_4_ * 0.0;
              auVar199._16_4_ = auVar160._16_4_ * 0.0 + auVar25._16_4_ + auVar28._16_4_ * 0.0;
              auVar199._20_4_ = auVar160._20_4_ * 0.0 + auVar25._20_4_ + auVar28._20_4_ * 0.0;
              auVar199._24_4_ = auVar160._24_4_ * 0.0 + auVar25._24_4_ + auVar28._24_4_ * 0.0;
              auVar199._28_4_ = auVar192._28_4_ + auVar25._28_4_ + auVar29._28_4_;
              auVar164 = vrcpps_avx(auVar199);
              fVar230 = auVar164._0_4_;
              fVar247 = auVar164._4_4_;
              auVar108._4_4_ = auVar199._4_4_ * fVar247;
              auVar108._0_4_ = auVar199._0_4_ * fVar230;
              fVar248 = auVar164._8_4_;
              auVar108._8_4_ = auVar199._8_4_ * fVar248;
              fVar249 = auVar164._12_4_;
              auVar108._12_4_ = auVar199._12_4_ * fVar249;
              fVar251 = auVar164._16_4_;
              auVar108._16_4_ = auVar199._16_4_ * fVar251;
              fVar253 = auVar164._20_4_;
              auVar108._20_4_ = auVar199._20_4_ * fVar253;
              fVar267 = auVar164._24_4_;
              auVar108._24_4_ = auVar199._24_4_ * fVar267;
              auVar108._28_4_ = auVar194._28_4_;
              auVar360._8_4_ = 0x3f800000;
              auVar360._0_8_ = &DAT_3f8000003f800000;
              auVar360._12_4_ = 0x3f800000;
              auVar360._16_4_ = 0x3f800000;
              auVar360._20_4_ = 0x3f800000;
              auVar360._24_4_ = 0x3f800000;
              auVar360._28_4_ = 0x3f800000;
              auVar164 = vsubps_avx(auVar360,auVar108);
              fVar230 = auVar164._0_4_ * fVar230 + fVar230;
              fVar247 = auVar164._4_4_ * fVar247 + fVar247;
              fVar248 = auVar164._8_4_ * fVar248 + fVar248;
              fVar249 = auVar164._12_4_ * fVar249 + fVar249;
              fVar251 = auVar164._16_4_ * fVar251 + fVar251;
              fVar253 = auVar164._20_4_ * fVar253 + fVar253;
              fVar267 = auVar164._24_4_ * fVar267 + fVar267;
              auVar109._4_4_ =
                   (fVar265 * auVar160._4_4_ + auVar28._4_4_ * fVar263 + auVar25._4_4_ * fVar311) *
                   fVar247;
              auVar109._0_4_ =
                   (fVar246 * auVar160._0_4_ + auVar28._0_4_ * fVar245 + auVar25._0_4_ * fVar301) *
                   fVar230;
              auVar109._8_4_ =
                   (fVar284 * auVar160._8_4_ + auVar28._8_4_ * fVar283 + auVar25._8_4_ * fVar312) *
                   fVar248;
              auVar109._12_4_ =
                   (fVar250 * auVar160._12_4_ + auVar28._12_4_ * fVar318 + auVar25._12_4_ * fVar184)
                   * fVar249;
              auVar109._16_4_ =
                   (fVar172 * auVar160._16_4_ + auVar28._16_4_ * fVar169 + auVar25._16_4_ * fVar204)
                   * fVar251;
              auVar109._20_4_ =
                   (fVar342 * auVar160._20_4_ + auVar28._20_4_ * fVar341 + auVar25._20_4_ * fVar205)
                   * fVar253;
              auVar109._24_4_ =
                   (fVar329 * auVar160._24_4_ + auVar28._24_4_ * fVar300 + auVar25._24_4_ * fVar206)
                   * fVar267;
              auVar109._28_4_ = auVar339._28_4_ + auVar26._28_4_ + auVar281._28_4_;
              auVar244 = ZEXT3264(auVar109);
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar261._4_4_ = uVar8;
              auVar261._0_4_ = uVar8;
              auVar261._8_4_ = uVar8;
              auVar261._12_4_ = uVar8;
              auVar261._16_4_ = uVar8;
              auVar261._20_4_ = uVar8;
              auVar261._24_4_ = uVar8;
              auVar261._28_4_ = uVar8;
              auVar164 = vcmpps_avx(local_1e0,auVar109,2);
              auVar339 = vcmpps_avx(auVar109,auVar261,2);
              auVar164 = vandps_avx(auVar164,auVar339);
              auVar339 = auVar27 & auVar164;
              if ((((((((auVar339 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar339 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar339 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar339 >> 0x7f,0) == '\0') &&
                    (auVar339 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar339 >> 0xbf,0) == '\0') &&
                  (auVar339 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar339[0x1f]) goto LAB_0112eeca;
              auVar164 = vandps_avx(auVar27,auVar164);
              auVar339 = vcmpps_avx(auVar393,auVar199,4);
              auVar26 = auVar164 & auVar339;
              auVar200._8_8_ = uStack_5b8;
              auVar200._0_8_ = local_5c0;
              auVar200._16_8_ = uStack_5b0;
              auVar200._24_8_ = uStack_5a8;
              auVar262 = ZEXT3264(_local_560);
              auVar328 = ZEXT3264(local_540);
              auVar348._4_4_ = fVar170;
              auVar348._0_4_ = fVar150;
              auVar348._8_4_ = fVar173;
              auVar348._12_4_ = fVar176;
              auVar348._16_4_ = fVar177;
              auVar348._20_4_ = fVar179;
              auVar348._24_4_ = fVar181;
              auVar348._28_4_ = fVar182;
              if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar26 >> 0x7f,0) != '\0') ||
                    (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0xbf,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar26[0x1f] < '\0') {
                auVar200 = vandps_avx(auVar339,auVar164);
                auVar110._4_4_ = auVar338._4_4_ * fVar247;
                auVar110._0_4_ = auVar338._0_4_ * fVar230;
                auVar110._8_4_ = auVar338._8_4_ * fVar248;
                auVar110._12_4_ = auVar338._12_4_ * fVar249;
                auVar110._16_4_ = auVar338._16_4_ * fVar251;
                auVar110._20_4_ = auVar338._20_4_ * fVar253;
                auVar110._24_4_ = auVar338._24_4_ * fVar267;
                auVar110._28_4_ = local_560._28_4_;
                auVar111._4_4_ = auVar163._4_4_ * fVar247;
                auVar111._0_4_ = auVar163._0_4_ * fVar230;
                auVar111._8_4_ = auVar163._8_4_ * fVar248;
                auVar111._12_4_ = auVar163._12_4_ * fVar249;
                auVar111._16_4_ = auVar163._16_4_ * fVar251;
                auVar111._20_4_ = auVar163._20_4_ * fVar253;
                auVar111._24_4_ = auVar163._24_4_ * fVar267;
                auVar111._28_4_ = auVar163._28_4_;
                auVar167 = ZEXT3264(auVar111);
                auVar299._8_4_ = 0x3f800000;
                auVar299._0_8_ = &DAT_3f8000003f800000;
                auVar299._12_4_ = 0x3f800000;
                auVar299._16_4_ = 0x3f800000;
                auVar299._20_4_ = 0x3f800000;
                auVar299._24_4_ = 0x3f800000;
                auVar299._28_4_ = 0x3f800000;
                auVar164 = vsubps_avx(auVar299,auVar110);
                local_220 = vblendvps_avx(auVar164,auVar110,auVar154);
                auVar164 = vsubps_avx(auVar299,auVar111);
                auVar164 = vblendvps_avx(auVar164,auVar111,auVar154);
                auVar262 = ZEXT3264(auVar164);
                auVar328 = ZEXT3264(auVar109);
              }
            }
            auVar340 = ZEXT3264(local_680);
            local_540 = auVar328._0_32_;
            _local_560 = auVar262._0_32_;
            _local_740 = auVar310;
            if ((((((((auVar200 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar200 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar200 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar200 >> 0x7f,0) != '\0') ||
                  (auVar200 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar200 >> 0xbf,0) != '\0') ||
                (auVar200 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar200[0x1f] < '\0') {
              auVar164 = vsubps_avx(auVar310,auVar348);
              fVar245 = auVar348._0_4_ + local_220._0_4_ * auVar164._0_4_;
              fVar246 = auVar348._4_4_ + local_220._4_4_ * auVar164._4_4_;
              fVar247 = auVar348._8_4_ + local_220._8_4_ * auVar164._8_4_;
              fVar248 = auVar348._12_4_ + local_220._12_4_ * auVar164._12_4_;
              fVar249 = auVar348._16_4_ + local_220._16_4_ * auVar164._16_4_;
              fVar251 = auVar348._20_4_ + local_220._20_4_ * auVar164._20_4_;
              fVar253 = auVar348._24_4_ + local_220._24_4_ * auVar164._24_4_;
              fVar263 = auVar348._28_4_ + auVar164._28_4_;
              fVar230 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
              auVar112._4_4_ = (fVar246 + fVar246) * fVar230;
              auVar112._0_4_ = (fVar245 + fVar245) * fVar230;
              auVar112._8_4_ = (fVar247 + fVar247) * fVar230;
              auVar112._12_4_ = (fVar248 + fVar248) * fVar230;
              auVar112._16_4_ = (fVar249 + fVar249) * fVar230;
              auVar112._20_4_ = (fVar251 + fVar251) * fVar230;
              auVar112._24_4_ = (fVar253 + fVar253) * fVar230;
              auVar112._28_4_ = fVar263 + fVar263;
              auVar164 = vcmpps_avx(local_540,auVar112,6);
              auVar167 = ZEXT3264(auVar164);
              auVar339 = auVar200 & auVar164;
              if ((((((((auVar339 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar339 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar339 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar339 >> 0x7f,0) != '\0') ||
                    (auVar339 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar339 >> 0xbf,0) != '\0') ||
                  (auVar339 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar339[0x1f] < '\0') {
                local_2a0 = vandps_avx(auVar164,auVar200);
                auVar167 = ZEXT3264(local_2a0);
                local_340 = auVar262._0_4_ + auVar262._0_4_ + -1.0;
                fStack_33c = auVar262._4_4_ + auVar262._4_4_ + -1.0;
                fStack_338 = auVar262._8_4_ + auVar262._8_4_ + -1.0;
                fStack_334 = auVar262._12_4_ + auVar262._12_4_ + -1.0;
                fStack_330 = auVar262._16_4_ + auVar262._16_4_ + -1.0;
                fStack_32c = auVar262._20_4_ + auVar262._20_4_ + -1.0;
                fStack_328 = auVar262._24_4_ + auVar262._24_4_ + -1.0;
                fStack_324 = auVar262._28_4_ + auVar262._28_4_ + -1.0;
                local_360 = local_220;
                local_320 = local_540;
                local_2fc = uVar20;
                local_2f0 = local_820;
                uStack_2e8 = uStack_818;
                local_2e0 = local_6c0;
                uStack_2d8 = uStack_6b8;
                local_2d0 = local_6d0;
                uStack_2c8 = uStack_6c8;
                local_2c0 = local_6b0;
                uStack_2b8 = uStack_6a8;
                pGVar22 = (context->scene->geometries).items[uVar18].ptr;
                local_560._4_4_ = fStack_33c;
                local_560._0_4_ = local_340;
                fStack_558 = fStack_338;
                fStack_554 = fStack_334;
                fStack_550 = fStack_330;
                fStack_54c = fStack_32c;
                fStack_548 = fStack_328;
                fStack_544 = fStack_324;
                if ((pGVar22->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar214._0_4_ = (float)(int)local_300;
                  auVar214._4_8_ = SUB128(ZEXT812(0),4);
                  auVar214._12_4_ = 0;
                  auVar234 = vshufps_avx(auVar214,auVar214,0);
                  local_280[0] = (auVar234._0_4_ + local_220._0_4_ + 0.0) * (float)local_4a0._0_4_;
                  local_280[1] = (auVar234._4_4_ + local_220._4_4_ + 1.0) * (float)local_4a0._4_4_;
                  local_280[2] = (auVar234._8_4_ + local_220._8_4_ + 2.0) * fStack_498;
                  local_280[3] = (auVar234._12_4_ + local_220._12_4_ + 3.0) * fStack_494;
                  fStack_270 = (auVar234._0_4_ + local_220._16_4_ + 4.0) * fStack_490;
                  fStack_26c = (auVar234._4_4_ + local_220._20_4_ + 5.0) * fStack_48c;
                  fStack_268 = (auVar234._8_4_ + local_220._24_4_ + 6.0) * fStack_488;
                  fStack_264 = auVar234._12_4_ + local_220._28_4_ + 7.0;
                  local_260 = CONCAT44(fStack_33c,local_340);
                  uStack_258 = CONCAT44(fStack_334,fStack_338);
                  uStack_250 = CONCAT44(fStack_32c,fStack_330);
                  uStack_248 = CONCAT44(fStack_324,fStack_328);
                  local_240 = local_540;
                  auVar201._8_4_ = 0x7f800000;
                  auVar201._0_8_ = 0x7f8000007f800000;
                  auVar201._12_4_ = 0x7f800000;
                  auVar201._16_4_ = 0x7f800000;
                  auVar201._20_4_ = 0x7f800000;
                  auVar201._24_4_ = 0x7f800000;
                  auVar201._28_4_ = 0x7f800000;
                  auVar164 = vblendvps_avx(auVar201,local_540,local_2a0);
                  auVar339 = vshufps_avx(auVar164,auVar164,0xb1);
                  auVar339 = vminps_avx(auVar164,auVar339);
                  auVar26 = vshufpd_avx(auVar339,auVar339,5);
                  auVar339 = vminps_avx(auVar339,auVar26);
                  auVar26 = vperm2f128_avx(auVar339,auVar339,1);
                  auVar339 = vminps_avx(auVar339,auVar26);
                  auVar339 = vcmpps_avx(auVar164,auVar339,0);
                  auVar26 = local_2a0 & auVar339;
                  auVar164 = local_2a0;
                  if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar26 >> 0x7f,0) != '\0') ||
                        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar26 >> 0xbf,0) != '\0') ||
                      (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar26[0x1f] < '\0') {
                    auVar164 = vandps_avx(auVar339,local_2a0);
                  }
                  uVar144 = vmovmskps_avx(auVar164);
                  local_860 = 0;
                  if (uVar144 != 0) {
                    for (; (uVar144 >> local_860 & 1) == 0; local_860 = local_860 + 1) {
                    }
                  }
                  uVar142 = (ulong)local_860;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar22->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar230 = local_280[uVar142];
                    auVar167 = ZEXT464((uint)fVar230);
                    uVar8 = *(undefined4 *)((long)&local_260 + uVar142 * 4);
                    fVar246 = 1.0 - fVar230;
                    fVar245 = fVar230 * fVar246 + fVar230 * fVar246;
                    auVar234 = ZEXT416((uint)(fVar230 * fVar230 * 3.0));
                    auVar234 = vshufps_avx(auVar234,auVar234,0);
                    auVar215 = ZEXT416((uint)((fVar245 - fVar230 * fVar230) * 3.0));
                    auVar215 = vshufps_avx(auVar215,auVar215,0);
                    auVar233 = ZEXT416((uint)((fVar246 * fVar246 - fVar245) * 3.0));
                    auVar233 = vshufps_avx(auVar233,auVar233,0);
                    fVar245 = auVar233._0_4_ * (float)local_6c0._0_4_;
                    fVar247 = auVar233._4_4_ * (float)local_6c0._4_4_;
                    fVar248 = auVar233._8_4_ * (float)uStack_6b8;
                    fVar249 = auVar233._12_4_ * uStack_6b8._4_4_;
                    auVar262 = ZEXT1664(CONCAT412(fVar249,CONCAT48(fVar248,CONCAT44(fVar247,fVar245)
                                                                  )));
                    auVar233 = ZEXT416((uint)(fVar246 * fVar246 * -3.0));
                    auVar233 = vshufps_avx(auVar233,auVar233,0);
                    auVar216._0_4_ =
                         auVar233._0_4_ * (float)local_820._0_4_ +
                         fVar245 + auVar234._0_4_ * (float)local_6b0._0_4_ +
                                   auVar215._0_4_ * (float)local_6d0._0_4_;
                    auVar216._4_4_ =
                         auVar233._4_4_ * (float)local_820._4_4_ +
                         fVar247 + auVar234._4_4_ * (float)local_6b0._4_4_ +
                                   auVar215._4_4_ * (float)local_6d0._4_4_;
                    auVar216._8_4_ =
                         auVar233._8_4_ * (float)uStack_818 +
                         fVar248 + auVar234._8_4_ * (float)uStack_6a8 +
                                   auVar215._8_4_ * (float)uStack_6c8;
                    auVar216._12_4_ =
                         auVar233._12_4_ * uStack_818._4_4_ +
                         fVar249 + auVar234._12_4_ * uStack_6a8._4_4_ +
                                   auVar215._12_4_ * uStack_6c8._4_4_;
                    auVar244 = ZEXT464(*(uint *)(local_240 + uVar142 * 4));
                    *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_240 + uVar142 * 4);
                    *(float *)(ray + k * 4 + 0xc0) = auVar216._0_4_;
                    uVar21 = vextractps_avx(auVar216,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar21;
                    uVar21 = vextractps_avx(auVar216,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar21;
                    *(float *)(ray + k * 4 + 0xf0) = fVar230;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar8;
                    *(uint *)(ray + k * 4 + 0x110) = uVar19;
                    *(uint *)(ray + k * 4 + 0x120) = uVar18;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    auStack_7d0 = auVar243._16_16_;
                    _local_7e0 = _local_6c0;
                    _local_760 = _local_6d0;
                    auStack_6f0 = auVar298._16_16_;
                    _local_700 = _local_6b0;
                    _auStack_770 = auVar153._16_16_;
                    _local_780 = *local_708;
                    _local_640 = auVar384;
                    local_600 = local_2a0;
                    do {
                      local_740._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                      uVar142 = (ulong)local_860;
                      local_3c0 = local_280[uVar142];
                      local_3b0 = *(undefined4 *)((long)&local_260 + uVar142 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_240 + uVar142 * 4)
                      ;
                      fVar245 = 1.0 - local_3c0;
                      fVar230 = local_3c0 * fVar245 + local_3c0 * fVar245;
                      auVar234 = ZEXT416((uint)(local_3c0 * local_3c0 * 3.0));
                      auVar234 = vshufps_avx(auVar234,auVar234,0);
                      auVar215 = ZEXT416((uint)((fVar230 - local_3c0 * local_3c0) * 3.0));
                      auVar215 = vshufps_avx(auVar215,auVar215,0);
                      auVar256._0_4_ =
                           auVar234._0_4_ * (float)local_700._0_4_ +
                           auVar215._0_4_ * (float)local_760._0_4_;
                      auVar256._4_4_ =
                           auVar234._4_4_ * (float)local_700._4_4_ +
                           auVar215._4_4_ * (float)local_760._4_4_;
                      auVar256._8_4_ =
                           auVar234._8_4_ * (float)uStack_6f8 + auVar215._8_4_ * (float)uStack_758;
                      auVar256._12_4_ =
                           auVar234._12_4_ * uStack_6f8._4_4_ + auVar215._12_4_ * uStack_758._4_4_;
                      auVar262 = ZEXT1664(auVar256);
                      auVar234 = ZEXT416((uint)((fVar245 * fVar245 - fVar230) * 3.0));
                      auVar234 = vshufps_avx(auVar234,auVar234,0);
                      local_810.context = context->user;
                      auVar215 = ZEXT416((uint)(fVar245 * fVar245 * -3.0));
                      auVar215 = vshufps_avx(auVar215,auVar215,0);
                      auVar217._0_4_ =
                           auVar215._0_4_ * (float)local_820._0_4_ +
                           auVar234._0_4_ * (float)local_7e0._0_4_ + auVar256._0_4_;
                      auVar217._4_4_ =
                           auVar215._4_4_ * (float)local_820._4_4_ +
                           auVar234._4_4_ * (float)local_7e0._4_4_ + auVar256._4_4_;
                      auVar217._8_4_ =
                           auVar215._8_4_ * (float)uStack_818 +
                           auVar234._8_4_ * fStack_7d8 + auVar256._8_4_;
                      auVar217._12_4_ =
                           auVar215._12_4_ * uStack_818._4_4_ +
                           auVar234._12_4_ * fStack_7d4 + auVar256._12_4_;
                      auVar234 = vshufps_avx(auVar217,auVar217,0);
                      local_3f0[0] = (RTCHitN)auVar234[0];
                      local_3f0[1] = (RTCHitN)auVar234[1];
                      local_3f0[2] = (RTCHitN)auVar234[2];
                      local_3f0[3] = (RTCHitN)auVar234[3];
                      local_3f0[4] = (RTCHitN)auVar234[4];
                      local_3f0[5] = (RTCHitN)auVar234[5];
                      local_3f0[6] = (RTCHitN)auVar234[6];
                      local_3f0[7] = (RTCHitN)auVar234[7];
                      local_3f0[8] = (RTCHitN)auVar234[8];
                      local_3f0[9] = (RTCHitN)auVar234[9];
                      local_3f0[10] = (RTCHitN)auVar234[10];
                      local_3f0[0xb] = (RTCHitN)auVar234[0xb];
                      local_3f0[0xc] = (RTCHitN)auVar234[0xc];
                      local_3f0[0xd] = (RTCHitN)auVar234[0xd];
                      local_3f0[0xe] = (RTCHitN)auVar234[0xe];
                      local_3f0[0xf] = (RTCHitN)auVar234[0xf];
                      local_3e0 = vshufps_avx(auVar217,auVar217,0x55);
                      auVar244 = ZEXT1664(local_3e0);
                      local_3d0 = vshufps_avx(auVar217,auVar217,0xaa);
                      fStack_3bc = local_3c0;
                      fStack_3b8 = local_3c0;
                      fStack_3b4 = local_3c0;
                      uStack_3ac = local_3b0;
                      uStack_3a8 = local_3b0;
                      uStack_3a4 = local_3b0;
                      local_3a0 = local_160._0_8_;
                      uStack_398 = local_160._8_8_;
                      local_390 = local_150._0_8_;
                      uStack_388 = local_150._8_8_;
                      vcmpps_avx(auVar394._0_32_,auVar394._0_32_,0xf);
                      uStack_37c = (local_810.context)->instID[0];
                      local_380 = uStack_37c;
                      uStack_378 = uStack_37c;
                      uStack_374 = uStack_37c;
                      uStack_370 = (local_810.context)->instPrimID[0];
                      uStack_36c = uStack_370;
                      uStack_368 = uStack_370;
                      uStack_364 = uStack_370;
                      local_830 = local_780;
                      uStack_828 = uStack_778;
                      local_810.valid = (int *)&local_830;
                      local_810.geometryUserPtr = pGVar22->userPtr;
                      local_810.hit = local_3f0;
                      local_810.N = 4;
                      local_810.ray = (RTCRayN *)ray;
                      if (pGVar22->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar244 = ZEXT1664(local_3e0);
                        auVar262 = ZEXT1664(auVar256);
                        (*pGVar22->intersectionFilterN)(&local_810);
                        auVar340 = ZEXT3264(local_680);
                        auVar328 = ZEXT3264(local_540);
                        auVar394 = ZEXT1664(ZEXT816(0) << 0x40);
                      }
                      auVar234 = auVar244._0_16_;
                      auVar124._8_8_ = uStack_828;
                      auVar124._0_8_ = local_830;
                      if (auVar124 == (undefined1  [16])0x0) {
                        auVar234 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                        auVar234 = auVar234 ^ _DAT_01febe20;
                      }
                      else {
                        p_Var23 = context->args->filter;
                        if ((p_Var23 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar22->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar262 = ZEXT1664(auVar262._0_16_);
                          (*p_Var23)(&local_810);
                          auVar340 = ZEXT3264(local_680);
                          auVar328 = ZEXT3264(local_540);
                          auVar394 = ZEXT1664(ZEXT816(0) << 0x40);
                        }
                        auVar125._8_8_ = uStack_828;
                        auVar125._0_8_ = local_830;
                        auVar215 = vpcmpeqd_avx(auVar125,_DAT_01feba10);
                        auVar233 = vpcmpeqd_avx(auVar234,auVar234);
                        auVar244 = ZEXT1664(auVar233);
                        auVar234 = auVar215 ^ auVar233;
                        if (auVar125 != (undefined1  [16])0x0) {
                          auVar215 = auVar215 ^ auVar233;
                          auVar233 = vmaskmovps_avx(auVar215,*(undefined1 (*) [16])local_810.hit);
                          *(undefined1 (*) [16])(local_810.ray + 0xc0) = auVar233;
                          auVar233 = vmaskmovps_avx(auVar215,*(undefined1 (*) [16])
                                                              (local_810.hit + 0x10));
                          *(undefined1 (*) [16])(local_810.ray + 0xd0) = auVar233;
                          auVar233 = vmaskmovps_avx(auVar215,*(undefined1 (*) [16])
                                                              (local_810.hit + 0x20));
                          *(undefined1 (*) [16])(local_810.ray + 0xe0) = auVar233;
                          auVar233 = vmaskmovps_avx(auVar215,*(undefined1 (*) [16])
                                                              (local_810.hit + 0x30));
                          *(undefined1 (*) [16])(local_810.ray + 0xf0) = auVar233;
                          auVar233 = vmaskmovps_avx(auVar215,*(undefined1 (*) [16])
                                                              (local_810.hit + 0x40));
                          *(undefined1 (*) [16])(local_810.ray + 0x100) = auVar233;
                          auVar233 = vmaskmovps_avx(auVar215,*(undefined1 (*) [16])
                                                              (local_810.hit + 0x50));
                          *(undefined1 (*) [16])(local_810.ray + 0x110) = auVar233;
                          auVar233 = vmaskmovps_avx(auVar215,*(undefined1 (*) [16])
                                                              (local_810.hit + 0x60));
                          *(undefined1 (*) [16])(local_810.ray + 0x120) = auVar233;
                          auVar233 = vmaskmovps_avx(auVar215,*(undefined1 (*) [16])
                                                              (local_810.hit + 0x70));
                          *(undefined1 (*) [16])(local_810.ray + 0x130) = auVar233;
                          auVar215 = vmaskmovps_avx(auVar215,*(undefined1 (*) [16])
                                                              (local_810.hit + 0x80));
                          *(undefined1 (*) [16])(local_810.ray + 0x140) = auVar215;
                        }
                      }
                      auVar189._8_8_ = 0x100000001;
                      auVar189._0_8_ = 0x100000001;
                      if ((auVar189 & auVar234) == (undefined1  [16])0x0) {
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_740._0_4_;
                      }
                      *(undefined4 *)(local_600 + (ulong)local_860 * 4) = 0;
                      uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
                      auVar165._4_4_ = uVar8;
                      auVar165._0_4_ = uVar8;
                      auVar165._8_4_ = uVar8;
                      auVar165._12_4_ = uVar8;
                      auVar165._16_4_ = uVar8;
                      auVar165._20_4_ = uVar8;
                      auVar165._24_4_ = uVar8;
                      auVar165._28_4_ = uVar8;
                      auVar164 = vcmpps_avx(auVar328._0_32_,auVar165,2);
                      auVar153 = vandps_avx(auVar164,local_600);
                      auVar167 = ZEXT3264(auVar153);
                      local_600 = local_600 & auVar164;
                      bVar119 = (local_600 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                      ;
                      bVar120 = (local_600 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                      ;
                      bVar118 = (local_600 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                      ;
                      bVar117 = SUB321(local_600 >> 0x7f,0) != '\0';
                      bVar116 = (local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                      ;
                      bVar115 = SUB321(local_600 >> 0xbf,0) != '\0';
                      bVar114 = (local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                      ;
                      bVar113 = local_600[0x1f] < '\0';
                      if (((((((bVar119 || bVar120) || bVar118) || bVar117) || bVar116) || bVar115)
                          || bVar114) || bVar113) {
                        auVar202._8_4_ = 0x7f800000;
                        auVar202._0_8_ = 0x7f8000007f800000;
                        auVar202._12_4_ = 0x7f800000;
                        auVar202._16_4_ = 0x7f800000;
                        auVar202._20_4_ = 0x7f800000;
                        auVar202._24_4_ = 0x7f800000;
                        auVar202._28_4_ = 0x7f800000;
                        auVar164 = vblendvps_avx(auVar202,auVar328._0_32_,auVar153);
                        auVar339 = vshufps_avx(auVar164,auVar164,0xb1);
                        auVar339 = vminps_avx(auVar164,auVar339);
                        auVar26 = vshufpd_avx(auVar339,auVar339,5);
                        auVar339 = vminps_avx(auVar339,auVar26);
                        auVar26 = vperm2f128_avx(auVar339,auVar339,1);
                        auVar244 = ZEXT3264(auVar26);
                        auVar339 = vminps_avx(auVar339,auVar26);
                        auVar164 = vcmpps_avx(auVar164,auVar339,0);
                        auVar339 = auVar153 & auVar164;
                        if ((((((((auVar339 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar339 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar339 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar339 >> 0x7f,0) != '\0')
                              || (auVar339 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar339 >> 0xbf,0) != '\0') ||
                            (auVar339 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar339[0x1f] < '\0') {
                          auVar164 = vandps_avx(auVar164,auVar153);
                          auVar167 = ZEXT3264(auVar164);
                        }
                        uVar144 = vmovmskps_avx(auVar167._0_32_);
                        local_860 = 0;
                        if (uVar144 != 0) {
                          for (; (uVar144 >> local_860 & 1) == 0; local_860 = local_860 + 1) {
                          }
                        }
                      }
                      local_600 = auVar153;
                    } while (((((((bVar119 || bVar120) || bVar118) || bVar117) || bVar116) ||
                              bVar115) || bVar114) || bVar113);
                  }
                }
              }
            }
          }
          lVar143 = lVar143 + 8;
          auVar385 = ZEXT3264(_local_6a0);
        } while ((int)lVar143 < (int)uVar20);
      }
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar159._4_4_ = uVar8;
      auVar159._0_4_ = uVar8;
      auVar159._8_4_ = uVar8;
      auVar159._12_4_ = uVar8;
      auVar159._16_4_ = uVar8;
      auVar159._20_4_ = uVar8;
      auVar159._24_4_ = uVar8;
      auVar159._28_4_ = uVar8;
      auVar153 = vcmpps_avx(local_80,auVar159,2);
      uVar144 = vmovmskps_avx(auVar153);
      uVar140 = uVar140 & uVar140 + 0xff & uVar144;
    } while (uVar140 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }